

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [32];
  int iVar20;
  int iVar21;
  uint uVar22;
  undefined4 uVar23;
  _func_int **pp_Var24;
  int *piVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  Layer *pLVar30;
  _func_int **pp_Var31;
  _func_int **pp_Var32;
  _func_int *p_Var33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined4 uVar48;
  undefined4 uVar49;
  Allocator AVar50;
  Allocator AVar51;
  Allocator AVar52;
  Allocator AVar53;
  Mat *pMVar54;
  uint uVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  uint uVar59;
  int iVar60;
  Allocator *pAVar61;
  long lVar62;
  ulong uVar63;
  _func_int *p_Var64;
  uint uVar65;
  int iVar66;
  int iVar67;
  ulong uVar68;
  int y_1;
  int iVar69;
  int iVar70;
  int w_2;
  ulong uVar71;
  float *pfVar72;
  undefined1 (*pauVar73) [16];
  int iVar74;
  ulong uVar75;
  Allocator *pAVar76;
  void *pvVar77;
  void *pvVar78;
  int i;
  int iVar79;
  int iVar80;
  int iVar81;
  uint uVar82;
  long lVar83;
  ulong uVar84;
  int y_3;
  long lVar85;
  long lVar86;
  int y_6;
  int y_4;
  ulong uVar87;
  int iVar88;
  float *pfVar89;
  void *pvVar90;
  void *pvVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar107;
  float fVar136;
  float fVar137;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar138;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar169 [28];
  undefined1 auVar170 [28];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar171 [28];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar237;
  float fVar241;
  float fVar242;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar243;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar229 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar234 [32];
  float fVar235;
  float fVar236;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 in_ZMM3 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  undefined1 auVar262 [16];
  float fVar261;
  float fVar308;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar306;
  float fVar307;
  float fVar309;
  undefined1 in_ZMM7 [64];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  float fVar327;
  undefined1 auVar326 [64];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [64];
  float fVar342;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  int outh_2;
  int h_2;
  int size;
  int h;
  int outh;
  int outw;
  Option opt_b;
  ulong local_278;
  Allocator *local_270;
  void *local_258;
  long local_230;
  Allocator *local_228;
  ulong local_220;
  Mat local_1a8;
  _func_int **local_158;
  ulong local_150;
  ulong local_148;
  Option *local_140;
  long local_138;
  Mat *local_130;
  int local_124;
  Allocator *local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 auVar225 [32];
  undefined1 auVar228 [32];
  undefined1 auVar230 [32];
  undefined1 auVar233 [32];
  undefined1 auVar293 [32];
  undefined1 auVar298 [32];
  undefined1 auVar303 [32];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  
  auVar188 = in_ZMM5._0_16_;
  iVar20 = bottom_blob->w;
  iVar21 = bottom_blob->h;
  uVar68 = bottom_blob->elemsize;
  local_150 = (ulong)bottom_blob->elempack;
  p_Var64 = this->_vptr_Deconvolution_x86_avx[-3];
  uVar55 = *(uint *)(&this->field_0xd0 + (long)p_Var64);
  lVar83 = 1;
  if (opt->use_packing_layout == true) {
    lVar83 = 8;
    if ((uVar55 & 7) != 0) {
      lVar83 = (ulong)((uVar55 & 3) == 0) * 3 + 1;
    }
  }
  iVar70 = *(int *)(&this->field_0xd4 + (long)p_Var64);
  iVar67 = *(int *)(&this->field_0xdc + (long)p_Var64);
  iVar69 = *(int *)(&this->field_0xe4 + (long)p_Var64);
  iVar80 = (*(int *)(&this->field_0xd8 + (long)p_Var64) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var64);
  iVar88 = *(int *)(&this->field_0xe8 + (long)p_Var64);
  iVar79 = *(int *)(&this->field_0xfc + (long)p_Var64);
  iVar81 = *(int *)(&this->field_0x100 + (long)p_Var64);
  uVar59 = (uint)lVar83;
  uVar55 = (int)uVar55 / (int)uVar59;
  local_1a8.cstep = 0;
  local_1a8.data = (Allocator *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1a8.elempack = 0;
  local_1a8.h = 0;
  p_Var64 = this->_vptr_Deconvolution_x86_avx[-3];
  lVar86 = 0x10;
  local_1a8.allocator = (Allocator *)local_1a8.data;
  local_1a8.dims = (int)local_1a8.refcount;
  local_1a8.w = local_1a8.refcount._4_4_;
  local_1a8.d = (int)local_1a8.refcount;
  local_1a8.c = local_1a8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var64) < 1) &&
        (*(int *)(&this->field_0xf0 + (long)p_Var64) < 1)) &&
       (*(int *)(&this->field_0xf4 + (long)p_Var64) < 1)) &&
      (*(int *)(&this->field_0xf8 + (long)p_Var64) < 1)) &&
     (((*(int *)(&this->field_0x104 + (long)p_Var64) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var64) < 1)) && (lVar86 = 8, &local_1a8 != top_blob)))
     ) {
    piVar25 = top_blob->refcount;
    if (piVar25 != (int *)0x0) {
      LOCK();
      *piVar25 = *piVar25 + 1;
      UNLOCK();
    }
    local_1a8.data = top_blob->data;
    local_1a8.refcount._0_4_ = (int)top_blob->refcount;
    local_1a8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
    local_1a8.elemsize = top_blob->elemsize;
    local_1a8.elempack = top_blob->elempack;
    local_1a8.allocator = top_blob->allocator;
    uVar9 = top_blob->dims;
    uVar10 = top_blob->w;
    uVar11 = top_blob->h;
    uVar12 = top_blob->d;
    local_1a8.c = top_blob->c;
    local_1a8.cstep = top_blob->cstep;
    local_1a8.dims = uVar9;
    local_1a8.w = uVar10;
    local_1a8.h = uVar11;
    local_1a8.d = uVar12;
  }
  iVar67 = (iVar70 + -1) * iVar67;
  local_148 = CONCAT44(local_148._4_4_,iVar67);
  iVar69 = (iVar20 + -1) * iVar69 + iVar67 + iVar79 + 1;
  uVar71 = (ulong)uVar55;
  local_140 = opt;
  local_130 = top_blob;
  Mat::create(&local_1a8,iVar69,iVar81 + (iVar21 + -1) * iVar88 + iVar80 + 1,uVar55,
              (uVar68 / local_150) * lVar83,uVar59,*(Allocator **)(&opt->lightmode + lVar86));
  iVar67 = local_1a8.h;
  iVar70 = local_1a8.w;
  pvVar91 = local_1a8.data;
  iVar88 = -100;
  if (((Allocator *)local_1a8.data == (Allocator *)0x0) ||
     (local_1a8.cstep * (long)local_1a8.c == 0)) goto LAB_0028bba1;
  pp_Var24 = this->_vptr_Deconvolution_x86_avx;
  p_Var64 = pp_Var24[-3];
  uVar22 = *(uint *)(&this->field_0xd4 + (long)p_Var64);
  uVar65 = *(uint *)(&this->field_0xd8 + (long)p_Var64);
  iVar88 = uVar65 * uVar22;
  if (local_140->use_sgemm_convolution == true) {
    piVar25 = bottom_blob->refcount;
    local_c8 = bottom_blob->data;
    piStack_c0 = bottom_blob->refcount;
    local_b8 = bottom_blob->elemsize;
    local_b0 = bottom_blob->elempack;
    local_a8 = bottom_blob->allocator;
    iVar70 = bottom_blob->h;
    iVar67 = bottom_blob->w;
    uVar48 = bottom_blob->dims;
    uVar49 = bottom_blob->d;
    local_90 = bottom_blob->c;
    local_88 = bottom_blob->cstep;
    if (piVar25 != (int *)0x0) {
      LOCK();
      *piVar25 = *piVar25 + 1;
      UNLOCK();
      iVar67 = bottom_blob->w;
      iVar70 = bottom_blob->h;
    }
    _local_a0 = CONCAT44(iVar70 * iVar67,uVar48);
    _uStack_98 = CONCAT44(uVar49,1);
    local_d8 = 0;
    local_118 = (long *)0x0;
    uStack_110 = 0;
    iStack_10c = 0;
    local_108 = 0;
    uStack_100 = 0;
    auStack_e8 = SUB1612(ZEXT816(0),0);
    auVar13[0] = local_140->lightmode;
    auVar13._1_3_ = *(undefined3 *)&local_140->field_0x1;
    auVar13._4_4_ = local_140->num_threads;
    auVar13._8_8_ = local_140->blob_allocator;
    uVar14 = local_140->workspace_allocator;
    uVar15 = local_140->openmp_blocktime;
    uVar16 = local_140->use_winograd_convolution;
    uVar17 = local_140->use_sgemm_convolution;
    uVar18 = local_140->use_int8_inference;
    uVar19 = local_140->use_vulkan_compute;
    auVar13[0x1f] = uVar19;
    auVar13[0x1e] = uVar18;
    auVar13[0x1d] = uVar17;
    auVar13[0x1c] = uVar16;
    auVar13._24_4_ = uVar15;
    auVar13._16_8_ = uVar14;
    local_58._0_1_ = local_140->use_bf16_storage;
    local_58._1_1_ = local_140->use_fp16_packed;
    local_58._2_1_ = local_140->use_fp16_storage;
    local_58._3_1_ = local_140->use_fp16_arithmetic;
    local_58._4_1_ = local_140->use_int8_packed;
    local_58._5_1_ = local_140->use_int8_storage;
    local_58._6_1_ = local_140->use_int8_arithmetic;
    local_58._7_1_ = local_140->use_packing_layout;
    uStack_50._0_1_ = local_140->use_shader_pack8;
    uStack_50._1_1_ = local_140->use_subgroup_basic;
    uStack_50._2_1_ = local_140->use_subgroup_vote;
    uStack_50._3_1_ = local_140->use_subgroup_ballot;
    uStack_50._4_1_ = local_140->use_subgroup_shuffle;
    uStack_50._5_1_ = local_140->use_image_storage;
    uStack_50._6_1_ = local_140->use_tensor_storage;
    uStack_50._7_1_ = local_140->use_reserved_0;
    uStack_48._0_4_ = local_140->flush_denormals;
    uStack_48._4_1_ = local_140->use_local_pool_allocator;
    uStack_48._5_1_ = local_140->use_shader_local_memory;
    uStack_48._6_1_ = local_140->use_cooperative_matrix;
    uStack_48._7_1_ = local_140->use_winograd23_convolution;
    uStack_40._0_1_ = local_140->use_winograd43_convolution;
    uStack_40._1_1_ = local_140->use_winograd63_convolution;
    uStack_40._2_1_ = local_140->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = local_140->use_reserved_7;
    uStack_40._4_1_ = local_140->use_reserved_8;
    uStack_40._5_1_ = local_140->use_reserved_9;
    uStack_40._6_1_ = local_140->use_reserved_10;
    uStack_40._7_1_ = local_140->use_reserved_11;
    local_78 = auVar13._0_8_;
    pAStack_70 = local_1a8.allocator;
    auStack_68 = auVar13._16_16_;
    local_f8 = local_118;
    uStack_f0 = uStack_110;
    iStack_ec = iStack_10c;
    (*this->gemm->_vptr_Layer[7])();
    auVar258 = _DAT_005571a0;
    auVar333 = _DAT_00557180;
    pp_Var24 = this->_vptr_Deconvolution_x86_avx;
    p_Var64 = pp_Var24[-3];
    iVar70 = (iVar69 * *(int *)(&this->field_0xe8 + (long)p_Var64) -
             *(int *)(&this->field_0xe4 + (long)p_Var64) * iVar20) * uVar59;
    if (uVar59 == 1) {
      if (0 < (int)uVar55) {
        lVar83 = (long)local_1a8.h * (long)local_1a8.w;
        uVar68 = 0;
        iVar67 = (int)((local_1a8.elemsize * lVar83 + 0xf & 0xfffffffffffffff0) / local_1a8.elemsize
                      );
        if (local_1a8.dims == 4) {
          iVar67 = (int)lVar83;
        }
        uVar59 = iVar67 * local_1a8.d;
        pp_Var24 = this->_vptr_Deconvolution_x86_avx;
        p_Var64 = pp_Var24[-3];
        auVar97._8_8_ = 0;
        auVar97._0_8_ = (ulong)uVar59 - 1;
        auVar262 = vpshufd_avx(auVar97,0x44);
        uVar87 = auVar262._0_8_;
        auVar246._0_8_ = uVar87 ^ 0x8000000000000000;
        auVar246._8_4_ = auVar262._8_4_;
        uVar55 = auVar262._12_4_;
        auVar246._12_4_ = uVar55 ^ 0x80000000;
        auVar188 = vpcmpeqd_avx(auVar188,auVar188);
        pAVar76 = (Allocator *)local_1a8.data;
        do {
          auVar262 = ZEXT816(0) << 0x40;
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var64) != 0) &&
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var64) *
              *(long *)(&this->field_0x1e8 + (long)p_Var64) != 0)) {
            auVar262 = ZEXT416(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var64) + uVar68 * 4)
                              );
          }
          if (0 < (int)uVar59) {
            auVar262 = vshufps_avx(auVar262,auVar262,0);
            auVar259._16_16_ = auVar262;
            auVar259._0_16_ = auVar262;
            uVar75 = 0;
            do {
              auVar273._8_8_ = 0;
              auVar273._0_8_ = uVar75;
              auVar262 = vpshufd_avx(auVar273,0x44);
              auVar304._16_16_ = auVar262;
              auVar304._0_16_ = auVar262;
              auVar100 = vorps_avx(auVar304,auVar333);
              auVar178 = vorps_avx(auVar304,auVar258);
              auVar315._0_8_ = auVar178._16_8_ ^ 0x8000000000000000;
              auVar315._8_4_ = auVar178._24_4_;
              auVar315._12_4_ = auVar178._28_4_ ^ 0x80000000;
              auVar262 = vpcmpgtq_avx(auVar315,auVar246);
              auVar320._0_8_ = uVar87 ^ 0x8000000000000000;
              auVar320._8_4_ = auVar246._8_4_;
              auVar320._12_4_ = uVar55 ^ 0x80000000;
              auVar274._0_8_ = auVar178._0_8_ ^ 0x8000000000000000;
              auVar274._8_4_ = auVar178._8_4_;
              auVar274._12_4_ = auVar178._12_4_ ^ 0x80000000;
              auVar329 = vpcmpgtq_avx(auVar274,auVar320);
              auVar262 = vpackssdw_avx(auVar329,auVar262);
              auVar316._0_8_ = auVar100._16_8_ ^ 0x8000000000000000;
              auVar316._8_4_ = auVar100._24_4_;
              auVar316._12_4_ = auVar100._28_4_ ^ 0x80000000;
              auVar329 = vpcmpgtq_avx(auVar316,auVar246);
              auVar321._0_8_ = uVar87 ^ 0x8000000000000000;
              auVar321._8_4_ = auVar246._8_4_;
              auVar321._12_4_ = uVar55 ^ 0x80000000;
              auVar312._0_8_ = auVar100._0_8_ ^ 0x8000000000000000;
              auVar312._8_4_ = auVar100._8_4_;
              auVar312._12_4_ = auVar100._12_4_ ^ 0x80000000;
              auVar310 = vpcmpgtq_avx(auVar312,auVar321);
              auVar329 = vpackssdw_avx(auVar310,auVar329);
              auVar262 = vpackssdw_avx(auVar329 ^ auVar188,auVar262 ^ auVar188);
              auVar329 = vpmovsxwd_avx(auVar262);
              auVar262 = vpunpckhwd_avx(auVar262,auVar262);
              auVar305._16_16_ = auVar262;
              auVar305._0_16_ = auVar329;
              auVar100 = vmaskmovps_avx(auVar305,auVar259);
              *(undefined1 (*) [32])((long)&pAVar76->_vptr_Allocator + uVar75 * 4) = auVar100;
              uVar75 = uVar75 + 8;
            } while ((uVar59 + 7 & 0xfffffff8) != uVar75);
            p_Var64 = pp_Var24[-3];
          }
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var64)) {
            pfVar89 = (float *)(uVar68 * (long)iVar88 * iStack_ec * local_108 + (long)local_118);
            iVar67 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var64)) {
                iVar69 = 0;
                do {
                  if (0 < iVar21) {
                    pfVar72 = (float *)((long)(_func_int ***)local_1a8.data +
                                       (long)iVar69 *
                                       (long)*(int *)(&this->field_0xdc + (long)p_Var64) * 4 +
                                       (long)iVar67 *
                                       (long)*(int *)(&this->field_0xe0 + (long)p_Var64) *
                                       local_1a8.elemsize * (long)local_1a8.w +
                                       local_1a8.cstep * local_1a8.elemsize * uVar68);
                    iVar79 = 0;
                    do {
                      iVar81 = iVar20;
                      if (0 < iVar20) {
                        do {
                          *pfVar72 = *pfVar72 + *pfVar89;
                          p_Var64 = pp_Var24[-3];
                          pfVar72 = pfVar72 + *(int *)(&this->field_0xe4 + (long)p_Var64);
                          pfVar89 = pfVar89 + 1;
                          iVar81 = iVar81 + -1;
                        } while (iVar81 != 0);
                      }
                      pfVar72 = pfVar72 + iVar70;
                      iVar79 = iVar79 + 1;
                    } while (iVar79 != iVar21);
                  }
                  iVar69 = iVar69 + 1;
                } while (iVar69 < *(int *)(&this->field_0xd4 + (long)p_Var64));
              }
              iVar67 = iVar67 + 1;
            } while (iVar67 < *(int *)(&this->field_0xd8 + (long)p_Var64));
          }
          uVar68 = uVar68 + 1;
          pAVar76 = (Allocator *)
                    ((long)&pAVar76->_vptr_Allocator + local_1a8.cstep * local_1a8.elemsize);
        } while (uVar68 != uVar71);
      }
    }
    else if (uVar59 == 4) {
      if (0 < (int)uVar55) {
        pp_Var24 = this->_vptr_Deconvolution_x86_avx;
        p_Var64 = pp_Var24[-3];
        uVar68 = 0;
        do {
          sVar26 = local_1a8.elemsize;
          pfVar89 = (float *)((long)iStack_ec * uVar68 * (long)iVar88 * local_108 + (long)local_118)
          ;
          lVar83 = (long)local_1a8.w;
          pAVar76 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * uVar68 * local_1a8.elemsize);
          uVar75 = local_1a8.h * lVar83;
          uVar87 = (local_1a8.elemsize * uVar75 + 0xf & 0xfffffffffffffff0) / local_1a8.elemsize;
          if (local_1a8.dims == 4) {
            uVar87 = uVar75;
          }
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var64) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var64) *
              *(long *)(&this->field_0x1e8 + (long)p_Var64) == 0)) {
            uVar55 = local_1a8.d * (int)uVar87;
            if (0 < (int)uVar55) {
              memset(pAVar76,0,(ulong)uVar55 << 4);
            }
          }
          else {
            iVar67 = local_1a8.d * (int)uVar87;
            if (0 < iVar67) {
              auVar188 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x1a8 + (long)p_Var64) + uVar68 * 0x10);
              pAVar61 = pAVar76;
              do {
                *(undefined1 (*) [16])pAVar61 = auVar188;
                pAVar61 = pAVar61 + 2;
                iVar67 = iVar67 + -1;
              } while (iVar67 != 0);
            }
          }
          p_Var64 = pp_Var24[-3];
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var64)) {
            iVar67 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var64)) {
                iVar69 = 0;
                do {
                  if (0 < iVar21) {
                    pauVar73 = (undefined1 (*) [16])
                               ((long)&pAVar76->_vptr_Allocator +
                               (long)(*(int *)(&this->field_0xdc + (long)p_Var64) * iVar69 * 4) * 4
                               + (long)iVar67 * (long)*(int *)(&this->field_0xe0 + (long)p_Var64) *
                                 sVar26 * lVar83);
                    iVar79 = 0;
                    do {
                      iVar81 = iVar20;
                      if (0 < iVar20) {
                        do {
                          auVar98._0_4_ = *pfVar89 + *(float *)*pauVar73;
                          auVar98._4_4_ = pfVar89[1] + *(float *)(*pauVar73 + 4);
                          auVar98._8_4_ = pfVar89[2] + *(float *)(*pauVar73 + 8);
                          auVar98._12_4_ = pfVar89[3] + *(float *)(*pauVar73 + 0xc);
                          *pauVar73 = auVar98;
                          p_Var64 = pp_Var24[-3];
                          pauVar73 = pauVar73 + *(int *)(&this->field_0xe4 + (long)p_Var64);
                          pfVar89 = pfVar89 + 4;
                          iVar81 = iVar81 + -1;
                        } while (iVar81 != 0);
                      }
                      pauVar73 = (undefined1 (*) [16])(*pauVar73 + (long)iVar70 * 4);
                      iVar79 = iVar79 + 1;
                    } while (iVar79 != iVar21);
                  }
                  iVar69 = iVar69 + 1;
                } while (iVar69 < *(int *)(&this->field_0xd4 + (long)p_Var64));
              }
              iVar67 = iVar67 + 1;
            } while (iVar67 < *(int *)(&this->field_0xd8 + (long)p_Var64));
          }
          uVar68 = uVar68 + 1;
        } while (uVar68 != uVar71);
      }
    }
    else if ((uVar59 == 8) && (0 < (int)uVar55)) {
      uVar68 = 0;
      do {
        sVar26 = local_1a8.elemsize;
        pfVar89 = (float *)((long)iStack_ec * uVar68 * (long)iVar88 * local_108 + (long)local_118);
        lVar83 = (long)local_1a8.w;
        pAVar76 = (Allocator *)
                  ((long)(_func_int ***)local_1a8.data +
                  local_1a8.cstep * uVar68 * local_1a8.elemsize);
        uVar75 = local_1a8.h * lVar83;
        uVar87 = (local_1a8.elemsize * uVar75 + 0xf & 0xfffffffffffffff0) / local_1a8.elemsize;
        if (local_1a8.dims == 4) {
          uVar87 = uVar75;
        }
        if ((*(long *)(&this->field_0x1a8 + (long)p_Var64) == 0) ||
           ((long)*(int *)(&this->field_0x1e0 + (long)p_Var64) *
            *(long *)(&this->field_0x1e8 + (long)p_Var64) == 0)) {
          uVar55 = local_1a8.d * (int)uVar87;
          if (0 < (int)uVar55) {
            memset(pAVar76,0,(ulong)uVar55 << 5);
          }
        }
        else {
          iVar67 = local_1a8.d * (int)uVar87;
          if (0 < iVar67) {
            plVar1 = (long *)(*(long *)(&this->field_0x1a8 + (long)p_Var64) + uVar68 * 0x20);
            AVar50._vptr_Allocator = (_func_int **)*plVar1;
            AVar51._vptr_Allocator = (_func_int **)plVar1[1];
            AVar52._vptr_Allocator = (_func_int **)plVar1[2];
            AVar53._vptr_Allocator = (_func_int **)plVar1[3];
            pAVar61 = pAVar76;
            do {
              pAVar61->_vptr_Allocator = AVar50._vptr_Allocator;
              pAVar61[1]._vptr_Allocator = AVar51._vptr_Allocator;
              pAVar61[2]._vptr_Allocator = AVar52._vptr_Allocator;
              pAVar61[3]._vptr_Allocator = AVar53._vptr_Allocator;
              pAVar61 = pAVar61 + 4;
              iVar67 = iVar67 + -1;
            } while (iVar67 != 0);
          }
        }
        p_Var64 = pp_Var24[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var64)) {
          iVar67 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var64)) {
              iVar69 = 0;
              do {
                if (0 < iVar21) {
                  pfVar72 = (float *)((long)&pAVar76->_vptr_Allocator +
                                     (long)(*(int *)(&this->field_0xdc + (long)p_Var64) * iVar69 * 8
                                           ) * 4 +
                                     (long)*(int *)(&this->field_0xe0 + (long)p_Var64) *
                                     (long)iVar67 * sVar26 * lVar83);
                  iVar79 = 0;
                  do {
                    iVar81 = iVar20;
                    if (0 < iVar20) {
                      do {
                        fVar92 = pfVar89[1];
                        fVar107 = pfVar89[2];
                        fVar136 = pfVar89[3];
                        fVar137 = pfVar89[4];
                        fVar243 = pfVar89[5];
                        fVar138 = pfVar89[6];
                        fVar240 = pfVar89[7];
                        *pfVar72 = *pfVar89 + *pfVar72;
                        pfVar72[1] = fVar92 + pfVar72[1];
                        pfVar72[2] = fVar107 + pfVar72[2];
                        pfVar72[3] = fVar136 + pfVar72[3];
                        pfVar72[4] = fVar137 + pfVar72[4];
                        pfVar72[5] = fVar243 + pfVar72[5];
                        pfVar72[6] = fVar138 + pfVar72[6];
                        pfVar72[7] = fVar240 + pfVar72[7];
                        p_Var64 = pp_Var24[-3];
                        pfVar72 = pfVar72 + (long)*(int *)(&this->field_0xe4 + (long)p_Var64) * 8;
                        pfVar89 = pfVar89 + 8;
                        iVar81 = iVar81 + -1;
                      } while (iVar81 != 0);
                    }
                    pfVar72 = pfVar72 + iVar70;
                    iVar79 = iVar79 + 1;
                  } while (iVar79 != iVar21);
                }
                iVar69 = iVar69 + 1;
              } while (iVar69 < *(int *)(&this->field_0xd4 + (long)p_Var64));
            }
            iVar67 = iVar67 + 1;
          } while (iVar67 < *(int *)(&this->field_0xd8 + (long)p_Var64));
        }
        uVar68 = uVar68 + 1;
      } while (uVar68 != uVar71);
    }
    pLVar30 = this->activation;
    if (pLVar30 != (Layer *)0x0) {
      (*pLVar30->_vptr_Layer[9])(pLVar30,&local_1a8,local_140);
    }
    piVar25 = (int *)CONCAT44(iStack_10c,uStack_110);
    if (piVar25 != (int *)0x0) {
      LOCK();
      *piVar25 = *piVar25 + -1;
      UNLOCK();
      if (*piVar25 == 0) {
        if (local_f8 == (long *)0x0) {
          if (local_118 != (long *)0x0) {
            free(local_118);
          }
        }
        else {
          (**(code **)(*local_f8 + 0x18))();
        }
      }
    }
    if (piStack_c0 != (int *)0x0) {
      LOCK();
      *piStack_c0 = *piStack_c0 + -1;
      UNLOCK();
      if (*piStack_c0 == 0) {
        if (local_a8 == (Allocator *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (*local_a8->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_158 = pp_Var24;
    local_124 = iVar88;
    if (((uint)local_150 == 8) && (uVar59 == 8)) {
      if (local_1a8.c < 1) goto LAB_0028bb57;
      iVar20 = *(int *)(&this->field_0xdc + (long)p_Var64);
      iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var64);
      iVar69 = *(int *)(&this->field_0xe4 + (long)p_Var64);
      iVar88 = *(int *)(&this->field_0xe8 + (long)p_Var64);
      uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var64);
      lVar83 = *(long *)(&this->field_0x1a8 + (long)p_Var64);
      local_278 = 0;
      auVar325 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar326 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar260 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      do {
        if (0 < local_1a8.h) {
          iVar79 = bottom_blob->w;
          iVar81 = bottom_blob->h;
          pAVar76 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * local_278 * local_1a8.elemsize);
          uVar55 = bottom_blob->c;
          iVar74 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar82 = 0;
              iVar66 = (1 - uVar22) * iVar20;
              do {
                if (lVar83 == 0) {
                  auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar338 = ZEXT3264(*(undefined1 (*) [32])(lVar83 + local_278 * 0x20));
                }
                if (0 < (int)uVar55) {
                  pvVar90 = (void *)((this->weight_data_tm).cstep * local_278 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar78 = bottom_blob->data;
                  uVar68 = 0;
                  do {
                    if (0 < (int)uVar65) {
                      uVar87 = 0;
                      uVar71 = 0;
                      do {
                        iVar56 = (((int)uVar71 - uVar65) + 1) * iVar21 + iVar74;
                        if ((((-1 < iVar56) && (iVar57 = iVar56 / iVar88, iVar56 % iVar88 == 0)) &&
                            (0 < (int)uVar22)) && (iVar57 < iVar81)) {
                          lVar86 = (long)iVar57 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar68;
                          uVar75 = uVar87;
                          uVar84 = (ulong)uVar22;
                          iVar56 = iVar66;
                          do {
                            if (((-1 < iVar56) && (iVar57 = iVar56 / iVar69, iVar56 % iVar69 == 0))
                               && (iVar57 < iVar79)) {
                              lVar62 = (long)(iVar57 << 3);
                              fVar92 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86);
                              fVar107 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 4);
                              fVar136 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 8);
                              fVar137 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0xc);
                              fVar243 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0x10);
                              fVar138 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0x14);
                              fVar240 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0x18);
                              fVar242 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0x1c);
                              uVar63 = uVar75 & 0xffffffff;
                              pfVar89 = (float *)((long)pvVar90 + uVar63 * 4);
                              pfVar72 = (float *)((long)pvVar90 + uVar63 * 4 + 0x20);
                              pfVar2 = (float *)((long)pvVar90 + uVar63 * 4 + 0x40);
                              pfVar3 = (float *)((long)pvVar90 + uVar63 * 4 + 0x60);
                              pfVar4 = (float *)((long)pvVar90 + uVar63 * 4 + 0x80);
                              in_ZMM7 = ZEXT3264(CONCAT428(fVar137,CONCAT424(fVar243 * pfVar4[6],
                                                                             CONCAT420(fVar243 * 
                                                  pfVar4[5],
                                                  CONCAT416(fVar243 * pfVar4[4],
                                                            CONCAT412(fVar243 * pfVar4[3],
                                                                      CONCAT48(fVar243 * pfVar4[2],
                                                                               CONCAT44(fVar243 * 
                                                  pfVar4[1],fVar243 * *pfVar4))))))));
                              pfVar5 = (float *)((long)pvVar90 + uVar63 * 4 + 0xa0);
                              fVar241 = fVar136 + fVar137 + fVar136;
                              pfVar6 = (float *)((long)pvVar90 + uVar63 * 4 + 0xc0);
                              pfVar7 = (float *)((long)pvVar90 + uVar63 * 4 + 0xe0);
                              fVar187 = fVar240 * *pfVar6 + fVar242 * *pfVar7;
                              fVar235 = fVar240 * pfVar6[1] + fVar242 * pfVar7[1];
                              fVar236 = fVar240 * pfVar6[2] + fVar242 * pfVar7[2];
                              fVar237 = fVar240 * pfVar6[3] + fVar242 * pfVar7[3];
                              fVar238 = fVar240 * pfVar6[4] + fVar242 * pfVar7[4];
                              fVar239 = fVar240 * pfVar6[5] + fVar242 * pfVar7[5];
                              fVar240 = fVar240 * pfVar6[6] + fVar242 * pfVar7[6];
                              fVar242 = fVar241 + fVar136;
                              in_ZMM3 = ZEXT3264(CONCAT428(fVar242,CONCAT424(fVar240,CONCAT420(
                                                  fVar239,CONCAT416(fVar238,CONCAT412(fVar237,
                                                  CONCAT48(fVar236,CONCAT44(fVar235,fVar187))))))));
                              auVar338 = ZEXT3264(CONCAT428(auVar338._28_4_ + fVar92 +
                                                            fVar107 + fVar136 + fVar241 + fVar242,
                                                            CONCAT424(auVar338._24_4_ +
                                                                      fVar92 * pfVar89[6] +
                                                                      fVar107 * pfVar72[6] +
                                                                      fVar136 * pfVar2[6] +
                                                                      fVar137 * pfVar3[6] +
                                                                      fVar243 * pfVar4[6] +
                                                                      fVar138 * pfVar5[6] + fVar240,
                                                                      CONCAT420(auVar338._20_4_ +
                                                                                fVar92 * pfVar89[5]
                                                                                + fVar107 * pfVar72[
                                                  5] + fVar136 * pfVar2[5] +
                                                  fVar137 * pfVar3[5] + fVar243 * pfVar4[5] +
                                                  fVar138 * pfVar5[5] + fVar239,
                                                  CONCAT416(auVar338._16_4_ + fVar92 * pfVar89[4] +
                                                            fVar107 * pfVar72[4] +
                                                            fVar136 * pfVar2[4] +
                                                            fVar137 * pfVar3[4] +
                                                            fVar243 * pfVar4[4] +
                                                            fVar138 * pfVar5[4] + fVar238,
                                                            CONCAT412(auVar338._12_4_ +
                                                                      fVar92 * pfVar89[3] +
                                                                      fVar107 * pfVar72[3] +
                                                                      fVar136 * pfVar2[3] +
                                                                      fVar137 * pfVar3[3] +
                                                                      fVar243 * pfVar4[3] +
                                                                      fVar138 * pfVar5[3] + fVar237,
                                                                      CONCAT48(auVar338._8_4_ +
                                                                               fVar92 * pfVar89[2] +
                                                                               fVar107 * pfVar72[2]
                                                                               + fVar136 * pfVar2[2]
                                                                               + fVar137 * pfVar3[2]
                                                                                 + fVar243 * pfVar4[
                                                  2] + fVar138 * pfVar5[2] + fVar236,
                                                  CONCAT44(auVar338._4_4_ + fVar92 * pfVar89[1] +
                                                           fVar107 * pfVar72[1] +
                                                           fVar136 * pfVar2[1] +
                                                           fVar137 * pfVar3[1] + fVar243 * pfVar4[1]
                                                           + fVar138 * pfVar5[1] + fVar235,
                                                           auVar338._0_4_ + fVar92 * *pfVar89 +
                                                           fVar107 * *pfVar72 + fVar136 * *pfVar2 +
                                                           fVar137 * *pfVar3 + fVar243 * *pfVar4 +
                                                           fVar138 * *pfVar5 + fVar187))))))));
                            }
                            uVar75 = uVar75 + 0x40;
                            iVar56 = iVar56 + iVar20;
                            uVar84 = uVar84 - 1;
                          } while (uVar84 != 0);
                        }
                        uVar71 = uVar71 + 1;
                        uVar87 = uVar87 + (ulong)uVar22 * 0x40;
                      } while (uVar71 != uVar65);
                    }
                    pvVar90 = (void *)((long)pvVar90 + (long)(int)(uVar22 * uVar65 * 0x40) * 4);
                    uVar68 = uVar68 + 1;
                  } while (uVar68 != uVar55);
                }
                auVar333 = auVar338._0_32_;
                auVar100 = auVar325._0_32_;
                fVar261 = auVar338._8_4_;
                fVar306 = auVar338._12_4_;
                fVar307 = auVar338._16_4_;
                fVar308 = auVar338._20_4_;
                fVar309 = auVar338._24_4_;
                fVar187 = auVar326._0_4_;
                fVar235 = auVar326._4_4_;
                fVar236 = auVar326._8_4_;
                fVar237 = auVar326._12_4_;
                fVar238 = auVar326._16_4_;
                fVar239 = auVar326._20_4_;
                fVar241 = auVar326._24_4_;
                fVar327 = auVar326._28_4_;
                auVar258 = auVar260._0_32_;
                fVar92 = auVar260._0_4_;
                fVar107 = auVar260._4_4_;
                fVar136 = auVar260._8_4_;
                fVar137 = auVar260._12_4_;
                fVar243 = auVar260._16_4_;
                fVar138 = auVar260._20_4_;
                fVar240 = auVar260._24_4_;
                fVar242 = auVar260._28_4_;
                auVar339._28_36_ = auVar338._28_36_;
                switch(uVar23) {
                case 1:
                  auVar333 = vmaxps_avx(auVar333,auVar100);
                  break;
                case 2:
                  auVar258 = vmaxps_avx(auVar333,auVar100);
                  in_ZMM7 = ZEXT3264(auVar258);
                  auVar100 = vminps_avx(auVar333,auVar100);
                  fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                  auVar333._0_4_ = fVar92 * auVar100._0_4_ + auVar258._0_4_;
                  auVar333._4_4_ = fVar92 * auVar100._4_4_ + auVar258._4_4_;
                  auVar333._8_4_ = fVar92 * auVar100._8_4_ + auVar258._8_4_;
                  auVar333._12_4_ = fVar92 * auVar100._12_4_ + auVar258._12_4_;
                  auVar333._16_4_ = fVar92 * auVar100._16_4_ + auVar258._16_4_;
                  auVar333._20_4_ = fVar92 * auVar100._20_4_ + auVar258._20_4_;
                  auVar333._24_4_ = fVar92 * auVar100._24_4_ + auVar258._24_4_;
                  auVar333._28_4_ = auVar100._28_4_ + auVar258._28_4_;
                  break;
                case 3:
                  uVar8 = **(undefined4 **)(&this->field_0x118 + (long)p_Var64);
                  auVar291._4_4_ = uVar8;
                  auVar291._0_4_ = uVar8;
                  auVar291._8_4_ = uVar8;
                  auVar291._12_4_ = uVar8;
                  auVar291._16_4_ = uVar8;
                  auVar291._20_4_ = uVar8;
                  auVar291._24_4_ = uVar8;
                  auVar291._28_4_ = uVar8;
                  uVar8 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var64))[1];
                  auVar355._4_4_ = uVar8;
                  auVar355._0_4_ = uVar8;
                  auVar355._8_4_ = uVar8;
                  auVar355._12_4_ = uVar8;
                  auVar355._16_4_ = uVar8;
                  auVar355._20_4_ = uVar8;
                  auVar355._24_4_ = uVar8;
                  auVar355._28_4_ = uVar8;
                  auVar333 = vmaxps_avx(auVar333,auVar291);
                  in_ZMM7 = ZEXT3264(auVar333);
                  auVar333 = vminps_avx(auVar355,auVar333);
                  break;
                case 4:
                  auVar292._0_8_ = auVar338._0_8_ ^ 0x8000000080000000;
                  auVar292._8_4_ = -fVar261;
                  auVar292._12_4_ = -fVar306;
                  auVar292._16_4_ = -fVar307;
                  auVar292._20_4_ = -fVar308;
                  auVar292._24_4_ = -fVar309;
                  auVar292._28_4_ = -auVar338._28_4_;
                  auVar175._8_4_ = 0x42b0c0a5;
                  auVar175._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar175._12_4_ = 0x42b0c0a5;
                  auVar175._16_4_ = 0x42b0c0a5;
                  auVar175._20_4_ = 0x42b0c0a5;
                  auVar175._24_4_ = 0x42b0c0a5;
                  auVar175._28_4_ = 0x42b0c0a5;
                  auVar333 = vminps_avx(auVar292,auVar175);
                  auVar176._8_4_ = 0xc2b0c0a5;
                  auVar176._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar176._12_4_ = 0xc2b0c0a5;
                  auVar176._16_4_ = 0xc2b0c0a5;
                  auVar176._20_4_ = 0xc2b0c0a5;
                  auVar176._24_4_ = 0xc2b0c0a5;
                  auVar176._28_4_ = 0xc2b0c0a5;
                  auVar100 = vmaxps_avx(auVar333,auVar176);
                  auVar332._0_4_ = auVar100._0_4_ * 1.442695 + fVar187;
                  auVar332._4_4_ = auVar100._4_4_ * 1.442695 + fVar235;
                  auVar332._8_4_ = auVar100._8_4_ * 1.442695 + fVar236;
                  auVar332._12_4_ = auVar100._12_4_ * 1.442695 + fVar237;
                  auVar332._16_4_ = auVar100._16_4_ * 1.442695 + fVar238;
                  auVar332._20_4_ = auVar100._20_4_ * 1.442695 + fVar239;
                  auVar332._24_4_ = auVar100._24_4_ * 1.442695 + fVar241;
                  auVar332._28_4_ = auVar338._28_4_ + fVar327;
                  auVar178 = vroundps_avx(auVar332,1);
                  auVar333 = vcmpps_avx(auVar332,auVar178,1);
                  auVar333 = vandps_avx(auVar333,auVar258);
                  auVar333 = vsubps_avx(auVar178,auVar333);
                  fVar261 = auVar333._0_4_ * -0.6931472 + auVar100._0_4_;
                  fVar306 = auVar333._4_4_ * -0.6931472 + auVar100._4_4_;
                  fVar307 = auVar333._8_4_ * -0.6931472 + auVar100._8_4_;
                  fVar308 = auVar333._12_4_ * -0.6931472 + auVar100._12_4_;
                  fVar309 = auVar333._16_4_ * -0.6931472 + auVar100._16_4_;
                  fVar342 = auVar333._20_4_ * -0.6931472 + auVar100._20_4_;
                  fVar358 = auVar333._24_4_ * -0.6931472 + auVar100._24_4_;
                  in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                               CONCAT424(0x3ab743ce,
                                                         CONCAT420(0x3ab743ce,
                                                                   CONCAT416(0x3ab743ce,
                                                                             CONCAT412(0x3ab743ce,
                                                                                       CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                  auVar263._0_4_ = (int)auVar333._0_4_;
                  auVar263._4_4_ = (int)auVar333._4_4_;
                  auVar263._8_4_ = (int)auVar333._8_4_;
                  auVar263._12_4_ = (int)auVar333._12_4_;
                  auVar293._16_4_ = (int)auVar333._16_4_;
                  auVar293._0_16_ = auVar263;
                  auVar293._20_4_ = (int)auVar333._20_4_;
                  auVar293._24_4_ = (int)auVar333._24_4_;
                  auVar293._28_4_ = (int)auVar333._28_4_;
                  auVar262 = vpslld_avx(auVar263,0x17);
                  auVar188 = vpslld_avx(auVar293._16_16_,0x17);
                  auVar93._8_4_ = 0x3f800000;
                  auVar93._0_8_ = 0x3f8000003f800000;
                  auVar93._12_4_ = 0x3f800000;
                  auVar188 = vpaddd_avx(auVar188,auVar93);
                  auVar262 = vpaddd_avx(auVar262,auVar93);
                  auVar177._0_4_ =
                       (fVar261 + fVar92 +
                       fVar261 * fVar261 *
                       (fVar187 +
                       ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) *
                         fVar261 + 0.041665796) * fVar261 + 0.16666666) * fVar261)) * auVar262._0_4_
                       + fVar92;
                  auVar177._4_4_ =
                       (fVar306 + fVar107 +
                       fVar306 * fVar306 *
                       (fVar235 +
                       ((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) *
                         fVar306 + 0.041665796) * fVar306 + 0.16666666) * fVar306)) * auVar262._4_4_
                       + fVar107;
                  auVar177._8_4_ =
                       (fVar307 + fVar136 +
                       fVar307 * fVar307 *
                       (fVar236 +
                       ((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) *
                         fVar307 + 0.041665796) * fVar307 + 0.16666666) * fVar307)) * auVar262._8_4_
                       + fVar136;
                  auVar177._12_4_ =
                       (fVar308 + fVar137 +
                       fVar308 * fVar308 *
                       (fVar237 +
                       ((((fVar308 * 0.00019875691 + 0.0013981999) * fVar308 + 0.008333452) *
                         fVar308 + 0.041665796) * fVar308 + 0.16666666) * fVar308)) *
                       auVar262._12_4_ + fVar137;
                  auVar177._16_4_ =
                       (fVar309 + fVar243 +
                       fVar309 * fVar309 *
                       (fVar238 +
                       ((((fVar309 * 0.00019875691 + 0.0013981999) * fVar309 + 0.008333452) *
                         fVar309 + 0.041665796) * fVar309 + 0.16666666) * fVar309)) * auVar188._0_4_
                       + fVar243;
                  auVar177._20_4_ =
                       (fVar342 + fVar138 +
                       fVar342 * fVar342 *
                       (fVar239 +
                       ((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 + 0.008333452) *
                         fVar342 + 0.041665796) * fVar342 + 0.16666666) * fVar342)) * auVar188._4_4_
                       + fVar138;
                  auVar177._24_4_ =
                       (fVar358 + fVar240 +
                       fVar358 * fVar358 *
                       (fVar241 +
                       ((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                         fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358)) * auVar188._8_4_
                       + fVar240;
                  auVar177._28_4_ =
                       auVar178._28_4_ + auVar100._28_4_ + fVar242 + fVar327 + 0.21826287 + fVar242;
                  auVar100 = vrcpps_avx(auVar177);
                  in_ZMM7 = ZEXT3264(auVar100);
                  fVar92 = auVar100._0_4_;
                  fVar107 = auVar100._4_4_;
                  auVar37._4_4_ = auVar177._4_4_ * fVar107;
                  auVar37._0_4_ = auVar177._0_4_ * fVar92;
                  fVar136 = auVar100._8_4_;
                  auVar37._8_4_ = auVar177._8_4_ * fVar136;
                  fVar137 = auVar100._12_4_;
                  auVar37._12_4_ = auVar177._12_4_ * fVar137;
                  fVar243 = auVar100._16_4_;
                  auVar37._16_4_ = auVar177._16_4_ * fVar243;
                  fVar138 = auVar100._20_4_;
                  auVar37._20_4_ = auVar177._20_4_ * fVar138;
                  fVar240 = auVar100._24_4_;
                  auVar37._24_4_ = auVar177._24_4_ * fVar240;
                  auVar37._28_4_ = auVar177._28_4_;
                  auVar258 = vsubps_avx(auVar258,auVar37);
                  auVar333._0_4_ = fVar92 + fVar92 * auVar258._0_4_;
                  auVar333._4_4_ = fVar107 + fVar107 * auVar258._4_4_;
                  auVar333._8_4_ = fVar136 + fVar136 * auVar258._8_4_;
                  auVar333._12_4_ = fVar137 + fVar137 * auVar258._12_4_;
                  auVar333._16_4_ = fVar243 + fVar243 * auVar258._16_4_;
                  auVar333._20_4_ = fVar138 + fVar138 * auVar258._20_4_;
                  auVar333._24_4_ = fVar240 + fVar240 * auVar258._24_4_;
                  auVar333._28_4_ = auVar100._28_4_ + auVar258._28_4_;
                  break;
                case 5:
                  auVar317._8_4_ = 0x42b0c0a5;
                  auVar317._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar317._12_4_ = 0x42b0c0a5;
                  auVar317._16_4_ = 0x42b0c0a5;
                  auVar317._20_4_ = 0x42b0c0a5;
                  auVar317._24_4_ = 0x42b0c0a5;
                  auVar317._28_4_ = 0x42b0c0a5;
                  auVar333 = vminps_avx(auVar333,auVar317);
                  auVar322._8_4_ = 0xc2b0c0a5;
                  auVar322._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar322._12_4_ = 0xc2b0c0a5;
                  auVar322._16_4_ = 0xc2b0c0a5;
                  auVar322._20_4_ = 0xc2b0c0a5;
                  auVar322._24_4_ = 0xc2b0c0a5;
                  auVar322._28_4_ = 0xc2b0c0a5;
                  auVar100 = vmaxps_avx(auVar322,auVar333);
                  auVar289._0_4_ = fVar187 + auVar100._0_4_ * 1.442695;
                  auVar289._4_4_ = fVar235 + auVar100._4_4_ * 1.442695;
                  auVar289._8_4_ = fVar236 + auVar100._8_4_ * 1.442695;
                  auVar289._12_4_ = fVar237 + auVar100._12_4_ * 1.442695;
                  auVar289._16_4_ = fVar238 + auVar100._16_4_ * 1.442695;
                  auVar289._20_4_ = fVar239 + auVar100._20_4_ * 1.442695;
                  auVar289._24_4_ = fVar241 + auVar100._24_4_ * 1.442695;
                  auVar289._28_4_ = fVar327 + in_ZMM7._28_4_;
                  auVar178 = vroundps_avx(auVar289,1);
                  auVar333 = vcmpps_avx(auVar289,auVar178,1);
                  auVar333 = vandps_avx(auVar333,auVar258);
                  auVar333 = vsubps_avx(auVar178,auVar333);
                  auVar34._4_4_ = auVar333._4_4_ * 0.6931472;
                  auVar34._0_4_ = auVar333._0_4_ * 0.6931472;
                  auVar34._8_4_ = auVar333._8_4_ * 0.6931472;
                  auVar34._12_4_ = auVar333._12_4_ * 0.6931472;
                  auVar34._16_4_ = auVar333._16_4_ * 0.6931472;
                  auVar34._20_4_ = auVar333._20_4_ * 0.6931472;
                  auVar34._24_4_ = auVar333._24_4_ * 0.6931472;
                  auVar34._28_4_ = auVar178._28_4_;
                  auVar100 = vsubps_avx(auVar100,auVar34);
                  fVar342 = auVar100._0_4_;
                  fVar358 = auVar100._4_4_;
                  fVar359 = auVar100._8_4_;
                  fVar360 = auVar100._12_4_;
                  fVar361 = auVar100._16_4_;
                  fVar362 = auVar100._20_4_;
                  fVar363 = auVar100._24_4_;
                  auVar188._0_4_ = (int)auVar333._0_4_;
                  auVar188._4_4_ = (int)auVar333._4_4_;
                  auVar188._8_4_ = (int)auVar333._8_4_;
                  auVar188._12_4_ = (int)auVar333._12_4_;
                  auVar218._16_4_ = (int)auVar333._16_4_;
                  auVar218._0_16_ = auVar188;
                  auVar218._20_4_ = (int)auVar333._20_4_;
                  auVar218._24_4_ = (int)auVar333._24_4_;
                  auVar218._28_4_ = (int)auVar333._28_4_;
                  auVar262 = vpslld_avx(auVar188,0x17);
                  auVar188 = vpslld_avx(auVar218._16_16_,0x17);
                  auVar329._8_4_ = 0x3f800000;
                  auVar329._0_8_ = 0x3f8000003f800000;
                  auVar329._12_4_ = 0x3f800000;
                  auVar188 = vpaddd_avx(auVar188,auVar329);
                  auVar262 = vpaddd_avx(auVar262,auVar329);
                  auVar290._0_4_ =
                       (fVar342 + fVar92 +
                       fVar342 * fVar342 *
                       (((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 + 0.008333452) *
                          fVar342 + 0.041665796) * fVar342 + 0.16666666) * fVar342 + fVar187)) *
                       auVar262._0_4_ + fVar92;
                  auVar290._4_4_ =
                       (fVar358 + fVar107 +
                       fVar358 * fVar358 *
                       (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                          fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar235)) *
                       auVar262._4_4_ + fVar107;
                  auVar290._8_4_ =
                       (fVar359 + fVar136 +
                       fVar359 * fVar359 *
                       (((((fVar359 * 0.00019875691 + 0.0013981999) * fVar359 + 0.008333452) *
                          fVar359 + 0.041665796) * fVar359 + 0.16666666) * fVar359 + fVar236)) *
                       auVar262._8_4_ + fVar136;
                  auVar290._12_4_ =
                       (fVar360 + fVar137 +
                       fVar360 * fVar360 *
                       (((((fVar360 * 0.00019875691 + 0.0013981999) * fVar360 + 0.008333452) *
                          fVar360 + 0.041665796) * fVar360 + 0.16666666) * fVar360 + fVar237)) *
                       auVar262._12_4_ + fVar137;
                  auVar290._16_4_ =
                       (fVar361 + fVar243 +
                       fVar361 * fVar361 *
                       (((((fVar361 * 0.00019875691 + 0.0013981999) * fVar361 + 0.008333452) *
                          fVar361 + 0.041665796) * fVar361 + 0.16666666) * fVar361 + fVar238)) *
                       auVar188._0_4_ + fVar243;
                  auVar290._20_4_ =
                       (fVar362 + fVar138 +
                       fVar362 * fVar362 *
                       (((((fVar362 * 0.00019875691 + 0.0013981999) * fVar362 + 0.008333452) *
                          fVar362 + 0.041665796) * fVar362 + 0.16666666) * fVar362 + fVar239)) *
                       auVar188._4_4_ + fVar138;
                  auVar290._24_4_ =
                       (fVar363 + fVar240 +
                       fVar363 * fVar363 *
                       (((((fVar363 * 0.00019875691 + 0.0013981999) * fVar363 + 0.008333452) *
                          fVar363 + 0.041665796) * fVar363 + 0.16666666) * fVar363 + fVar241)) *
                       auVar188._8_4_ + fVar240;
                  auVar290._28_4_ =
                       auVar100._28_4_ + fVar242 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar327 + fVar242;
                  auVar172._8_4_ = 0x800000;
                  auVar172._0_8_ = 0x80000000800000;
                  auVar172._12_4_ = 0x800000;
                  auVar172._16_4_ = 0x800000;
                  auVar172._20_4_ = 0x800000;
                  auVar172._24_4_ = 0x800000;
                  auVar172._28_4_ = 0x800000;
                  auVar178 = vmaxps_avx(auVar290,auVar172);
                  auVar188 = vpsrld_avx(auVar178._16_16_,0x17);
                  auVar251._8_4_ = 0x807fffff;
                  auVar251._0_8_ = 0x807fffff807fffff;
                  auVar251._12_4_ = 0x807fffff;
                  auVar251._16_4_ = 0x807fffff;
                  auVar251._20_4_ = 0x807fffff;
                  auVar251._24_4_ = 0x807fffff;
                  auVar251._28_4_ = 0x807fffff;
                  auVar333 = vandps_avx(auVar178,auVar251);
                  auVar224 = vorps_avx(auVar333,auVar326._0_32_);
                  auVar252._8_4_ = 0x3f3504f3;
                  auVar252._0_8_ = 0x3f3504f33f3504f3;
                  auVar252._12_4_ = 0x3f3504f3;
                  auVar252._16_4_ = 0x3f3504f3;
                  auVar252._20_4_ = 0x3f3504f3;
                  auVar252._24_4_ = 0x3f3504f3;
                  auVar252._28_4_ = 0x3f3504f3;
                  auVar100 = vcmpps_avx(auVar252,auVar224,2);
                  auVar333 = vandnps_avx(auVar100,auVar224);
                  fVar342 = auVar224._0_4_ + -1.0 + auVar333._0_4_;
                  fVar358 = auVar224._4_4_ + -1.0 + auVar333._4_4_;
                  fVar359 = auVar224._8_4_ + -1.0 + auVar333._8_4_;
                  fVar360 = auVar224._12_4_ + -1.0 + auVar333._12_4_;
                  fVar361 = auVar224._16_4_ + -1.0 + auVar333._16_4_;
                  fVar362 = auVar224._20_4_ + -1.0 + auVar333._20_4_;
                  fVar363 = auVar224._24_4_ + -1.0 + auVar333._24_4_;
                  auVar188 = vpsubd_avx(auVar188,auVar100._16_16_);
                  auVar262 = vpsrld_avx(auVar178._0_16_,0x17);
                  auVar310._8_4_ = 0xffffff81;
                  auVar310._0_8_ = 0xffffff81ffffff81;
                  auVar310._12_4_ = 0xffffff81;
                  auVar188 = vpaddd_avx(auVar310,auVar188);
                  auVar262 = vpsubd_avx(auVar262,auVar100._0_16_);
                  auVar262 = vpaddd_avx(auVar310,auVar262);
                  auVar173._16_16_ = auVar188;
                  auVar173._0_16_ = auVar262;
                  auVar100 = vcmpps_avx(auVar290,_DAT_00559240,2);
                  auVar178 = vcvtdq2ps_avx(auVar173);
                  auVar35._4_4_ =
                       (fVar358 + auVar178._4_4_ * 0.6931472 +
                       fVar358 * fVar358 *
                       (fVar358 * (fVar358 * (fVar358 * (fVar358 * (fVar358 * (fVar358 * (fVar358 * 
                                                  (fVar358 * (fVar358 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar35._0_4_ =
                       (fVar342 + auVar178._0_4_ * 0.6931472 +
                       fVar342 * fVar342 *
                       (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * 
                                                  (fVar342 * (fVar342 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar35._8_4_ =
                       (fVar359 + auVar178._8_4_ * 0.6931472 +
                       fVar359 * fVar359 *
                       (fVar359 * (fVar359 * (fVar359 * (fVar359 * (fVar359 * (fVar359 * (fVar359 * 
                                                  (fVar359 * (fVar359 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar35._12_4_ =
                       (fVar360 + auVar178._12_4_ * 0.6931472 +
                       fVar360 * fVar360 *
                       (fVar360 * (fVar360 * (fVar360 * (fVar360 * (fVar360 * (fVar360 * (fVar360 * 
                                                  (fVar360 * (fVar360 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar35._16_4_ =
                       (fVar361 + auVar178._16_4_ * 0.6931472 +
                       fVar361 * fVar361 *
                       (fVar361 * (fVar361 * (fVar361 * (fVar361 * (fVar361 * (fVar361 * (fVar361 * 
                                                  (fVar361 * (fVar361 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar35._20_4_ =
                       (fVar362 + auVar178._20_4_ * 0.6931472 +
                       fVar362 * fVar362 *
                       (fVar362 * (fVar362 * (fVar362 * (fVar362 * (fVar362 * (fVar362 * (fVar362 * 
                                                  (fVar362 * (fVar362 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar35._24_4_ =
                       (fVar363 + auVar178._24_4_ * 0.6931472 +
                       fVar363 * fVar363 *
                       (fVar363 * (fVar363 * (fVar363 * (fVar363 * (fVar363 * (fVar363 * (fVar363 * 
                                                  (fVar363 * (fVar363 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar35._28_4_ = auVar224._28_4_ + -1.0 + auVar333._28_4_ + auVar178._28_4_ + 0.0;
                  auVar219._8_4_ = 0x7fffffff;
                  auVar219._0_8_ = 0x7fffffff7fffffff;
                  auVar219._12_4_ = 0x7fffffff;
                  auVar219._16_4_ = 0x7fffffff;
                  auVar219._20_4_ = 0x7fffffff;
                  auVar219._24_4_ = 0x7fffffff;
                  auVar219._28_4_ = 0x7fffffff;
                  auVar333 = vblendvps_avx(auVar35,auVar219,auVar100);
                  auVar220._8_4_ = 0x42b0c0a5;
                  auVar220._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar220._12_4_ = 0x42b0c0a5;
                  auVar220._16_4_ = 0x42b0c0a5;
                  auVar220._20_4_ = 0x42b0c0a5;
                  auVar220._24_4_ = 0x42b0c0a5;
                  auVar220._28_4_ = 0x42b0c0a5;
                  auVar333 = vminps_avx(auVar333,auVar220);
                  auVar221._8_4_ = 0xc2b0c0a5;
                  auVar221._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar221._12_4_ = 0xc2b0c0a5;
                  auVar221._16_4_ = 0xc2b0c0a5;
                  auVar221._20_4_ = 0xc2b0c0a5;
                  auVar221._24_4_ = 0xc2b0c0a5;
                  auVar221._28_4_ = 0xc2b0c0a5;
                  auVar100 = vmaxps_avx(auVar333,auVar221);
                  auVar325 = ZEXT864(0) << 0x20;
                  auVar222._0_4_ = auVar100._0_4_ * 1.442695 + fVar187;
                  auVar222._4_4_ = auVar100._4_4_ * 1.442695 + fVar235;
                  auVar222._8_4_ = auVar100._8_4_ * 1.442695 + fVar236;
                  auVar222._12_4_ = auVar100._12_4_ * 1.442695 + fVar237;
                  auVar222._16_4_ = auVar100._16_4_ * 1.442695 + fVar238;
                  auVar222._20_4_ = auVar100._20_4_ * 1.442695 + fVar239;
                  auVar222._24_4_ = auVar100._24_4_ * 1.442695 + fVar241;
                  auVar222._28_4_ = fVar327 + -88.37626;
                  auVar178 = vroundps_avx(auVar222,1);
                  auVar333 = vcmpps_avx(auVar222,auVar178,1);
                  auVar333 = vandps_avx(auVar333,auVar258);
                  auVar333 = vsubps_avx(auVar178,auVar333);
                  auVar36._4_4_ = auVar333._4_4_ * 0.6931472;
                  auVar36._0_4_ = auVar333._0_4_ * 0.6931472;
                  auVar36._8_4_ = auVar333._8_4_ * 0.6931472;
                  auVar36._12_4_ = auVar333._12_4_ * 0.6931472;
                  auVar36._16_4_ = auVar333._16_4_ * 0.6931472;
                  auVar36._20_4_ = auVar333._20_4_ * 0.6931472;
                  auVar36._24_4_ = auVar333._24_4_ * 0.6931472;
                  auVar36._28_4_ = auVar178._28_4_;
                  auVar100 = vsubps_avx(auVar100,auVar36);
                  fVar342 = auVar100._0_4_;
                  fVar358 = auVar100._4_4_;
                  fVar359 = auVar100._8_4_;
                  fVar360 = auVar100._12_4_;
                  fVar361 = auVar100._16_4_;
                  fVar362 = auVar100._20_4_;
                  fVar363 = auVar100._24_4_;
                  auVar260 = ZEXT3264(auVar258);
                  auVar326 = ZEXT3264(auVar326._0_32_);
                  fVar187 = fVar187 + ((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 +
                                        0.008333452) * fVar342 + 0.041665796) * fVar342 + 0.16666666
                                      ) * fVar342;
                  fVar235 = fVar235 + ((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 +
                                        0.008333452) * fVar358 + 0.041665796) * fVar358 + 0.16666666
                                      ) * fVar358;
                  fVar236 = fVar236 + ((((fVar359 * 0.00019875691 + 0.0013981999) * fVar359 +
                                        0.008333452) * fVar359 + 0.041665796) * fVar359 + 0.16666666
                                      ) * fVar359;
                  fVar237 = fVar237 + ((((fVar360 * 0.00019875691 + 0.0013981999) * fVar360 +
                                        0.008333452) * fVar360 + 0.041665796) * fVar360 + 0.16666666
                                      ) * fVar360;
                  fVar238 = fVar238 + ((((fVar361 * 0.00019875691 + 0.0013981999) * fVar361 +
                                        0.008333452) * fVar361 + 0.041665796) * fVar361 + 0.16666666
                                      ) * fVar361;
                  fVar239 = fVar239 + ((((fVar362 * 0.00019875691 + 0.0013981999) * fVar362 +
                                        0.008333452) * fVar362 + 0.041665796) * fVar362 + 0.16666666
                                      ) * fVar362;
                  fVar241 = fVar241 + ((((fVar363 * 0.00019875691 + 0.0013981999) * fVar363 +
                                        0.008333452) * fVar363 + 0.041665796) * fVar363 + 0.16666666
                                      ) * fVar363;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar327 + auVar290._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar241,CONCAT420(fVar239,CONCAT416(fVar238
                                                  ,CONCAT412(fVar237,CONCAT48(fVar236,CONCAT44(
                                                  fVar235,fVar187))))))));
                  auVar262._0_4_ = (int)auVar333._0_4_;
                  auVar262._4_4_ = (int)auVar333._4_4_;
                  auVar262._8_4_ = (int)auVar333._8_4_;
                  auVar262._12_4_ = (int)auVar333._12_4_;
                  auVar223._16_4_ = (int)auVar333._16_4_;
                  auVar223._0_16_ = auVar262;
                  auVar223._20_4_ = (int)auVar333._20_4_;
                  auVar223._24_4_ = (int)auVar333._24_4_;
                  auVar223._28_4_ = (int)auVar333._28_4_;
                  auVar262 = vpslld_avx(auVar262,0x17);
                  auVar188 = vpslld_avx(auVar223._16_16_,0x17);
                  auVar188 = vpaddd_avx(auVar188,auVar329);
                  auVar262 = vpaddd_avx(auVar262,auVar329);
                  auVar174._0_4_ =
                       (fVar342 + fVar92 + fVar342 * fVar342 * fVar187) * auVar262._0_4_ + fVar92;
                  auVar174._4_4_ =
                       (fVar358 + fVar107 + fVar358 * fVar358 * fVar235) * auVar262._4_4_ + fVar107;
                  auVar174._8_4_ =
                       (fVar359 + fVar136 + fVar359 * fVar359 * fVar236) * auVar262._8_4_ + fVar136;
                  auVar174._12_4_ =
                       (fVar360 + fVar137 + fVar360 * fVar360 * fVar237) * auVar262._12_4_ + fVar137
                  ;
                  auVar174._16_4_ =
                       (fVar361 + fVar243 + fVar361 * fVar361 * fVar238) * auVar188._0_4_ + fVar243;
                  auVar174._20_4_ =
                       (fVar362 + fVar138 + fVar362 * fVar362 * fVar239) * auVar188._4_4_ + fVar138;
                  auVar174._24_4_ =
                       (fVar363 + fVar240 + fVar363 * fVar363 * fVar241) * auVar188._8_4_ + fVar240;
                  auVar174._28_4_ = auVar100._28_4_ + fVar242 + auVar178._28_4_ + fVar242;
                  auVar333 = vrcpps_avx(auVar174);
                  fVar92 = auVar333._0_4_;
                  fVar107 = auVar333._4_4_;
                  fVar136 = auVar333._8_4_;
                  fVar137 = auVar333._12_4_;
                  fVar243 = auVar333._16_4_;
                  fVar138 = auVar333._20_4_;
                  fVar240 = auVar333._24_4_;
                  auVar258._4_4_ = auVar174._4_4_ * (fVar107 + fVar107);
                  auVar258._0_4_ = auVar174._0_4_ * (fVar92 + fVar92);
                  auVar258._8_4_ = auVar174._8_4_ * (fVar136 + fVar136);
                  auVar258._12_4_ = auVar174._12_4_ * (fVar137 + fVar137);
                  auVar258._16_4_ = auVar174._16_4_ * (fVar243 + fVar243);
                  auVar258._20_4_ = auVar174._20_4_ * (fVar138 + fVar138);
                  auVar258._24_4_ = auVar174._24_4_ * (fVar240 + fVar240);
                  auVar258._28_4_ = auVar174._28_4_;
                  auVar100._8_4_ = 0x40000000;
                  auVar100._0_8_ = 0x4000000040000000;
                  auVar100._12_4_ = 0x40000000;
                  auVar100._16_4_ = 0x40000000;
                  auVar100._20_4_ = 0x40000000;
                  auVar100._24_4_ = 0x40000000;
                  auVar100._28_4_ = 0x40000000;
                  auVar258 = vsubps_avx(auVar100,auVar258);
                  auVar224._0_4_ = fVar92 + fVar92 + -1.0;
                  auVar224._4_4_ = fVar107 + fVar107 + -1.0;
                  auVar224._8_4_ = fVar136 + fVar136 + -1.0;
                  auVar224._12_4_ = fVar137 + fVar137 + -1.0;
                  auVar224._16_4_ = fVar243 + fVar243 + -1.0;
                  auVar224._20_4_ = fVar138 + fVar138 + -1.0;
                  auVar224._24_4_ = fVar240 + fVar240 + -1.0;
                  auVar224._28_4_ = auVar333._28_4_ + auVar333._28_4_ + -1.0;
                  auVar169._0_4_ = auVar224._0_4_ + fVar92 * auVar258._0_4_;
                  auVar169._4_4_ = auVar224._4_4_ + fVar107 * auVar258._4_4_;
                  auVar169._8_4_ = auVar224._8_4_ + fVar136 * auVar258._8_4_;
                  auVar169._12_4_ = auVar224._12_4_ + fVar137 * auVar258._12_4_;
                  auVar169._16_4_ = auVar224._16_4_ + fVar243 * auVar258._16_4_;
                  auVar169._20_4_ = auVar224._20_4_ + fVar138 * auVar258._20_4_;
                  auVar169._24_4_ = auVar224._24_4_ + fVar240 * auVar258._24_4_;
                  goto LAB_00287e52;
                case 6:
                  fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                  fVar107 = (*(float **)(&this->field_0x118 + (long)p_Var64))[1];
                  auVar224._4_4_ = fVar107;
                  auVar224._0_4_ = fVar107;
                  auVar224._8_4_ = fVar107;
                  auVar224._12_4_ = fVar107;
                  auVar224._16_4_ = fVar107;
                  auVar224._20_4_ = fVar107;
                  auVar224._24_4_ = fVar107;
                  auVar224._28_4_ = fVar107;
                  auVar178._0_4_ = auVar338._0_4_ * fVar92 + fVar107;
                  auVar178._4_4_ = auVar338._4_4_ * fVar92 + fVar107;
                  auVar178._8_4_ = fVar261 * fVar92 + fVar107;
                  auVar178._12_4_ = fVar306 * fVar92 + fVar107;
                  auVar178._16_4_ = fVar307 * fVar92 + fVar107;
                  auVar178._20_4_ = fVar308 * fVar92 + fVar107;
                  auVar178._24_4_ = fVar309 * fVar92 + fVar107;
                  auVar178._28_4_ = fVar92 + fVar107;
                  auVar333 = vmaxps_avx(auVar100,auVar178);
                  auVar333 = vminps_avx(auVar333,auVar258);
                  auVar169 = auVar333._0_28_;
LAB_00287e52:
                  in_ZMM3 = ZEXT3264(auVar224);
                  auVar339._0_4_ = auVar338._0_4_ * auVar169._0_4_;
                  auVar339._4_4_ = auVar338._4_4_ * auVar169._4_4_;
                  auVar339._8_4_ = fVar261 * auVar169._8_4_;
                  auVar339._12_4_ = fVar306 * auVar169._12_4_;
                  auVar339._16_4_ = fVar307 * auVar169._16_4_;
                  auVar339._20_4_ = fVar308 * auVar169._20_4_;
                  auVar339._24_4_ = fVar309 * auVar169._24_4_;
                  auVar333 = auVar339._0_32_;
                }
                *(undefined1 (*) [32])pAVar76 = auVar333;
                pAVar76 = pAVar76 + 4;
                uVar82 = uVar82 + 1;
                iVar66 = iVar66 + 1;
              } while (uVar82 != local_1a8.w);
            }
            iVar74 = iVar74 + 1;
          } while (iVar74 != local_1a8.h);
        }
        local_278 = local_278 + 1;
      } while (local_278 != (long)local_1a8.c);
    }
    if (((uint)local_150 == 4) && (uVar59 == 8)) {
      if ((long)local_1a8.c < 1) goto LAB_0028bb57;
      p_Var64 = pp_Var24[-3];
      iVar20 = *(int *)(&this->field_0xdc + (long)p_Var64);
      iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var64);
      iVar69 = *(int *)(&this->field_0xe4 + (long)p_Var64);
      iVar88 = *(int *)(&this->field_0xe8 + (long)p_Var64);
      uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var64);
      lVar83 = *(long *)(&this->field_0x1a8 + (long)p_Var64);
      uVar55 = *(uint *)(&this->field_0xd4 + (long)p_Var64);
      uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var64);
      local_278 = 0;
      auVar260 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar326 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar325 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar318._8_4_ = 0x42b0c0a5;
      auVar318._0_8_ = 0x42b0c0a542b0c0a5;
      auVar318._12_4_ = 0x42b0c0a5;
      auVar318._16_4_ = 0x42b0c0a5;
      auVar318._20_4_ = 0x42b0c0a5;
      auVar318._24_4_ = 0x42b0c0a5;
      auVar318._28_4_ = 0x42b0c0a5;
      auVar323._8_4_ = 0xc2b0c0a5;
      auVar323._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar323._12_4_ = 0xc2b0c0a5;
      auVar323._16_4_ = 0xc2b0c0a5;
      auVar323._20_4_ = 0xc2b0c0a5;
      auVar323._24_4_ = 0xc2b0c0a5;
      auVar323._28_4_ = 0xc2b0c0a5;
      do {
        if (0 < local_1a8.h) {
          iVar79 = bottom_blob->w;
          iVar81 = bottom_blob->h;
          pAVar76 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * local_278 * local_1a8.elemsize);
          uVar65 = bottom_blob->c;
          iVar74 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar82 = 0;
              iVar66 = (1 - uVar55) * iVar20;
              do {
                if (lVar83 == 0) {
                  auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar338 = ZEXT3264(*(undefined1 (*) [32])(lVar83 + local_278 * 0x20));
                }
                if (0 < (int)uVar65) {
                  pvVar90 = (void *)((this->weight_data_tm).cstep * local_278 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar78 = bottom_blob->data;
                  uVar68 = 0;
                  do {
                    if (0 < (int)uVar22) {
                      uVar87 = 0;
                      uVar71 = 0;
                      do {
                        iVar56 = (((int)uVar71 - uVar22) + 1) * iVar21 + iVar74;
                        if ((((-1 < iVar56) && (iVar57 = iVar56 / iVar88, iVar56 % iVar88 == 0)) &&
                            (0 < (int)uVar55)) && (iVar57 < iVar81)) {
                          lVar86 = (long)iVar57 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar68;
                          uVar75 = uVar87;
                          uVar84 = (ulong)uVar55;
                          iVar56 = iVar66;
                          do {
                            if (((-1 < iVar56) && (iVar57 = iVar56 / iVar69, iVar56 % iVar69 == 0))
                               && (iVar57 < iVar79)) {
                              lVar62 = (long)(iVar57 << 2);
                              fVar92 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86);
                              fVar107 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 4);
                              fVar136 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 8);
                              fVar137 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0xc);
                              in_ZMM7 = ZEXT3264(CONCAT428(fVar137,CONCAT424(fVar137,CONCAT420(
                                                  fVar137,CONCAT416(fVar137,CONCAT412(fVar137,
                                                  CONCAT48(fVar137,CONCAT44(fVar137,fVar137))))))));
                              uVar63 = uVar75 & 0xffffffff;
                              pfVar89 = (float *)((long)pvVar90 + uVar63 * 4);
                              pfVar72 = (float *)((long)pvVar90 + uVar63 * 4 + 0x20);
                              pfVar2 = (float *)((long)pvVar90 + uVar63 * 4 + 0x40);
                              fVar243 = fVar107 + fVar136;
                              pfVar3 = (float *)((long)pvVar90 + uVar63 * 4 + 0x60);
                              in_ZMM3 = ZEXT3264(CONCAT428(fVar243,CONCAT424(fVar137 * pfVar3[6],
                                                                             CONCAT420(fVar137 * 
                                                  pfVar3[5],
                                                  CONCAT416(fVar137 * pfVar3[4],
                                                            CONCAT412(fVar137 * pfVar3[3],
                                                                      CONCAT48(fVar137 * pfVar3[2],
                                                                               CONCAT44(fVar137 * 
                                                  pfVar3[1],fVar137 * *pfVar3))))))));
                              auVar338 = ZEXT3264(CONCAT428(auVar338._28_4_ + fVar92 + fVar243 +
                                                            fVar243,CONCAT424(auVar338._24_4_ +
                                                                              fVar92 * pfVar89[6] +
                                                                              fVar107 * pfVar72[6] +
                                                                              fVar136 * pfVar2[6] +
                                                                              fVar137 * pfVar3[6],
                                                                              CONCAT420(auVar338.
                                                  _20_4_ + fVar92 * pfVar89[5] +
                                                  fVar107 * pfVar72[5] + fVar136 * pfVar2[5] +
                                                  fVar137 * pfVar3[5],
                                                  CONCAT416(auVar338._16_4_ + fVar92 * pfVar89[4] +
                                                            fVar107 * pfVar72[4] +
                                                            fVar136 * pfVar2[4] +
                                                            fVar137 * pfVar3[4],
                                                            CONCAT412(auVar338._12_4_ +
                                                                      fVar92 * pfVar89[3] +
                                                                      fVar107 * pfVar72[3] +
                                                                      fVar136 * pfVar2[3] +
                                                                      fVar137 * pfVar3[3],
                                                                      CONCAT48(auVar338._8_4_ +
                                                                               fVar92 * pfVar89[2] +
                                                                               fVar107 * pfVar72[2]
                                                                               + fVar136 * pfVar2[2]
                                                                               + fVar137 * pfVar3[2]
                                                                               ,CONCAT44(auVar338.
                                                  _4_4_ + fVar92 * pfVar89[1] +
                                                  fVar107 * pfVar72[1] + fVar136 * pfVar2[1] +
                                                  fVar137 * pfVar3[1],
                                                  auVar338._0_4_ + fVar92 * *pfVar89 +
                                                  fVar107 * *pfVar72 + fVar136 * *pfVar2 +
                                                  fVar137 * *pfVar3))))))));
                            }
                            uVar75 = uVar75 + 0x20;
                            iVar56 = iVar56 + iVar20;
                            uVar84 = uVar84 - 1;
                          } while (uVar84 != 0);
                        }
                        uVar71 = uVar71 + 1;
                        uVar87 = uVar87 + (ulong)uVar55 * 0x20;
                      } while (uVar71 != uVar22);
                    }
                    pvVar90 = (void *)((long)pvVar90 + (long)(int)(uVar55 * uVar22 * 0x20) * 4);
                    uVar68 = uVar68 + 1;
                  } while (uVar68 != uVar65);
                }
                auVar335 = auVar338._0_32_;
                fVar261 = auVar338._8_4_;
                fVar306 = auVar338._12_4_;
                fVar307 = auVar338._16_4_;
                fVar308 = auVar338._20_4_;
                fVar309 = auVar338._24_4_;
                fVar187 = auVar326._0_4_;
                fVar235 = auVar326._4_4_;
                fVar236 = auVar326._8_4_;
                fVar237 = auVar326._12_4_;
                fVar238 = auVar326._16_4_;
                fVar239 = auVar326._20_4_;
                fVar241 = auVar326._24_4_;
                fVar327 = auVar326._28_4_;
                auVar333 = auVar325._0_32_;
                fVar92 = auVar325._0_4_;
                fVar107 = auVar325._4_4_;
                fVar136 = auVar325._8_4_;
                fVar137 = auVar325._12_4_;
                fVar243 = auVar325._16_4_;
                fVar138 = auVar325._20_4_;
                fVar240 = auVar325._24_4_;
                fVar242 = auVar325._28_4_;
                auVar340._28_36_ = auVar338._28_36_;
                switch(uVar23) {
                case 1:
                  auVar335 = vmaxps_avx(auVar335,auVar260._0_32_);
                  break;
                case 2:
                  auVar333 = vmaxps_avx(auVar335,ZEXT1632(ZEXT816(0) << 0x40));
                  in_ZMM7 = ZEXT3264(auVar333);
                  auVar260 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar258 = vminps_avx(auVar335,ZEXT1632(ZEXT816(0) << 0x40));
                  fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                  auVar335._0_4_ = fVar92 * auVar258._0_4_ + auVar333._0_4_;
                  auVar335._4_4_ = fVar92 * auVar258._4_4_ + auVar333._4_4_;
                  auVar335._8_4_ = fVar92 * auVar258._8_4_ + auVar333._8_4_;
                  auVar335._12_4_ = fVar92 * auVar258._12_4_ + auVar333._12_4_;
                  auVar335._16_4_ = fVar92 * auVar258._16_4_ + auVar333._16_4_;
                  auVar335._20_4_ = fVar92 * auVar258._20_4_ + auVar333._20_4_;
                  auVar335._24_4_ = fVar92 * auVar258._24_4_ + auVar333._24_4_;
                  auVar335._28_4_ = auVar258._28_4_ + auVar333._28_4_;
                  break;
                case 3:
                  uVar8 = **(undefined4 **)(&this->field_0x118 + (long)p_Var64);
                  auVar296._4_4_ = uVar8;
                  auVar296._0_4_ = uVar8;
                  auVar296._8_4_ = uVar8;
                  auVar296._12_4_ = uVar8;
                  auVar296._16_4_ = uVar8;
                  auVar296._20_4_ = uVar8;
                  auVar296._24_4_ = uVar8;
                  auVar296._28_4_ = uVar8;
                  uVar8 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var64))[1];
                  auVar356._4_4_ = uVar8;
                  auVar356._0_4_ = uVar8;
                  auVar356._8_4_ = uVar8;
                  auVar356._12_4_ = uVar8;
                  auVar356._16_4_ = uVar8;
                  auVar356._20_4_ = uVar8;
                  auVar356._24_4_ = uVar8;
                  auVar356._28_4_ = uVar8;
                  auVar333 = vmaxps_avx(auVar335,auVar296);
                  in_ZMM7 = ZEXT3264(auVar333);
                  auVar335 = vminps_avx(auVar356,auVar333);
                  break;
                case 4:
                  auVar297._0_8_ = auVar338._0_8_ ^ 0x8000000080000000;
                  auVar297._8_4_ = -fVar261;
                  auVar297._12_4_ = -fVar306;
                  auVar297._16_4_ = -fVar307;
                  auVar297._20_4_ = -fVar308;
                  auVar297._24_4_ = -fVar309;
                  auVar297._28_4_ = -auVar338._28_4_;
                  auVar131._8_4_ = 0x42b0c0a5;
                  auVar131._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar131._12_4_ = 0x42b0c0a5;
                  auVar131._16_4_ = 0x42b0c0a5;
                  auVar131._20_4_ = 0x42b0c0a5;
                  auVar131._24_4_ = 0x42b0c0a5;
                  auVar131._28_4_ = 0x42b0c0a5;
                  auVar258 = vminps_avx(auVar297,auVar131);
                  auVar132._8_4_ = 0xc2b0c0a5;
                  auVar132._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar132._12_4_ = 0xc2b0c0a5;
                  auVar132._16_4_ = 0xc2b0c0a5;
                  auVar132._20_4_ = 0xc2b0c0a5;
                  auVar132._24_4_ = 0xc2b0c0a5;
                  auVar132._28_4_ = 0xc2b0c0a5;
                  auVar100 = vmaxps_avx(auVar258,auVar132);
                  auVar334._0_4_ = auVar100._0_4_ * 1.442695 + fVar187;
                  auVar334._4_4_ = auVar100._4_4_ * 1.442695 + fVar235;
                  auVar334._8_4_ = auVar100._8_4_ * 1.442695 + fVar236;
                  auVar334._12_4_ = auVar100._12_4_ * 1.442695 + fVar237;
                  auVar334._16_4_ = auVar100._16_4_ * 1.442695 + fVar238;
                  auVar334._20_4_ = auVar100._20_4_ * 1.442695 + fVar239;
                  auVar334._24_4_ = auVar100._24_4_ * 1.442695 + fVar241;
                  auVar334._28_4_ = auVar338._28_4_ + fVar327;
                  auVar178 = vroundps_avx(auVar334,1);
                  auVar258 = vcmpps_avx(auVar334,auVar178,1);
                  auVar258 = vandps_avx(auVar258,auVar333);
                  auVar258 = vsubps_avx(auVar178,auVar258);
                  fVar261 = auVar258._0_4_ * -0.6931472 + auVar100._0_4_;
                  fVar306 = auVar258._4_4_ * -0.6931472 + auVar100._4_4_;
                  fVar307 = auVar258._8_4_ * -0.6931472 + auVar100._8_4_;
                  fVar308 = auVar258._12_4_ * -0.6931472 + auVar100._12_4_;
                  fVar309 = auVar258._16_4_ * -0.6931472 + auVar100._16_4_;
                  fVar342 = auVar258._20_4_ * -0.6931472 + auVar100._20_4_;
                  fVar358 = auVar258._24_4_ * -0.6931472 + auVar100._24_4_;
                  auVar264._0_4_ = (int)auVar258._0_4_;
                  auVar264._4_4_ = (int)auVar258._4_4_;
                  auVar264._8_4_ = (int)auVar258._8_4_;
                  auVar264._12_4_ = (int)auVar258._12_4_;
                  auVar298._16_4_ = (int)auVar258._16_4_;
                  auVar298._0_16_ = auVar264;
                  auVar298._20_4_ = (int)auVar258._20_4_;
                  auVar298._24_4_ = (int)auVar258._24_4_;
                  auVar298._28_4_ = (int)auVar258._28_4_;
                  auVar262 = vpslld_avx(auVar264,0x17);
                  auVar188 = vpslld_avx(auVar298._16_16_,0x17);
                  auVar109._8_4_ = 0x3f800000;
                  auVar109._0_8_ = 0x3f8000003f800000;
                  auVar109._12_4_ = 0x3f800000;
                  auVar188 = vpaddd_avx(auVar188,auVar109);
                  auVar262 = vpaddd_avx(auVar262,auVar109);
                  auVar181._0_4_ =
                       (fVar261 + fVar92 +
                       fVar261 * fVar261 *
                       (fVar187 +
                       ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) *
                         fVar261 + 0.041665796) * fVar261 + 0.16666666) * fVar261)) * auVar262._0_4_
                       + fVar92;
                  auVar181._4_4_ =
                       (fVar306 + fVar107 +
                       fVar306 * fVar306 *
                       (fVar235 +
                       ((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) *
                         fVar306 + 0.041665796) * fVar306 + 0.16666666) * fVar306)) * auVar262._4_4_
                       + fVar107;
                  auVar181._8_4_ =
                       (fVar307 + fVar136 +
                       fVar307 * fVar307 *
                       (fVar236 +
                       ((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) *
                         fVar307 + 0.041665796) * fVar307 + 0.16666666) * fVar307)) * auVar262._8_4_
                       + fVar136;
                  auVar181._12_4_ =
                       (fVar308 + fVar137 +
                       fVar308 * fVar308 *
                       (fVar237 +
                       ((((fVar308 * 0.00019875691 + 0.0013981999) * fVar308 + 0.008333452) *
                         fVar308 + 0.041665796) * fVar308 + 0.16666666) * fVar308)) *
                       auVar262._12_4_ + fVar137;
                  auVar181._16_4_ =
                       (fVar309 + fVar243 +
                       fVar309 * fVar309 *
                       (fVar238 +
                       ((((fVar309 * 0.00019875691 + 0.0013981999) * fVar309 + 0.008333452) *
                         fVar309 + 0.041665796) * fVar309 + 0.16666666) * fVar309)) * auVar188._0_4_
                       + fVar243;
                  auVar181._20_4_ =
                       (fVar342 + fVar138 +
                       fVar342 * fVar342 *
                       (fVar239 +
                       ((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 + 0.008333452) *
                         fVar342 + 0.041665796) * fVar342 + 0.16666666) * fVar342)) * auVar188._4_4_
                       + fVar138;
                  auVar181._24_4_ =
                       (fVar358 + fVar240 +
                       fVar358 * fVar358 *
                       (fVar241 +
                       ((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                         fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358)) * auVar188._8_4_
                       + fVar240;
                  auVar181._28_4_ =
                       auVar178._28_4_ + auVar100._28_4_ + fVar242 + fVar327 + -0.47508308 + fVar242
                  ;
                  auVar258 = vrcpps_avx(auVar181);
                  in_ZMM7 = ZEXT3264(auVar258);
                  fVar92 = auVar258._0_4_;
                  fVar107 = auVar258._4_4_;
                  auVar42._4_4_ = auVar181._4_4_ * fVar107;
                  auVar42._0_4_ = auVar181._0_4_ * fVar92;
                  fVar136 = auVar258._8_4_;
                  auVar42._8_4_ = auVar181._8_4_ * fVar136;
                  fVar137 = auVar258._12_4_;
                  auVar42._12_4_ = auVar181._12_4_ * fVar137;
                  fVar243 = auVar258._16_4_;
                  auVar42._16_4_ = auVar181._16_4_ * fVar243;
                  fVar138 = auVar258._20_4_;
                  auVar42._20_4_ = auVar181._20_4_ * fVar138;
                  fVar240 = auVar258._24_4_;
                  auVar42._24_4_ = auVar181._24_4_ * fVar240;
                  auVar42._28_4_ = auVar181._28_4_;
                  auVar333 = vsubps_avx(auVar333,auVar42);
                  auVar335._0_4_ = fVar92 + fVar92 * auVar333._0_4_;
                  auVar335._4_4_ = fVar107 + fVar107 * auVar333._4_4_;
                  auVar335._8_4_ = fVar136 + fVar136 * auVar333._8_4_;
                  auVar335._12_4_ = fVar137 + fVar137 * auVar333._12_4_;
                  auVar335._16_4_ = fVar243 + fVar243 * auVar333._16_4_;
                  auVar335._20_4_ = fVar138 + fVar138 * auVar333._20_4_;
                  auVar335._24_4_ = fVar240 + fVar240 * auVar333._24_4_;
                  auVar335._28_4_ = auVar258._28_4_ + auVar333._28_4_;
                  break;
                case 5:
                  auVar258 = vminps_avx(auVar335,auVar318);
                  auVar100 = vmaxps_avx(auVar323,auVar258);
                  auVar294._0_4_ = fVar187 + auVar100._0_4_ * 1.442695;
                  auVar294._4_4_ = fVar235 + auVar100._4_4_ * 1.442695;
                  auVar294._8_4_ = fVar236 + auVar100._8_4_ * 1.442695;
                  auVar294._12_4_ = fVar237 + auVar100._12_4_ * 1.442695;
                  auVar294._16_4_ = fVar238 + auVar100._16_4_ * 1.442695;
                  auVar294._20_4_ = fVar239 + auVar100._20_4_ * 1.442695;
                  auVar294._24_4_ = fVar241 + auVar100._24_4_ * 1.442695;
                  auVar294._28_4_ = fVar327 + in_ZMM7._28_4_;
                  auVar178 = vroundps_avx(auVar294,1);
                  auVar258 = vcmpps_avx(auVar294,auVar178,1);
                  auVar258 = vandps_avx(auVar258,auVar333);
                  auVar258 = vsubps_avx(auVar178,auVar258);
                  auVar38._4_4_ = auVar258._4_4_ * 0.6931472;
                  auVar38._0_4_ = auVar258._0_4_ * 0.6931472;
                  auVar38._8_4_ = auVar258._8_4_ * 0.6931472;
                  auVar38._12_4_ = auVar258._12_4_ * 0.6931472;
                  auVar38._16_4_ = auVar258._16_4_ * 0.6931472;
                  auVar38._20_4_ = auVar258._20_4_ * 0.6931472;
                  auVar38._24_4_ = auVar258._24_4_ * 0.6931472;
                  auVar38._28_4_ = auVar178._28_4_;
                  auVar100 = vsubps_avx(auVar100,auVar38);
                  fVar342 = auVar100._0_4_;
                  fVar358 = auVar100._4_4_;
                  fVar359 = auVar100._8_4_;
                  fVar360 = auVar100._12_4_;
                  fVar361 = auVar100._16_4_;
                  fVar362 = auVar100._20_4_;
                  fVar363 = auVar100._24_4_;
                  auVar189._0_4_ = (int)auVar258._0_4_;
                  auVar189._4_4_ = (int)auVar258._4_4_;
                  auVar189._8_4_ = (int)auVar258._8_4_;
                  auVar189._12_4_ = (int)auVar258._12_4_;
                  auVar225._16_4_ = (int)auVar258._16_4_;
                  auVar225._0_16_ = auVar189;
                  auVar225._20_4_ = (int)auVar258._20_4_;
                  auVar225._24_4_ = (int)auVar258._24_4_;
                  auVar225._28_4_ = (int)auVar258._28_4_;
                  auVar262 = vpslld_avx(auVar189,0x17);
                  auVar188 = vpslld_avx(auVar225._16_16_,0x17);
                  auVar253._8_4_ = 0x3f800000;
                  auVar253._0_8_ = 0x3f8000003f800000;
                  auVar253._12_4_ = 0x3f800000;
                  auVar188 = vpaddd_avx(auVar188,auVar253);
                  auVar262 = vpaddd_avx(auVar262,auVar253);
                  auVar295._0_4_ =
                       (fVar342 + fVar92 +
                       fVar342 * fVar342 *
                       (((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 + 0.008333452) *
                          fVar342 + 0.041665796) * fVar342 + 0.16666666) * fVar342 + fVar187)) *
                       auVar262._0_4_ + fVar92;
                  auVar295._4_4_ =
                       (fVar358 + fVar107 +
                       fVar358 * fVar358 *
                       (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                          fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar235)) *
                       auVar262._4_4_ + fVar107;
                  auVar295._8_4_ =
                       (fVar359 + fVar136 +
                       fVar359 * fVar359 *
                       (((((fVar359 * 0.00019875691 + 0.0013981999) * fVar359 + 0.008333452) *
                          fVar359 + 0.041665796) * fVar359 + 0.16666666) * fVar359 + fVar236)) *
                       auVar262._8_4_ + fVar136;
                  auVar295._12_4_ =
                       (fVar360 + fVar137 +
                       fVar360 * fVar360 *
                       (((((fVar360 * 0.00019875691 + 0.0013981999) * fVar360 + 0.008333452) *
                          fVar360 + 0.041665796) * fVar360 + 0.16666666) * fVar360 + fVar237)) *
                       auVar262._12_4_ + fVar137;
                  auVar295._16_4_ =
                       (fVar361 + fVar243 +
                       fVar361 * fVar361 *
                       (((((fVar361 * 0.00019875691 + 0.0013981999) * fVar361 + 0.008333452) *
                          fVar361 + 0.041665796) * fVar361 + 0.16666666) * fVar361 + fVar238)) *
                       auVar188._0_4_ + fVar243;
                  auVar295._20_4_ =
                       (fVar362 + fVar138 +
                       fVar362 * fVar362 *
                       (((((fVar362 * 0.00019875691 + 0.0013981999) * fVar362 + 0.008333452) *
                          fVar362 + 0.041665796) * fVar362 + 0.16666666) * fVar362 + fVar239)) *
                       auVar188._4_4_ + fVar138;
                  auVar295._24_4_ =
                       (fVar363 + fVar240 +
                       fVar363 * fVar363 *
                       (((((fVar363 * 0.00019875691 + 0.0013981999) * fVar363 + 0.008333452) *
                          fVar363 + 0.041665796) * fVar363 + 0.16666666) * fVar363 + fVar241)) *
                       auVar188._8_4_ + fVar240;
                  auVar295._28_4_ =
                       auVar100._28_4_ + fVar242 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar327 + fVar242;
                  auVar101._8_4_ = 0x800000;
                  auVar101._0_8_ = 0x80000000800000;
                  auVar101._12_4_ = 0x800000;
                  auVar101._16_4_ = 0x800000;
                  auVar101._20_4_ = 0x800000;
                  auVar101._24_4_ = 0x800000;
                  auVar101._28_4_ = 0x800000;
                  auVar178 = vmaxps_avx(auVar295,auVar101);
                  auVar188 = vpsrld_avx(auVar178._16_16_,0x17);
                  auVar102._8_4_ = 0x807fffff;
                  auVar102._0_8_ = 0x807fffff807fffff;
                  auVar102._12_4_ = 0x807fffff;
                  auVar102._16_4_ = 0x807fffff;
                  auVar102._20_4_ = 0x807fffff;
                  auVar102._24_4_ = 0x807fffff;
                  auVar102._28_4_ = 0x807fffff;
                  auVar258 = vandps_avx(auVar178,auVar102);
                  auVar224 = vorps_avx(auVar258,auVar326._0_32_);
                  auVar103._8_4_ = 0x3f3504f3;
                  auVar103._0_8_ = 0x3f3504f33f3504f3;
                  auVar103._12_4_ = 0x3f3504f3;
                  auVar103._16_4_ = 0x3f3504f3;
                  auVar103._20_4_ = 0x3f3504f3;
                  auVar103._24_4_ = 0x3f3504f3;
                  auVar103._28_4_ = 0x3f3504f3;
                  auVar100 = vcmpps_avx(auVar103,auVar224,2);
                  auVar258 = vandnps_avx(auVar100,auVar224);
                  fVar342 = auVar224._0_4_ + -1.0 + auVar258._0_4_;
                  fVar358 = auVar224._4_4_ + -1.0 + auVar258._4_4_;
                  fVar359 = auVar224._8_4_ + -1.0 + auVar258._8_4_;
                  fVar360 = auVar224._12_4_ + -1.0 + auVar258._12_4_;
                  fVar361 = auVar224._16_4_ + -1.0 + auVar258._16_4_;
                  fVar362 = auVar224._20_4_ + -1.0 + auVar258._20_4_;
                  fVar363 = auVar224._24_4_ + -1.0 + auVar258._24_4_;
                  auVar188 = vpsubd_avx(auVar188,auVar100._16_16_);
                  auVar262 = vpsrld_avx(auVar178._0_16_,0x17);
                  auVar94._8_4_ = 0xffffff81;
                  auVar94._0_8_ = 0xffffff81ffffff81;
                  auVar94._12_4_ = 0xffffff81;
                  auVar188 = vpaddd_avx(auVar188,auVar94);
                  auVar262 = vpsubd_avx(auVar262,auVar100._0_16_);
                  auVar262 = vpaddd_avx(auVar262,auVar94);
                  auVar179._16_16_ = auVar188;
                  auVar179._0_16_ = auVar262;
                  auVar260 = ZEXT864(0) << 0x20;
                  auVar100 = vcmpps_avx(auVar295,ZEXT832(0) << 0x20,2);
                  auVar178 = vcvtdq2ps_avx(auVar179);
                  auVar39._4_4_ =
                       (fVar358 + auVar178._4_4_ * 0.6931472 +
                       fVar358 * fVar358 *
                       (fVar358 * (fVar358 * (fVar358 * (fVar358 * (fVar358 * (fVar358 * (fVar358 * 
                                                  (fVar358 * (fVar358 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar39._0_4_ =
                       (fVar342 + auVar178._0_4_ * 0.6931472 +
                       fVar342 * fVar342 *
                       (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * 
                                                  (fVar342 * (fVar342 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar39._8_4_ =
                       (fVar359 + auVar178._8_4_ * 0.6931472 +
                       fVar359 * fVar359 *
                       (fVar359 * (fVar359 * (fVar359 * (fVar359 * (fVar359 * (fVar359 * (fVar359 * 
                                                  (fVar359 * (fVar359 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar39._12_4_ =
                       (fVar360 + auVar178._12_4_ * 0.6931472 +
                       fVar360 * fVar360 *
                       (fVar360 * (fVar360 * (fVar360 * (fVar360 * (fVar360 * (fVar360 * (fVar360 * 
                                                  (fVar360 * (fVar360 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar39._16_4_ =
                       (fVar361 + auVar178._16_4_ * 0.6931472 +
                       fVar361 * fVar361 *
                       (fVar361 * (fVar361 * (fVar361 * (fVar361 * (fVar361 * (fVar361 * (fVar361 * 
                                                  (fVar361 * (fVar361 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar39._20_4_ =
                       (fVar362 + auVar178._20_4_ * 0.6931472 +
                       fVar362 * fVar362 *
                       (fVar362 * (fVar362 * (fVar362 * (fVar362 * (fVar362 * (fVar362 * (fVar362 * 
                                                  (fVar362 * (fVar362 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar39._24_4_ =
                       (fVar363 + auVar178._24_4_ * 0.6931472 +
                       fVar363 * fVar363 *
                       (fVar363 * (fVar363 * (fVar363 * (fVar363 * (fVar363 * (fVar363 * (fVar363 * 
                                                  (fVar363 * (fVar363 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar39._28_4_ = auVar224._28_4_ + -1.0 + auVar258._28_4_ + auVar178._28_4_ + 0.0;
                  auVar226._8_4_ = 0x7fffffff;
                  auVar226._0_8_ = 0x7fffffff7fffffff;
                  auVar226._12_4_ = 0x7fffffff;
                  auVar226._16_4_ = 0x7fffffff;
                  auVar226._20_4_ = 0x7fffffff;
                  auVar226._24_4_ = 0x7fffffff;
                  auVar226._28_4_ = 0x7fffffff;
                  auVar258 = vblendvps_avx(auVar39,auVar226,auVar100);
                  auVar258 = vminps_avx(auVar318,auVar258);
                  auVar100 = vmaxps_avx(auVar323,auVar258);
                  auVar227._0_4_ = auVar100._0_4_ * 1.442695 + fVar187;
                  auVar227._4_4_ = auVar100._4_4_ * 1.442695 + fVar235;
                  auVar227._8_4_ = auVar100._8_4_ * 1.442695 + fVar236;
                  auVar227._12_4_ = auVar100._12_4_ * 1.442695 + fVar237;
                  auVar227._16_4_ = auVar100._16_4_ * 1.442695 + fVar238;
                  auVar227._20_4_ = auVar100._20_4_ * 1.442695 + fVar239;
                  auVar227._24_4_ = auVar100._24_4_ * 1.442695 + fVar241;
                  auVar227._28_4_ = fVar327 + NAN;
                  auVar178 = vroundps_avx(auVar227,1);
                  auVar258 = vcmpps_avx(auVar227,auVar178,1);
                  auVar258 = vandps_avx(auVar258,auVar333);
                  auVar258 = vsubps_avx(auVar178,auVar258);
                  auVar40._4_4_ = auVar258._4_4_ * 0.6931472;
                  auVar40._0_4_ = auVar258._0_4_ * 0.6931472;
                  auVar40._8_4_ = auVar258._8_4_ * 0.6931472;
                  auVar40._12_4_ = auVar258._12_4_ * 0.6931472;
                  auVar40._16_4_ = auVar258._16_4_ * 0.6931472;
                  auVar40._20_4_ = auVar258._20_4_ * 0.6931472;
                  auVar40._24_4_ = auVar258._24_4_ * 0.6931472;
                  auVar40._28_4_ = auVar178._28_4_;
                  auVar100 = vsubps_avx(auVar100,auVar40);
                  fVar342 = auVar100._0_4_;
                  fVar358 = auVar100._4_4_;
                  fVar359 = auVar100._8_4_;
                  fVar360 = auVar100._12_4_;
                  fVar361 = auVar100._16_4_;
                  fVar362 = auVar100._20_4_;
                  fVar363 = auVar100._24_4_;
                  auVar325 = ZEXT3264(auVar333);
                  auVar326 = ZEXT3264(auVar326._0_32_);
                  fVar187 = fVar187 + ((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 +
                                        0.008333452) * fVar342 + 0.041665796) * fVar342 + 0.16666666
                                      ) * fVar342;
                  fVar235 = fVar235 + ((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 +
                                        0.008333452) * fVar358 + 0.041665796) * fVar358 + 0.16666666
                                      ) * fVar358;
                  fVar236 = fVar236 + ((((fVar359 * 0.00019875691 + 0.0013981999) * fVar359 +
                                        0.008333452) * fVar359 + 0.041665796) * fVar359 + 0.16666666
                                      ) * fVar359;
                  fVar237 = fVar237 + ((((fVar360 * 0.00019875691 + 0.0013981999) * fVar360 +
                                        0.008333452) * fVar360 + 0.041665796) * fVar360 + 0.16666666
                                      ) * fVar360;
                  fVar238 = fVar238 + ((((fVar361 * 0.00019875691 + 0.0013981999) * fVar361 +
                                        0.008333452) * fVar361 + 0.041665796) * fVar361 + 0.16666666
                                      ) * fVar361;
                  fVar239 = fVar239 + ((((fVar362 * 0.00019875691 + 0.0013981999) * fVar362 +
                                        0.008333452) * fVar362 + 0.041665796) * fVar362 + 0.16666666
                                      ) * fVar362;
                  fVar241 = fVar241 + ((((fVar363 * 0.00019875691 + 0.0013981999) * fVar363 +
                                        0.008333452) * fVar363 + 0.041665796) * fVar363 + 0.16666666
                                      ) * fVar363;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar327 + auVar295._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar241,CONCAT420(fVar239,CONCAT416(fVar238
                                                  ,CONCAT412(fVar237,CONCAT48(fVar236,CONCAT44(
                                                  fVar235,fVar187))))))));
                  auVar190._0_4_ = (int)auVar258._0_4_;
                  auVar190._4_4_ = (int)auVar258._4_4_;
                  auVar190._8_4_ = (int)auVar258._8_4_;
                  auVar190._12_4_ = (int)auVar258._12_4_;
                  auVar228._16_4_ = (int)auVar258._16_4_;
                  auVar228._0_16_ = auVar190;
                  auVar228._20_4_ = (int)auVar258._20_4_;
                  auVar228._24_4_ = (int)auVar258._24_4_;
                  auVar228._28_4_ = (int)auVar258._28_4_;
                  auVar262 = vpslld_avx(auVar190,0x17);
                  auVar188 = vpslld_avx(auVar228._16_16_,0x17);
                  auVar108._8_4_ = 0x3f800000;
                  auVar108._0_8_ = 0x3f8000003f800000;
                  auVar108._12_4_ = 0x3f800000;
                  auVar188 = vpaddd_avx(auVar188,auVar108);
                  auVar262 = vpaddd_avx(auVar262,auVar108);
                  auVar180._0_4_ =
                       (fVar342 + fVar92 + fVar342 * fVar342 * fVar187) * auVar262._0_4_ + fVar92;
                  auVar180._4_4_ =
                       (fVar358 + fVar107 + fVar358 * fVar358 * fVar235) * auVar262._4_4_ + fVar107;
                  auVar180._8_4_ =
                       (fVar359 + fVar136 + fVar359 * fVar359 * fVar236) * auVar262._8_4_ + fVar136;
                  auVar180._12_4_ =
                       (fVar360 + fVar137 + fVar360 * fVar360 * fVar237) * auVar262._12_4_ + fVar137
                  ;
                  auVar180._16_4_ =
                       (fVar361 + fVar243 + fVar361 * fVar361 * fVar238) * auVar188._0_4_ + fVar243;
                  auVar180._20_4_ =
                       (fVar362 + fVar138 + fVar362 * fVar362 * fVar239) * auVar188._4_4_ + fVar138;
                  auVar180._24_4_ =
                       (fVar363 + fVar240 + fVar363 * fVar363 * fVar241) * auVar188._8_4_ + fVar240;
                  auVar180._28_4_ = auVar100._28_4_ + fVar242 + auVar178._28_4_ + fVar242;
                  auVar333 = vrcpps_avx(auVar180);
                  fVar92 = auVar333._0_4_;
                  fVar107 = auVar333._4_4_;
                  fVar136 = auVar333._8_4_;
                  fVar137 = auVar333._12_4_;
                  fVar243 = auVar333._16_4_;
                  fVar138 = auVar333._20_4_;
                  fVar240 = auVar333._24_4_;
                  auVar41._4_4_ = auVar180._4_4_ * (fVar107 + fVar107);
                  auVar41._0_4_ = auVar180._0_4_ * (fVar92 + fVar92);
                  auVar41._8_4_ = auVar180._8_4_ * (fVar136 + fVar136);
                  auVar41._12_4_ = auVar180._12_4_ * (fVar137 + fVar137);
                  auVar41._16_4_ = auVar180._16_4_ * (fVar243 + fVar243);
                  auVar41._20_4_ = auVar180._20_4_ * (fVar138 + fVar138);
                  auVar41._24_4_ = auVar180._24_4_ * (fVar240 + fVar240);
                  auVar41._28_4_ = auVar180._28_4_;
                  auVar130._8_4_ = 0x40000000;
                  auVar130._0_8_ = 0x4000000040000000;
                  auVar130._12_4_ = 0x40000000;
                  auVar130._16_4_ = 0x40000000;
                  auVar130._20_4_ = 0x40000000;
                  auVar130._24_4_ = 0x40000000;
                  auVar130._28_4_ = 0x40000000;
                  auVar258 = vsubps_avx(auVar130,auVar41);
                  auVar229._0_4_ = fVar92 + fVar92 + -1.0;
                  auVar229._4_4_ = fVar107 + fVar107 + -1.0;
                  auVar229._8_4_ = fVar136 + fVar136 + -1.0;
                  auVar229._12_4_ = fVar137 + fVar137 + -1.0;
                  auVar229._16_4_ = fVar243 + fVar243 + -1.0;
                  auVar229._20_4_ = fVar138 + fVar138 + -1.0;
                  auVar229._24_4_ = fVar240 + fVar240 + -1.0;
                  auVar229._28_4_ = auVar333._28_4_ + auVar333._28_4_ + -1.0;
                  auVar170._0_4_ = auVar229._0_4_ + fVar92 * auVar258._0_4_;
                  auVar170._4_4_ = auVar229._4_4_ + fVar107 * auVar258._4_4_;
                  auVar170._8_4_ = auVar229._8_4_ + fVar136 * auVar258._8_4_;
                  auVar170._12_4_ = auVar229._12_4_ + fVar137 * auVar258._12_4_;
                  auVar170._16_4_ = auVar229._16_4_ + fVar243 * auVar258._16_4_;
                  auVar170._20_4_ = auVar229._20_4_ + fVar138 * auVar258._20_4_;
                  auVar170._24_4_ = auVar229._24_4_ + fVar240 * auVar258._24_4_;
                  goto LAB_002886d0;
                case 6:
                  fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                  fVar107 = (*(float **)(&this->field_0x118 + (long)p_Var64))[1];
                  auVar229._4_4_ = fVar107;
                  auVar229._0_4_ = fVar107;
                  auVar229._8_4_ = fVar107;
                  auVar229._12_4_ = fVar107;
                  auVar229._16_4_ = fVar107;
                  auVar229._20_4_ = fVar107;
                  auVar229._24_4_ = fVar107;
                  auVar229._28_4_ = fVar107;
                  auVar182._0_4_ = auVar338._0_4_ * fVar92 + fVar107;
                  auVar182._4_4_ = auVar338._4_4_ * fVar92 + fVar107;
                  auVar182._8_4_ = fVar261 * fVar92 + fVar107;
                  auVar182._12_4_ = fVar306 * fVar92 + fVar107;
                  auVar182._16_4_ = fVar307 * fVar92 + fVar107;
                  auVar182._20_4_ = fVar308 * fVar92 + fVar107;
                  auVar182._24_4_ = fVar309 * fVar92 + fVar107;
                  auVar182._28_4_ = fVar92 + fVar107;
                  auVar258 = vmaxps_avx(auVar182,auVar260._0_32_);
                  auVar333 = vminps_avx(auVar258,auVar333);
                  auVar170 = auVar333._0_28_;
LAB_002886d0:
                  in_ZMM3 = ZEXT3264(auVar229);
                  auVar340._0_4_ = auVar338._0_4_ * auVar170._0_4_;
                  auVar340._4_4_ = auVar338._4_4_ * auVar170._4_4_;
                  auVar340._8_4_ = fVar261 * auVar170._8_4_;
                  auVar340._12_4_ = fVar306 * auVar170._12_4_;
                  auVar340._16_4_ = fVar307 * auVar170._16_4_;
                  auVar340._20_4_ = fVar308 * auVar170._20_4_;
                  auVar340._24_4_ = fVar309 * auVar170._24_4_;
                  auVar335 = auVar340._0_32_;
                }
                *(undefined1 (*) [32])pAVar76 = auVar335;
                pAVar76 = pAVar76 + 4;
                uVar82 = uVar82 + 1;
                iVar66 = iVar66 + 1;
              } while (uVar82 != local_1a8.w);
            }
            iVar74 = iVar74 + 1;
          } while (iVar74 != local_1a8.h);
        }
        local_278 = local_278 + 1;
      } while (local_278 != (long)local_1a8.c);
    }
    if (((uint)local_150 == 8) && (uVar59 == 4)) {
      if ((long)local_1a8.c < 1) goto LAB_0028bb57;
      p_Var64 = pp_Var24[-3];
      iVar20 = *(int *)(&this->field_0xdc + (long)p_Var64);
      iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var64);
      iVar69 = *(int *)(&this->field_0xe4 + (long)p_Var64);
      iVar88 = *(int *)(&this->field_0xe8 + (long)p_Var64);
      uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var64);
      lVar83 = *(long *)(&this->field_0x1a8 + (long)p_Var64);
      uVar55 = *(uint *)(&this->field_0xd4 + (long)p_Var64);
      uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var64);
      local_278 = 0;
      auVar325 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar254._8_4_ = 0x3f000000;
      auVar254._0_8_ = 0x3f0000003f000000;
      auVar254._12_4_ = 0x3f000000;
      auVar260 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        if (0 < local_1a8.h) {
          iVar79 = bottom_blob->w;
          iVar81 = bottom_blob->h;
          pAVar76 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * local_278 * local_1a8.elemsize);
          uVar65 = bottom_blob->c;
          iVar74 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar82 = 0;
              iVar66 = (1 - uVar55) * iVar20;
              do {
                if (lVar83 == 0) {
                  auVar110 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar110 = *(undefined1 (*) [16])(lVar83 + local_278 * 0x10);
                }
                auVar326 = ZEXT1664(auVar110);
                if (0 < (int)uVar65) {
                  pvVar90 = (void *)((this->weight_data_tm).cstep * local_278 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar78 = bottom_blob->data;
                  uVar68 = 0;
                  do {
                    if (0 < (int)uVar22) {
                      uVar87 = 0;
                      uVar71 = 0;
                      do {
                        iVar56 = (((int)uVar71 - uVar22) + 1) * iVar21 + iVar74;
                        if ((((-1 < iVar56) && (iVar57 = iVar56 / iVar88, iVar56 % iVar88 == 0)) &&
                            (0 < (int)uVar55)) && (iVar57 < iVar81)) {
                          lVar86 = (long)iVar57 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar68;
                          uVar75 = uVar87;
                          uVar84 = (ulong)uVar55;
                          iVar56 = iVar66;
                          do {
                            if (((-1 < iVar56) && (iVar57 = iVar56 / iVar69, iVar56 % iVar69 == 0))
                               && (iVar57 < iVar79)) {
                              lVar62 = (long)(iVar57 << 3);
                              fVar92 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86);
                              fVar107 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 4);
                              fVar136 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 8);
                              fVar137 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0xc);
                              fVar243 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0x10);
                              fVar138 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0x14);
                              fVar240 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0x18);
                              fVar242 = *(float *)((long)pvVar78 + lVar62 * 4 + lVar86 + 0x1c);
                              uVar63 = uVar75 & 0xffffffff;
                              pfVar89 = (float *)((long)pvVar90 + uVar63 * 4);
                              pfVar72 = (float *)((long)pvVar90 + uVar63 * 4 + 0x10);
                              pfVar2 = (float *)((long)pvVar90 + uVar63 * 4 + 0x20);
                              pfVar3 = (float *)((long)pvVar90 + uVar63 * 4 + 0x30);
                              pfVar4 = (float *)((long)pvVar90 + uVar63 * 4 + 0x40);
                              in_ZMM7 = ZEXT1664(CONCAT412(fVar243 * pfVar4[3],
                                                           CONCAT48(fVar243 * pfVar4[2],
                                                                    CONCAT44(fVar243 * pfVar4[1],
                                                                             fVar243 * *pfVar4))));
                              pfVar5 = (float *)((long)pvVar90 + uVar63 * 4 + 0x50);
                              pfVar6 = (float *)((long)pvVar90 + uVar63 * 4 + 0x60);
                              pfVar7 = (float *)((long)pvVar90 + uVar63 * 4 + 0x70);
                              in_ZMM3 = ZEXT1664(CONCAT412(fVar242 * pfVar7[3],
                                                           CONCAT48(fVar242 * pfVar7[2],
                                                                    CONCAT44(fVar242 * pfVar7[1],
                                                                             fVar242 * *pfVar7))));
                              auVar326 = ZEXT1664(CONCAT412(fVar92 * pfVar89[3] + auVar326._12_4_ +
                                                            fVar107 * pfVar72[3] +
                                                            fVar136 * pfVar2[3] +
                                                            fVar137 * pfVar3[3] +
                                                            fVar243 * pfVar4[3] +
                                                            fVar138 * pfVar5[3] +
                                                            fVar240 * pfVar6[3] +
                                                            fVar242 * pfVar7[3],
                                                            CONCAT48(fVar92 * pfVar89[2] +
                                                                     auVar326._8_4_ +
                                                                     fVar107 * pfVar72[2] +
                                                                     fVar136 * pfVar2[2] +
                                                                     fVar137 * pfVar3[2] +
                                                                     fVar243 * pfVar4[2] +
                                                                     fVar138 * pfVar5[2] +
                                                                     fVar240 * pfVar6[2] +
                                                                     fVar242 * pfVar7[2],
                                                                     CONCAT44(fVar92 * pfVar89[1] +
                                                                              auVar326._4_4_ +
                                                                              fVar107 * pfVar72[1] +
                                                                              fVar136 * pfVar2[1] +
                                                                              fVar137 * pfVar3[1] +
                                                                              fVar243 * pfVar4[1] +
                                                                              fVar138 * pfVar5[1] +
                                                                              fVar240 * pfVar6[1] +
                                                                              fVar242 * pfVar7[1],
                                                                              fVar92 * *pfVar89 +
                                                                              auVar326._0_4_ +
                                                                              fVar107 * *pfVar72 +
                                                                              fVar136 * *pfVar2 +
                                                                              fVar137 * *pfVar3 +
                                                                              fVar243 * *pfVar4 +
                                                                              fVar138 * *pfVar5 +
                                                                              fVar240 * *pfVar6 +
                                                                              fVar242 * *pfVar7))));
                            }
                            uVar75 = uVar75 + 0x20;
                            iVar56 = iVar56 + iVar20;
                            uVar84 = uVar84 - 1;
                          } while (uVar84 != 0);
                        }
                        uVar71 = uVar71 + 1;
                        uVar87 = uVar87 + (ulong)uVar55 * 0x20;
                      } while (uVar71 != uVar22);
                    }
                    auVar110 = auVar326._0_16_;
                    pvVar90 = (void *)((long)pvVar90 + (long)(int)(uVar55 * uVar22 * 0x20) * 4);
                    uVar68 = uVar68 + 1;
                  } while (uVar68 != uVar65);
                }
                auVar262 = auVar325._0_16_;
                auVar188 = auVar260._0_16_;
                fVar92 = auVar260._0_4_;
                fVar107 = auVar260._4_4_;
                fVar136 = auVar260._8_4_;
                fVar137 = auVar260._12_4_;
                fVar243 = auVar110._4_4_;
                fVar138 = auVar110._8_4_;
                fVar240 = auVar110._12_4_;
                switch(uVar23) {
                case 1:
                  auVar110 = vmaxps_avx(auVar262,auVar110);
                  break;
                case 2:
                  auVar188 = vmaxps_avx(auVar262,auVar110);
                  in_ZMM7 = ZEXT1664(auVar188);
                  auVar262 = vminps_avx(auVar262,auVar110);
                  fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                  auVar110._0_4_ = fVar92 * auVar262._0_4_ + auVar188._0_4_;
                  auVar110._4_4_ = fVar92 * auVar262._4_4_ + auVar188._4_4_;
                  auVar110._8_4_ = fVar92 * auVar262._8_4_ + auVar188._8_4_;
                  auVar110._12_4_ = fVar92 * auVar262._12_4_ + auVar188._12_4_;
                  break;
                case 3:
                  uVar8 = **(undefined4 **)(&this->field_0x118 + (long)p_Var64);
                  auVar269._4_4_ = uVar8;
                  auVar269._0_4_ = uVar8;
                  auVar269._8_4_ = uVar8;
                  auVar269._12_4_ = uVar8;
                  in_ZMM7 = ZEXT1664(auVar269);
                  uVar8 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var64))[1];
                  auVar345._4_4_ = uVar8;
                  auVar345._0_4_ = uVar8;
                  auVar345._8_4_ = uVar8;
                  auVar345._12_4_ = uVar8;
                  auVar188 = vmaxps_avx(auVar110,auVar269);
                  auVar110 = vminps_avx(auVar345,auVar188);
                  break;
                case 4:
                  auVar111._0_8_ = auVar110._0_8_ ^ 0x8000000080000000;
                  auVar111._8_4_ = -fVar138;
                  auVar111._12_4_ = -fVar240;
                  auVar144._8_4_ = 0x42b0c0a5;
                  auVar144._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar144._12_4_ = 0x42b0c0a5;
                  auVar262 = vminps_avx(auVar111,auVar144);
                  auVar145._8_4_ = 0xc2b0c0a5;
                  auVar145._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar145._12_4_ = 0xc2b0c0a5;
                  auVar310 = vmaxps_avx(auVar262,auVar145);
                  auVar270._0_4_ = auVar310._0_4_ * 1.442695 + 0.5;
                  auVar270._4_4_ = auVar310._4_4_ * 1.442695 + 0.5;
                  auVar270._8_4_ = auVar310._8_4_ * 1.442695 + 0.5;
                  auVar270._12_4_ = auVar310._12_4_ * 1.442695 + 0.5;
                  auVar346._0_4_ = (int)auVar270._0_4_;
                  auVar346._4_4_ = (int)auVar270._4_4_;
                  auVar346._8_4_ = (int)auVar270._8_4_;
                  auVar346._12_4_ = (int)auVar270._12_4_;
                  auVar329 = vcvtdq2ps_avx(auVar346);
                  auVar262 = vcmpps_avx(auVar270,auVar329,1);
                  auVar262 = vandps_avx(auVar262,auVar188);
                  auVar262 = vsubps_avx(auVar329,auVar262);
                  fVar243 = auVar262._0_4_ * -0.6931472 + auVar310._0_4_;
                  fVar138 = auVar262._4_4_ * -0.6931472 + auVar310._4_4_;
                  fVar240 = auVar262._8_4_ * -0.6931472 + auVar310._8_4_;
                  fVar242 = auVar262._12_4_ * -0.6931472 + auVar310._12_4_;
                  auVar271._0_4_ = (int)auVar262._0_4_;
                  auVar271._4_4_ = (int)auVar262._4_4_;
                  auVar271._8_4_ = (int)auVar262._8_4_;
                  auVar271._12_4_ = (int)auVar262._12_4_;
                  auVar262 = vpslld_avx(auVar271,0x17);
                  auVar262 = vpaddd_avx(auVar262,auVar188);
                  auVar112._0_4_ =
                       (fVar243 * fVar243 *
                        (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) *
                           fVar243 + 0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5) +
                       fVar243 + fVar92) * auVar262._0_4_ + fVar92;
                  auVar112._4_4_ =
                       (fVar138 * fVar138 *
                        (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                           fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) +
                       fVar138 + fVar107) * auVar262._4_4_ + fVar107;
                  auVar112._8_4_ =
                       (fVar240 * fVar240 *
                        (((((fVar240 * 0.00019875691 + 0.0013981999) * fVar240 + 0.008333452) *
                           fVar240 + 0.041665796) * fVar240 + 0.16666666) * fVar240 + 0.5) +
                       fVar240 + fVar136) * auVar262._8_4_ + fVar136;
                  auVar112._12_4_ =
                       (fVar242 * fVar242 *
                        (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) *
                           fVar242 + 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) +
                       fVar242 + fVar137) * auVar262._12_4_ + fVar137;
                  auVar262 = vrcpps_avx(auVar112);
                  in_ZMM7 = ZEXT1664(auVar262);
                  fVar92 = auVar262._0_4_;
                  auVar113._0_4_ = auVar112._0_4_ * fVar92;
                  fVar107 = auVar262._4_4_;
                  auVar113._4_4_ = auVar112._4_4_ * fVar107;
                  fVar136 = auVar262._8_4_;
                  auVar113._8_4_ = auVar112._8_4_ * fVar136;
                  fVar137 = auVar262._12_4_;
                  auVar113._12_4_ = auVar112._12_4_ * fVar137;
                  auVar188 = vsubps_avx(auVar188,auVar113);
                  auVar110._0_4_ = fVar92 + fVar92 * auVar188._0_4_;
                  auVar110._4_4_ = fVar107 + fVar107 * auVar188._4_4_;
                  auVar110._8_4_ = fVar136 + fVar136 * auVar188._8_4_;
                  auVar110._12_4_ = fVar137 + fVar137 * auVar188._12_4_;
                  break;
                case 5:
                  auVar244._8_4_ = 0x42b0c0a5;
                  auVar244._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar244._12_4_ = 0x42b0c0a5;
                  auVar262 = vminps_avx(auVar110,auVar244);
                  auVar311._8_4_ = 0xc2b0c0a5;
                  auVar311._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar311._12_4_ = 0xc2b0c0a5;
                  auVar310 = vmaxps_avx(auVar311,auVar262);
                  auVar328._0_4_ = auVar310._0_4_ * 1.442695 + 0.5;
                  auVar328._4_4_ = auVar310._4_4_ * 1.442695 + 0.5;
                  auVar328._8_4_ = auVar310._8_4_ * 1.442695 + 0.5;
                  auVar328._12_4_ = auVar310._12_4_ * 1.442695 + 0.5;
                  auVar343._0_4_ = (int)auVar328._0_4_;
                  auVar343._4_4_ = (int)auVar328._4_4_;
                  auVar343._8_4_ = (int)auVar328._8_4_;
                  auVar343._12_4_ = (int)auVar328._12_4_;
                  auVar329 = vcvtdq2ps_avx(auVar343);
                  auVar262 = vcmpps_avx(auVar328,auVar329,1);
                  auVar262 = vandps_avx(auVar262,auVar188);
                  auVar262 = vsubps_avx(auVar329,auVar262);
                  auVar344._0_4_ = auVar262._0_4_ * 0.6931472;
                  auVar344._4_4_ = auVar262._4_4_ * 0.6931472;
                  auVar344._8_4_ = auVar262._8_4_ * 0.6931472;
                  auVar344._12_4_ = auVar262._12_4_ * 0.6931472;
                  auVar329 = vsubps_avx(auVar310,auVar344);
                  fVar242 = auVar329._0_4_;
                  fVar187 = auVar329._4_4_;
                  fVar235 = auVar329._8_4_;
                  fVar236 = auVar329._12_4_;
                  auVar265._0_4_ = (int)auVar262._0_4_;
                  auVar265._4_4_ = (int)auVar262._4_4_;
                  auVar265._8_4_ = (int)auVar262._8_4_;
                  auVar265._12_4_ = (int)auVar262._12_4_;
                  auVar262 = vpslld_avx(auVar265,0x17);
                  auVar262 = vpaddd_avx(auVar262,auVar188);
                  auVar266._0_4_ =
                       (fVar242 + fVar92 +
                       fVar242 * fVar242 *
                       (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) *
                          fVar242 + 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5)) *
                       auVar262._0_4_ + fVar92;
                  auVar266._4_4_ =
                       (fVar187 + fVar107 +
                       fVar187 * fVar187 *
                       (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                          fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + 0.5)) *
                       auVar262._4_4_ + fVar107;
                  auVar266._8_4_ =
                       (fVar235 + fVar136 +
                       fVar235 * fVar235 *
                       (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) *
                          fVar235 + 0.041665796) * fVar235 + 0.16666666) * fVar235 + 0.5)) *
                       auVar262._8_4_ + fVar136;
                  auVar266._12_4_ =
                       (fVar236 + fVar137 +
                       fVar236 * fVar236 *
                       (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                          fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5)) *
                       auVar262._12_4_ + fVar137;
                  auVar139._8_4_ = 0x800000;
                  auVar139._0_8_ = 0x80000000800000;
                  auVar139._12_4_ = 0x800000;
                  auVar262 = vmaxps_avx(auVar266,auVar139);
                  auVar329 = vpsrld_avx(auVar262,0x17);
                  auVar191._8_4_ = 0xffffff82;
                  auVar191._0_8_ = 0xffffff82ffffff82;
                  auVar191._12_4_ = 0xffffff82;
                  auVar329 = vpaddd_avx(auVar329,auVar191);
                  auVar192._8_4_ = 0x807fffff;
                  auVar192._0_8_ = 0x807fffff807fffff;
                  auVar192._12_4_ = 0x807fffff;
                  auVar262 = vandps_avx(auVar262,auVar192);
                  auVar93 = vorps_avx(auVar262,auVar254);
                  auVar310 = vcvtdq2ps_avx(auVar329);
                  auVar193._8_4_ = 0x3f3504f3;
                  auVar193._0_8_ = 0x3f3504f33f3504f3;
                  auVar193._12_4_ = 0x3f3504f3;
                  auVar329 = vcmpps_avx(auVar93,auVar193,1);
                  auVar262 = vandps_avx(auVar329,auVar93);
                  fVar242 = auVar93._0_4_ + -1.0 + auVar262._0_4_;
                  fVar187 = auVar93._4_4_ + -1.0 + auVar262._4_4_;
                  fVar235 = auVar93._8_4_ + -1.0 + auVar262._8_4_;
                  fVar236 = auVar93._12_4_ + -1.0 + auVar262._12_4_;
                  auVar262 = vandps_avx(auVar329,auVar188);
                  auVar329 = vsubps_avx(auVar310,auVar262);
                  auVar262 = vcmpps_avx(auVar266,_DAT_00554060,2);
                  auVar140._0_4_ =
                       (fVar242 * fVar242 *
                        (((((((((fVar242 * 0.070376836 + -0.1151461) * fVar242 + 0.116769984) *
                               fVar242 + -0.12420141) * fVar242 + 0.14249323) * fVar242 +
                            -0.16668057) * fVar242 + 0.20000714) * fVar242 + -0.24999994) * fVar242
                         + 0.3333333) * fVar242 + -0.5) + auVar329._0_4_ * 0.6931472 + fVar242) *
                       -2.0;
                  auVar140._4_4_ =
                       (fVar187 * fVar187 *
                        (((((((((fVar187 * 0.070376836 + -0.1151461) * fVar187 + 0.116769984) *
                               fVar187 + -0.12420141) * fVar187 + 0.14249323) * fVar187 +
                            -0.16668057) * fVar187 + 0.20000714) * fVar187 + -0.24999994) * fVar187
                         + 0.3333333) * fVar187 + -0.5) + auVar329._4_4_ * 0.6931472 + fVar187) *
                       -2.0;
                  auVar140._8_4_ =
                       (fVar235 * fVar235 *
                        (((((((((fVar235 * 0.070376836 + -0.1151461) * fVar235 + 0.116769984) *
                               fVar235 + -0.12420141) * fVar235 + 0.14249323) * fVar235 +
                            -0.16668057) * fVar235 + 0.20000714) * fVar235 + -0.24999994) * fVar235
                         + 0.3333333) * fVar235 + -0.5) + auVar329._8_4_ * 0.6931472 + fVar235) *
                       -2.0;
                  auVar140._12_4_ =
                       (fVar236 * fVar236 *
                        (((((((((fVar236 * 0.070376836 + -0.1151461) * fVar236 + 0.116769984) *
                               fVar236 + -0.12420141) * fVar236 + 0.14249323) * fVar236 +
                            -0.16668057) * fVar236 + 0.20000714) * fVar236 + -0.24999994) * fVar236
                         + 0.3333333) * fVar236 + -0.5) + auVar329._12_4_ * 0.6931472 + fVar236) *
                       -2.0;
                  auVar194._8_4_ = 0x7fffffff;
                  auVar194._0_8_ = 0x7fffffff7fffffff;
                  auVar194._12_4_ = 0x7fffffff;
                  auVar262 = vblendvps_avx(auVar140,auVar194,auVar262);
                  auVar195._8_4_ = 0x42b0c0a5;
                  auVar195._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar195._12_4_ = 0x42b0c0a5;
                  auVar262 = vminps_avx(auVar262,auVar195);
                  auVar196._8_4_ = 0xc2b0c0a5;
                  auVar196._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar196._12_4_ = 0xc2b0c0a5;
                  auVar310 = vmaxps_avx(auVar262,auVar196);
                  auVar197._0_4_ = auVar310._0_4_ * 1.442695 + 0.5;
                  auVar197._4_4_ = auVar310._4_4_ * 1.442695 + 0.5;
                  auVar197._8_4_ = auVar310._8_4_ * 1.442695 + 0.5;
                  auVar197._12_4_ = auVar310._12_4_ * 1.442695 + 0.5;
                  auVar267._0_4_ = (int)auVar197._0_4_;
                  auVar267._4_4_ = (int)auVar197._4_4_;
                  auVar267._8_4_ = (int)auVar197._8_4_;
                  auVar267._12_4_ = (int)auVar197._12_4_;
                  auVar329 = vcvtdq2ps_avx(auVar267);
                  auVar262 = vcmpps_avx(auVar197,auVar329,1);
                  auVar262 = vandps_avx(auVar262,auVar188);
                  auVar262 = vsubps_avx(auVar329,auVar262);
                  auVar268._0_4_ = auVar262._0_4_ * 0.6931472;
                  auVar268._4_4_ = auVar262._4_4_ * 0.6931472;
                  auVar268._8_4_ = auVar262._8_4_ * 0.6931472;
                  auVar268._12_4_ = auVar262._12_4_ * 0.6931472;
                  auVar260 = ZEXT1664(auVar188);
                  auVar329 = vsubps_avx(auVar310,auVar268);
                  fVar242 = auVar329._0_4_;
                  fVar187 = auVar329._4_4_;
                  fVar235 = auVar329._8_4_;
                  fVar236 = auVar329._12_4_;
                  auVar325 = ZEXT864(0) << 0x20;
                  auVar198._0_4_ = (int)auVar262._0_4_;
                  auVar198._4_4_ = (int)auVar262._4_4_;
                  auVar198._8_4_ = (int)auVar262._8_4_;
                  auVar198._12_4_ = (int)auVar262._12_4_;
                  auVar262 = vpslld_avx(auVar198,0x17);
                  auVar188 = vpaddd_avx(auVar262,auVar188);
                  auVar141._0_4_ =
                       (fVar242 + fVar92 +
                       (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) *
                          fVar242 + 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) *
                       fVar242 * fVar242) * auVar188._0_4_ + fVar92;
                  auVar141._4_4_ =
                       (fVar187 + fVar107 +
                       (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                          fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + 0.5) *
                       fVar187 * fVar187) * auVar188._4_4_ + fVar107;
                  auVar141._8_4_ =
                       (fVar235 + fVar136 +
                       (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) *
                          fVar235 + 0.041665796) * fVar235 + 0.16666666) * fVar235 + 0.5) *
                       fVar235 * fVar235) * auVar188._8_4_ + fVar136;
                  auVar141._12_4_ =
                       (fVar236 + fVar137 +
                       (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                          fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5) *
                       fVar236 * fVar236) * auVar188._12_4_ + fVar137;
                  auVar188 = vrcpps_avx(auVar141);
                  fVar92 = auVar188._0_4_;
                  fVar242 = fVar92 + fVar92;
                  fVar107 = auVar188._4_4_;
                  fVar187 = fVar107 + fVar107;
                  fVar136 = auVar188._8_4_;
                  fVar235 = fVar136 + fVar136;
                  fVar137 = auVar188._12_4_;
                  fVar236 = fVar137 + fVar137;
                  in_ZMM7 = ZEXT1664(CONCAT412(fVar236,CONCAT48(fVar235,CONCAT44(fVar187,fVar242))))
                  ;
                  auVar142._0_4_ = auVar141._0_4_ * fVar242;
                  auVar142._4_4_ = auVar141._4_4_ * fVar187;
                  auVar142._8_4_ = auVar141._8_4_ * fVar235;
                  auVar142._12_4_ = auVar141._12_4_ * fVar236;
                  auVar245._8_4_ = 0x40000000;
                  auVar245._0_8_ = 0x4000000040000000;
                  auVar245._12_4_ = 0x40000000;
                  auVar188 = vsubps_avx(auVar245,auVar142);
                  auVar199._0_4_ = fVar242 + -1.0;
                  auVar199._4_4_ = fVar187 + -1.0;
                  auVar199._8_4_ = fVar235 + -1.0;
                  auVar199._12_4_ = fVar236 + -1.0;
                  auVar143._0_4_ = auVar199._0_4_ + fVar92 * auVar188._0_4_;
                  auVar143._4_4_ = auVar199._4_4_ + fVar107 * auVar188._4_4_;
                  auVar143._8_4_ = auVar199._8_4_ + fVar136 * auVar188._8_4_;
                  auVar143._12_4_ = auVar199._12_4_ + fVar137 * auVar188._12_4_;
                  goto LAB_00288f0e;
                case 6:
                  fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                  fVar107 = (*(float **)(&this->field_0x118 + (long)p_Var64))[1];
                  auVar199._4_4_ = fVar107;
                  auVar199._0_4_ = fVar107;
                  auVar199._8_4_ = fVar107;
                  auVar199._12_4_ = fVar107;
                  auVar146._0_4_ = fVar92 * auVar110._0_4_ + fVar107;
                  auVar146._4_4_ = fVar92 * fVar243 + fVar107;
                  auVar146._8_4_ = fVar92 * fVar138 + fVar107;
                  auVar146._12_4_ = fVar92 * fVar240 + fVar107;
                  auVar262 = vmaxps_avx(auVar262,auVar146);
                  auVar143 = vminps_avx(auVar262,auVar188);
LAB_00288f0e:
                  in_ZMM3 = ZEXT1664(auVar199);
                  auVar110._0_4_ = auVar143._0_4_ * auVar110._0_4_;
                  auVar110._4_4_ = auVar143._4_4_ * fVar243;
                  auVar110._8_4_ = auVar143._8_4_ * fVar138;
                  auVar110._12_4_ = auVar143._12_4_ * fVar240;
                }
                *(undefined1 (*) [16])pAVar76 = auVar110;
                pAVar76 = pAVar76 + 2;
                uVar82 = uVar82 + 1;
                iVar66 = iVar66 + 1;
              } while (uVar82 != local_1a8.w);
            }
            iVar74 = iVar74 + 1;
          } while (iVar74 != local_1a8.h);
        }
        local_278 = local_278 + 1;
      } while (local_278 != (long)local_1a8.c);
    }
    if (((uint)local_150 == 1) && (uVar59 == 8)) {
      if ((long)local_1a8.c < 1) goto LAB_0028bb57;
      p_Var64 = pp_Var24[-3];
      iVar20 = *(int *)(&this->field_0xdc + (long)p_Var64);
      iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var64);
      iVar69 = *(int *)(&this->field_0xe4 + (long)p_Var64);
      iVar88 = *(int *)(&this->field_0xe8 + (long)p_Var64);
      uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var64);
      lVar83 = *(long *)(&this->field_0x1a8 + (long)p_Var64);
      uVar55 = *(uint *)(&this->field_0xd4 + (long)p_Var64);
      uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var64);
      local_278 = 0;
      auVar260 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar326 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar325 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar319._8_4_ = 0x42b0c0a5;
      auVar319._0_8_ = 0x42b0c0a542b0c0a5;
      auVar319._12_4_ = 0x42b0c0a5;
      auVar319._16_4_ = 0x42b0c0a5;
      auVar319._20_4_ = 0x42b0c0a5;
      auVar319._24_4_ = 0x42b0c0a5;
      auVar319._28_4_ = 0x42b0c0a5;
      auVar324._8_4_ = 0xc2b0c0a5;
      auVar324._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar324._12_4_ = 0xc2b0c0a5;
      auVar324._16_4_ = 0xc2b0c0a5;
      auVar324._20_4_ = 0xc2b0c0a5;
      auVar324._24_4_ = 0xc2b0c0a5;
      auVar324._28_4_ = 0xc2b0c0a5;
      do {
        if (0 < local_1a8.h) {
          iVar79 = bottom_blob->w;
          iVar81 = bottom_blob->h;
          pAVar76 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * local_278 * local_1a8.elemsize);
          uVar65 = bottom_blob->c;
          iVar74 = 0;
          do {
            if (0 < local_1a8.w) {
              uVar82 = 0;
              iVar66 = (1 - uVar55) * iVar20;
              do {
                if (lVar83 == 0) {
                  auVar338 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar338 = ZEXT3264(*(undefined1 (*) [32])(lVar83 + local_278 * 0x20));
                }
                if (0 < (int)uVar65) {
                  pvVar90 = (void *)((this->weight_data_tm).cstep * local_278 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar68 = 0;
                  do {
                    if (0 < (int)uVar22) {
                      uVar71 = 0;
                      uVar87 = 0;
                      do {
                        iVar56 = (((int)uVar87 - uVar22) + 1) * iVar21 + iVar74;
                        if ((((-1 < iVar56) && (iVar57 = iVar56 / iVar88, iVar56 % iVar88 == 0)) &&
                            (iVar57 < iVar81)) && (0 < (int)uVar55)) {
                          uVar75 = uVar71;
                          uVar84 = (ulong)uVar55;
                          iVar56 = iVar66;
                          do {
                            if (((-1 < iVar56) && (iVar58 = iVar56 / iVar69, iVar56 % iVar69 == 0))
                               && (iVar58 < iVar79)) {
                              fVar92 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar58 * 4 +
                                                 (long)iVar57 *
                                                 (long)bottom_blob->w * bottom_blob->elemsize +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar68
                                                 );
                              pfVar89 = (float *)((long)pvVar90 + (uVar75 & 0xffffffff) * 4);
                              auVar338 = ZEXT3264(CONCAT428(auVar338._28_4_ + fVar92,
                                                            CONCAT424(auVar338._24_4_ +
                                                                      fVar92 * pfVar89[6],
                                                                      CONCAT420(auVar338._20_4_ +
                                                                                fVar92 * pfVar89[5],
                                                                                CONCAT416(auVar338.
                                                  _16_4_ + fVar92 * pfVar89[4],
                                                  CONCAT412(auVar338._12_4_ + fVar92 * pfVar89[3],
                                                            CONCAT48(auVar338._8_4_ +
                                                                     fVar92 * pfVar89[2],
                                                                     CONCAT44(auVar338._4_4_ +
                                                                              fVar92 * pfVar89[1],
                                                                              auVar338._0_4_ +
                                                                              fVar92 * *pfVar89)))))
                                                  )));
                            }
                            uVar75 = uVar75 + 8;
                            iVar56 = iVar56 + iVar20;
                            uVar84 = uVar84 - 1;
                          } while (uVar84 != 0);
                        }
                        uVar87 = uVar87 + 1;
                        uVar71 = uVar71 + (ulong)uVar55 * 8;
                      } while (uVar87 != uVar22);
                    }
                    pvVar90 = (void *)((long)pvVar90 + (long)(int)(uVar55 * uVar22 * 8) * 4);
                    uVar68 = uVar68 + 1;
                  } while (uVar68 != uVar65);
                }
                auVar337 = auVar338._0_32_;
                fVar261 = auVar338._8_4_;
                fVar306 = auVar338._12_4_;
                fVar307 = auVar338._16_4_;
                fVar308 = auVar338._20_4_;
                fVar309 = auVar338._24_4_;
                fVar187 = auVar326._0_4_;
                fVar235 = auVar326._4_4_;
                fVar236 = auVar326._8_4_;
                fVar237 = auVar326._12_4_;
                fVar238 = auVar326._16_4_;
                fVar239 = auVar326._20_4_;
                fVar241 = auVar326._24_4_;
                fVar327 = auVar326._28_4_;
                auVar333 = auVar325._0_32_;
                fVar92 = auVar325._0_4_;
                fVar107 = auVar325._4_4_;
                fVar136 = auVar325._8_4_;
                fVar137 = auVar325._12_4_;
                fVar243 = auVar325._16_4_;
                fVar138 = auVar325._20_4_;
                fVar240 = auVar325._24_4_;
                fVar242 = auVar325._28_4_;
                auVar341._28_36_ = auVar338._28_36_;
                switch(uVar23) {
                case 1:
                  auVar337 = vmaxps_avx(auVar337,auVar260._0_32_);
                  break;
                case 2:
                  auVar333 = vmaxps_avx(auVar337,ZEXT1632(ZEXT816(0) << 0x40));
                  in_ZMM7 = ZEXT3264(auVar333);
                  auVar260 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar258 = vminps_avx(auVar337,ZEXT1632(ZEXT816(0) << 0x40));
                  fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                  auVar337._0_4_ = fVar92 * auVar258._0_4_ + auVar333._0_4_;
                  auVar337._4_4_ = fVar92 * auVar258._4_4_ + auVar333._4_4_;
                  auVar337._8_4_ = fVar92 * auVar258._8_4_ + auVar333._8_4_;
                  auVar337._12_4_ = fVar92 * auVar258._12_4_ + auVar333._12_4_;
                  auVar337._16_4_ = fVar92 * auVar258._16_4_ + auVar333._16_4_;
                  auVar337._20_4_ = fVar92 * auVar258._20_4_ + auVar333._20_4_;
                  auVar337._24_4_ = fVar92 * auVar258._24_4_ + auVar333._24_4_;
                  auVar337._28_4_ = auVar258._28_4_ + auVar333._28_4_;
                  break;
                case 3:
                  uVar8 = **(undefined4 **)(&this->field_0x118 + (long)p_Var64);
                  auVar301._4_4_ = uVar8;
                  auVar301._0_4_ = uVar8;
                  auVar301._8_4_ = uVar8;
                  auVar301._12_4_ = uVar8;
                  auVar301._16_4_ = uVar8;
                  auVar301._20_4_ = uVar8;
                  auVar301._24_4_ = uVar8;
                  auVar301._28_4_ = uVar8;
                  uVar8 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var64))[1];
                  auVar357._4_4_ = uVar8;
                  auVar357._0_4_ = uVar8;
                  auVar357._8_4_ = uVar8;
                  auVar357._12_4_ = uVar8;
                  auVar357._16_4_ = uVar8;
                  auVar357._20_4_ = uVar8;
                  auVar357._24_4_ = uVar8;
                  auVar357._28_4_ = uVar8;
                  auVar333 = vmaxps_avx(auVar337,auVar301);
                  in_ZMM7 = ZEXT3264(auVar333);
                  auVar337 = vminps_avx(auVar357,auVar333);
                  break;
                case 4:
                  auVar302._0_8_ = auVar338._0_8_ ^ 0x8000000080000000;
                  auVar302._8_4_ = -fVar261;
                  auVar302._12_4_ = -fVar306;
                  auVar302._16_4_ = -fVar307;
                  auVar302._20_4_ = -fVar308;
                  auVar302._24_4_ = -fVar309;
                  auVar302._28_4_ = -auVar338._28_4_;
                  auVar134._8_4_ = 0x42b0c0a5;
                  auVar134._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar134._12_4_ = 0x42b0c0a5;
                  auVar134._16_4_ = 0x42b0c0a5;
                  auVar134._20_4_ = 0x42b0c0a5;
                  auVar134._24_4_ = 0x42b0c0a5;
                  auVar134._28_4_ = 0x42b0c0a5;
                  auVar258 = vminps_avx(auVar302,auVar134);
                  auVar135._8_4_ = 0xc2b0c0a5;
                  auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar135._12_4_ = 0xc2b0c0a5;
                  auVar135._16_4_ = 0xc2b0c0a5;
                  auVar135._20_4_ = 0xc2b0c0a5;
                  auVar135._24_4_ = 0xc2b0c0a5;
                  auVar135._28_4_ = 0xc2b0c0a5;
                  auVar100 = vmaxps_avx(auVar258,auVar135);
                  auVar336._0_4_ = auVar100._0_4_ * 1.442695 + fVar187;
                  auVar336._4_4_ = auVar100._4_4_ * 1.442695 + fVar235;
                  auVar336._8_4_ = auVar100._8_4_ * 1.442695 + fVar236;
                  auVar336._12_4_ = auVar100._12_4_ * 1.442695 + fVar237;
                  auVar336._16_4_ = auVar100._16_4_ * 1.442695 + fVar238;
                  auVar336._20_4_ = auVar100._20_4_ * 1.442695 + fVar239;
                  auVar336._24_4_ = auVar100._24_4_ * 1.442695 + fVar241;
                  auVar336._28_4_ = auVar338._28_4_ + fVar327;
                  auVar178 = vroundps_avx(auVar336,1);
                  auVar258 = vcmpps_avx(auVar336,auVar178,1);
                  auVar258 = vandps_avx(auVar258,auVar333);
                  auVar258 = vsubps_avx(auVar178,auVar258);
                  fVar261 = auVar258._0_4_ * -0.6931472 + auVar100._0_4_;
                  fVar306 = auVar258._4_4_ * -0.6931472 + auVar100._4_4_;
                  fVar307 = auVar258._8_4_ * -0.6931472 + auVar100._8_4_;
                  fVar308 = auVar258._12_4_ * -0.6931472 + auVar100._12_4_;
                  fVar309 = auVar258._16_4_ * -0.6931472 + auVar100._16_4_;
                  fVar342 = auVar258._20_4_ * -0.6931472 + auVar100._20_4_;
                  fVar358 = auVar258._24_4_ * -0.6931472 + auVar100._24_4_;
                  auVar272._0_4_ = (int)auVar258._0_4_;
                  auVar272._4_4_ = (int)auVar258._4_4_;
                  auVar272._8_4_ = (int)auVar258._8_4_;
                  auVar272._12_4_ = (int)auVar258._12_4_;
                  auVar303._16_4_ = (int)auVar258._16_4_;
                  auVar303._0_16_ = auVar272;
                  auVar303._20_4_ = (int)auVar258._20_4_;
                  auVar303._24_4_ = (int)auVar258._24_4_;
                  auVar303._28_4_ = (int)auVar258._28_4_;
                  auVar262 = vpslld_avx(auVar272,0x17);
                  auVar188 = vpslld_avx(auVar303._16_16_,0x17);
                  auVar115._8_4_ = 0x3f800000;
                  auVar115._0_8_ = 0x3f8000003f800000;
                  auVar115._12_4_ = 0x3f800000;
                  auVar188 = vpaddd_avx(auVar188,auVar115);
                  auVar262 = vpaddd_avx(auVar262,auVar115);
                  auVar185._0_4_ =
                       (fVar261 + fVar92 +
                       fVar261 * fVar261 *
                       (fVar187 +
                       ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) *
                         fVar261 + 0.041665796) * fVar261 + 0.16666666) * fVar261)) * auVar262._0_4_
                       + fVar92;
                  auVar185._4_4_ =
                       (fVar306 + fVar107 +
                       fVar306 * fVar306 *
                       (fVar235 +
                       ((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) *
                         fVar306 + 0.041665796) * fVar306 + 0.16666666) * fVar306)) * auVar262._4_4_
                       + fVar107;
                  auVar185._8_4_ =
                       (fVar307 + fVar136 +
                       fVar307 * fVar307 *
                       (fVar236 +
                       ((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) *
                         fVar307 + 0.041665796) * fVar307 + 0.16666666) * fVar307)) * auVar262._8_4_
                       + fVar136;
                  auVar185._12_4_ =
                       (fVar308 + fVar137 +
                       fVar308 * fVar308 *
                       (fVar237 +
                       ((((fVar308 * 0.00019875691 + 0.0013981999) * fVar308 + 0.008333452) *
                         fVar308 + 0.041665796) * fVar308 + 0.16666666) * fVar308)) *
                       auVar262._12_4_ + fVar137;
                  auVar185._16_4_ =
                       (fVar309 + fVar243 +
                       fVar309 * fVar309 *
                       (fVar238 +
                       ((((fVar309 * 0.00019875691 + 0.0013981999) * fVar309 + 0.008333452) *
                         fVar309 + 0.041665796) * fVar309 + 0.16666666) * fVar309)) * auVar188._0_4_
                       + fVar243;
                  auVar185._20_4_ =
                       (fVar342 + fVar138 +
                       fVar342 * fVar342 *
                       (fVar239 +
                       ((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 + 0.008333452) *
                         fVar342 + 0.041665796) * fVar342 + 0.16666666) * fVar342)) * auVar188._4_4_
                       + fVar138;
                  auVar185._24_4_ =
                       (fVar358 + fVar240 +
                       fVar358 * fVar358 *
                       (fVar241 +
                       ((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                         fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358)) * auVar188._8_4_
                       + fVar240;
                  auVar185._28_4_ =
                       auVar178._28_4_ + auVar100._28_4_ + fVar242 + fVar327 + -0.47508308 + fVar242
                  ;
                  auVar258 = vrcpps_avx(auVar185);
                  in_ZMM7 = ZEXT3264(auVar258);
                  fVar92 = auVar258._0_4_;
                  fVar107 = auVar258._4_4_;
                  auVar47._4_4_ = auVar185._4_4_ * fVar107;
                  auVar47._0_4_ = auVar185._0_4_ * fVar92;
                  fVar136 = auVar258._8_4_;
                  auVar47._8_4_ = auVar185._8_4_ * fVar136;
                  fVar137 = auVar258._12_4_;
                  auVar47._12_4_ = auVar185._12_4_ * fVar137;
                  fVar243 = auVar258._16_4_;
                  auVar47._16_4_ = auVar185._16_4_ * fVar243;
                  fVar138 = auVar258._20_4_;
                  auVar47._20_4_ = auVar185._20_4_ * fVar138;
                  fVar240 = auVar258._24_4_;
                  auVar47._24_4_ = auVar185._24_4_ * fVar240;
                  auVar47._28_4_ = auVar185._28_4_;
                  auVar333 = vsubps_avx(auVar333,auVar47);
                  auVar337._0_4_ = fVar92 + fVar92 * auVar333._0_4_;
                  auVar337._4_4_ = fVar107 + fVar107 * auVar333._4_4_;
                  auVar337._8_4_ = fVar136 + fVar136 * auVar333._8_4_;
                  auVar337._12_4_ = fVar137 + fVar137 * auVar333._12_4_;
                  auVar337._16_4_ = fVar243 + fVar243 * auVar333._16_4_;
                  auVar337._20_4_ = fVar138 + fVar138 * auVar333._20_4_;
                  auVar337._24_4_ = fVar240 + fVar240 * auVar333._24_4_;
                  auVar337._28_4_ = auVar258._28_4_ + auVar333._28_4_;
                  break;
                case 5:
                  auVar258 = vminps_avx(auVar337,auVar319);
                  auVar100 = vmaxps_avx(auVar324,auVar258);
                  auVar299._0_4_ = fVar187 + auVar100._0_4_ * 1.442695;
                  auVar299._4_4_ = fVar235 + auVar100._4_4_ * 1.442695;
                  auVar299._8_4_ = fVar236 + auVar100._8_4_ * 1.442695;
                  auVar299._12_4_ = fVar237 + auVar100._12_4_ * 1.442695;
                  auVar299._16_4_ = fVar238 + auVar100._16_4_ * 1.442695;
                  auVar299._20_4_ = fVar239 + auVar100._20_4_ * 1.442695;
                  auVar299._24_4_ = fVar241 + auVar100._24_4_ * 1.442695;
                  auVar299._28_4_ = fVar327 + in_ZMM7._28_4_;
                  auVar178 = vroundps_avx(auVar299,1);
                  auVar258 = vcmpps_avx(auVar299,auVar178,1);
                  auVar258 = vandps_avx(auVar258,auVar333);
                  auVar258 = vsubps_avx(auVar178,auVar258);
                  auVar43._4_4_ = auVar258._4_4_ * 0.6931472;
                  auVar43._0_4_ = auVar258._0_4_ * 0.6931472;
                  auVar43._8_4_ = auVar258._8_4_ * 0.6931472;
                  auVar43._12_4_ = auVar258._12_4_ * 0.6931472;
                  auVar43._16_4_ = auVar258._16_4_ * 0.6931472;
                  auVar43._20_4_ = auVar258._20_4_ * 0.6931472;
                  auVar43._24_4_ = auVar258._24_4_ * 0.6931472;
                  auVar43._28_4_ = auVar178._28_4_;
                  auVar100 = vsubps_avx(auVar100,auVar43);
                  fVar342 = auVar100._0_4_;
                  fVar358 = auVar100._4_4_;
                  fVar359 = auVar100._8_4_;
                  fVar360 = auVar100._12_4_;
                  fVar361 = auVar100._16_4_;
                  fVar362 = auVar100._20_4_;
                  fVar363 = auVar100._24_4_;
                  auVar200._0_4_ = (int)auVar258._0_4_;
                  auVar200._4_4_ = (int)auVar258._4_4_;
                  auVar200._8_4_ = (int)auVar258._8_4_;
                  auVar200._12_4_ = (int)auVar258._12_4_;
                  auVar230._16_4_ = (int)auVar258._16_4_;
                  auVar230._0_16_ = auVar200;
                  auVar230._20_4_ = (int)auVar258._20_4_;
                  auVar230._24_4_ = (int)auVar258._24_4_;
                  auVar230._28_4_ = (int)auVar258._28_4_;
                  auVar262 = vpslld_avx(auVar200,0x17);
                  auVar188 = vpslld_avx(auVar230._16_16_,0x17);
                  auVar255._8_4_ = 0x3f800000;
                  auVar255._0_8_ = 0x3f8000003f800000;
                  auVar255._12_4_ = 0x3f800000;
                  auVar188 = vpaddd_avx(auVar188,auVar255);
                  auVar262 = vpaddd_avx(auVar262,auVar255);
                  auVar300._0_4_ =
                       (fVar342 + fVar92 +
                       fVar342 * fVar342 *
                       (((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 + 0.008333452) *
                          fVar342 + 0.041665796) * fVar342 + 0.16666666) * fVar342 + fVar187)) *
                       auVar262._0_4_ + fVar92;
                  auVar300._4_4_ =
                       (fVar358 + fVar107 +
                       fVar358 * fVar358 *
                       (((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 + 0.008333452) *
                          fVar358 + 0.041665796) * fVar358 + 0.16666666) * fVar358 + fVar235)) *
                       auVar262._4_4_ + fVar107;
                  auVar300._8_4_ =
                       (fVar359 + fVar136 +
                       fVar359 * fVar359 *
                       (((((fVar359 * 0.00019875691 + 0.0013981999) * fVar359 + 0.008333452) *
                          fVar359 + 0.041665796) * fVar359 + 0.16666666) * fVar359 + fVar236)) *
                       auVar262._8_4_ + fVar136;
                  auVar300._12_4_ =
                       (fVar360 + fVar137 +
                       fVar360 * fVar360 *
                       (((((fVar360 * 0.00019875691 + 0.0013981999) * fVar360 + 0.008333452) *
                          fVar360 + 0.041665796) * fVar360 + 0.16666666) * fVar360 + fVar237)) *
                       auVar262._12_4_ + fVar137;
                  auVar300._16_4_ =
                       (fVar361 + fVar243 +
                       fVar361 * fVar361 *
                       (((((fVar361 * 0.00019875691 + 0.0013981999) * fVar361 + 0.008333452) *
                          fVar361 + 0.041665796) * fVar361 + 0.16666666) * fVar361 + fVar238)) *
                       auVar188._0_4_ + fVar243;
                  auVar300._20_4_ =
                       (fVar362 + fVar138 +
                       fVar362 * fVar362 *
                       (((((fVar362 * 0.00019875691 + 0.0013981999) * fVar362 + 0.008333452) *
                          fVar362 + 0.041665796) * fVar362 + 0.16666666) * fVar362 + fVar239)) *
                       auVar188._4_4_ + fVar138;
                  auVar300._24_4_ =
                       (fVar363 + fVar240 +
                       fVar363 * fVar363 *
                       (((((fVar363 * 0.00019875691 + 0.0013981999) * fVar363 + 0.008333452) *
                          fVar363 + 0.041665796) * fVar363 + 0.16666666) * fVar363 + fVar241)) *
                       auVar188._8_4_ + fVar240;
                  auVar300._28_4_ =
                       auVar100._28_4_ + fVar242 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar327 + fVar242;
                  auVar104._8_4_ = 0x800000;
                  auVar104._0_8_ = 0x80000000800000;
                  auVar104._12_4_ = 0x800000;
                  auVar104._16_4_ = 0x800000;
                  auVar104._20_4_ = 0x800000;
                  auVar104._24_4_ = 0x800000;
                  auVar104._28_4_ = 0x800000;
                  auVar178 = vmaxps_avx(auVar300,auVar104);
                  auVar188 = vpsrld_avx(auVar178._16_16_,0x17);
                  auVar105._8_4_ = 0x807fffff;
                  auVar105._0_8_ = 0x807fffff807fffff;
                  auVar105._12_4_ = 0x807fffff;
                  auVar105._16_4_ = 0x807fffff;
                  auVar105._20_4_ = 0x807fffff;
                  auVar105._24_4_ = 0x807fffff;
                  auVar105._28_4_ = 0x807fffff;
                  auVar258 = vandps_avx(auVar178,auVar105);
                  auVar224 = vorps_avx(auVar258,auVar326._0_32_);
                  auVar106._8_4_ = 0x3f3504f3;
                  auVar106._0_8_ = 0x3f3504f33f3504f3;
                  auVar106._12_4_ = 0x3f3504f3;
                  auVar106._16_4_ = 0x3f3504f3;
                  auVar106._20_4_ = 0x3f3504f3;
                  auVar106._24_4_ = 0x3f3504f3;
                  auVar106._28_4_ = 0x3f3504f3;
                  auVar100 = vcmpps_avx(auVar106,auVar224,2);
                  auVar258 = vandnps_avx(auVar100,auVar224);
                  fVar342 = auVar224._0_4_ + -1.0 + auVar258._0_4_;
                  fVar358 = auVar224._4_4_ + -1.0 + auVar258._4_4_;
                  fVar359 = auVar224._8_4_ + -1.0 + auVar258._8_4_;
                  fVar360 = auVar224._12_4_ + -1.0 + auVar258._12_4_;
                  fVar361 = auVar224._16_4_ + -1.0 + auVar258._16_4_;
                  fVar362 = auVar224._20_4_ + -1.0 + auVar258._20_4_;
                  fVar363 = auVar224._24_4_ + -1.0 + auVar258._24_4_;
                  auVar188 = vpsubd_avx(auVar188,auVar100._16_16_);
                  auVar262 = vpsrld_avx(auVar178._0_16_,0x17);
                  auVar95._8_4_ = 0xffffff81;
                  auVar95._0_8_ = 0xffffff81ffffff81;
                  auVar95._12_4_ = 0xffffff81;
                  auVar188 = vpaddd_avx(auVar188,auVar95);
                  auVar262 = vpsubd_avx(auVar262,auVar100._0_16_);
                  auVar262 = vpaddd_avx(auVar262,auVar95);
                  auVar183._16_16_ = auVar188;
                  auVar183._0_16_ = auVar262;
                  auVar260 = ZEXT864(0) << 0x20;
                  auVar100 = vcmpps_avx(auVar300,ZEXT832(0) << 0x20,2);
                  auVar178 = vcvtdq2ps_avx(auVar183);
                  auVar44._4_4_ =
                       (fVar358 + auVar178._4_4_ * 0.6931472 +
                       fVar358 * fVar358 *
                       (fVar358 * (fVar358 * (fVar358 * (fVar358 * (fVar358 * (fVar358 * (fVar358 * 
                                                  (fVar358 * (fVar358 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar44._0_4_ =
                       (fVar342 + auVar178._0_4_ * 0.6931472 +
                       fVar342 * fVar342 *
                       (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * (fVar342 * 
                                                  (fVar342 * (fVar342 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar44._8_4_ =
                       (fVar359 + auVar178._8_4_ * 0.6931472 +
                       fVar359 * fVar359 *
                       (fVar359 * (fVar359 * (fVar359 * (fVar359 * (fVar359 * (fVar359 * (fVar359 * 
                                                  (fVar359 * (fVar359 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar44._12_4_ =
                       (fVar360 + auVar178._12_4_ * 0.6931472 +
                       fVar360 * fVar360 *
                       (fVar360 * (fVar360 * (fVar360 * (fVar360 * (fVar360 * (fVar360 * (fVar360 * 
                                                  (fVar360 * (fVar360 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar44._16_4_ =
                       (fVar361 + auVar178._16_4_ * 0.6931472 +
                       fVar361 * fVar361 *
                       (fVar361 * (fVar361 * (fVar361 * (fVar361 * (fVar361 * (fVar361 * (fVar361 * 
                                                  (fVar361 * (fVar361 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar44._20_4_ =
                       (fVar362 + auVar178._20_4_ * 0.6931472 +
                       fVar362 * fVar362 *
                       (fVar362 * (fVar362 * (fVar362 * (fVar362 * (fVar362 * (fVar362 * (fVar362 * 
                                                  (fVar362 * (fVar362 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar44._24_4_ =
                       (fVar363 + auVar178._24_4_ * 0.6931472 +
                       fVar363 * fVar363 *
                       (fVar363 * (fVar363 * (fVar363 * (fVar363 * (fVar363 * (fVar363 * (fVar363 * 
                                                  (fVar363 * (fVar363 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar44._28_4_ = auVar224._28_4_ + -1.0 + auVar258._28_4_ + auVar178._28_4_ + 0.0;
                  auVar231._8_4_ = 0x7fffffff;
                  auVar231._0_8_ = 0x7fffffff7fffffff;
                  auVar231._12_4_ = 0x7fffffff;
                  auVar231._16_4_ = 0x7fffffff;
                  auVar231._20_4_ = 0x7fffffff;
                  auVar231._24_4_ = 0x7fffffff;
                  auVar231._28_4_ = 0x7fffffff;
                  auVar258 = vblendvps_avx(auVar44,auVar231,auVar100);
                  auVar258 = vminps_avx(auVar319,auVar258);
                  auVar100 = vmaxps_avx(auVar324,auVar258);
                  auVar232._0_4_ = auVar100._0_4_ * 1.442695 + fVar187;
                  auVar232._4_4_ = auVar100._4_4_ * 1.442695 + fVar235;
                  auVar232._8_4_ = auVar100._8_4_ * 1.442695 + fVar236;
                  auVar232._12_4_ = auVar100._12_4_ * 1.442695 + fVar237;
                  auVar232._16_4_ = auVar100._16_4_ * 1.442695 + fVar238;
                  auVar232._20_4_ = auVar100._20_4_ * 1.442695 + fVar239;
                  auVar232._24_4_ = auVar100._24_4_ * 1.442695 + fVar241;
                  auVar232._28_4_ = fVar327 + NAN;
                  auVar178 = vroundps_avx(auVar232,1);
                  auVar258 = vcmpps_avx(auVar232,auVar178,1);
                  auVar258 = vandps_avx(auVar258,auVar333);
                  auVar258 = vsubps_avx(auVar178,auVar258);
                  auVar45._4_4_ = auVar258._4_4_ * 0.6931472;
                  auVar45._0_4_ = auVar258._0_4_ * 0.6931472;
                  auVar45._8_4_ = auVar258._8_4_ * 0.6931472;
                  auVar45._12_4_ = auVar258._12_4_ * 0.6931472;
                  auVar45._16_4_ = auVar258._16_4_ * 0.6931472;
                  auVar45._20_4_ = auVar258._20_4_ * 0.6931472;
                  auVar45._24_4_ = auVar258._24_4_ * 0.6931472;
                  auVar45._28_4_ = auVar178._28_4_;
                  auVar100 = vsubps_avx(auVar100,auVar45);
                  fVar342 = auVar100._0_4_;
                  fVar358 = auVar100._4_4_;
                  fVar359 = auVar100._8_4_;
                  fVar360 = auVar100._12_4_;
                  fVar361 = auVar100._16_4_;
                  fVar362 = auVar100._20_4_;
                  fVar363 = auVar100._24_4_;
                  auVar325 = ZEXT3264(auVar333);
                  auVar326 = ZEXT3264(auVar326._0_32_);
                  fVar187 = fVar187 + ((((fVar342 * 0.00019875691 + 0.0013981999) * fVar342 +
                                        0.008333452) * fVar342 + 0.041665796) * fVar342 + 0.16666666
                                      ) * fVar342;
                  fVar235 = fVar235 + ((((fVar358 * 0.00019875691 + 0.0013981999) * fVar358 +
                                        0.008333452) * fVar358 + 0.041665796) * fVar358 + 0.16666666
                                      ) * fVar358;
                  fVar236 = fVar236 + ((((fVar359 * 0.00019875691 + 0.0013981999) * fVar359 +
                                        0.008333452) * fVar359 + 0.041665796) * fVar359 + 0.16666666
                                      ) * fVar359;
                  fVar237 = fVar237 + ((((fVar360 * 0.00019875691 + 0.0013981999) * fVar360 +
                                        0.008333452) * fVar360 + 0.041665796) * fVar360 + 0.16666666
                                      ) * fVar360;
                  fVar238 = fVar238 + ((((fVar361 * 0.00019875691 + 0.0013981999) * fVar361 +
                                        0.008333452) * fVar361 + 0.041665796) * fVar361 + 0.16666666
                                      ) * fVar361;
                  fVar239 = fVar239 + ((((fVar362 * 0.00019875691 + 0.0013981999) * fVar362 +
                                        0.008333452) * fVar362 + 0.041665796) * fVar362 + 0.16666666
                                      ) * fVar362;
                  fVar241 = fVar241 + ((((fVar363 * 0.00019875691 + 0.0013981999) * fVar363 +
                                        0.008333452) * fVar363 + 0.041665796) * fVar363 + 0.16666666
                                      ) * fVar363;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar327 + auVar300._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar241,CONCAT420(fVar239,CONCAT416(fVar238
                                                  ,CONCAT412(fVar237,CONCAT48(fVar236,CONCAT44(
                                                  fVar235,fVar187))))))));
                  auVar201._0_4_ = (int)auVar258._0_4_;
                  auVar201._4_4_ = (int)auVar258._4_4_;
                  auVar201._8_4_ = (int)auVar258._8_4_;
                  auVar201._12_4_ = (int)auVar258._12_4_;
                  auVar233._16_4_ = (int)auVar258._16_4_;
                  auVar233._0_16_ = auVar201;
                  auVar233._20_4_ = (int)auVar258._20_4_;
                  auVar233._24_4_ = (int)auVar258._24_4_;
                  auVar233._28_4_ = (int)auVar258._28_4_;
                  auVar262 = vpslld_avx(auVar201,0x17);
                  auVar188 = vpslld_avx(auVar233._16_16_,0x17);
                  auVar114._8_4_ = 0x3f800000;
                  auVar114._0_8_ = 0x3f8000003f800000;
                  auVar114._12_4_ = 0x3f800000;
                  auVar188 = vpaddd_avx(auVar188,auVar114);
                  auVar262 = vpaddd_avx(auVar262,auVar114);
                  auVar184._0_4_ =
                       (fVar342 + fVar92 + fVar342 * fVar342 * fVar187) * auVar262._0_4_ + fVar92;
                  auVar184._4_4_ =
                       (fVar358 + fVar107 + fVar358 * fVar358 * fVar235) * auVar262._4_4_ + fVar107;
                  auVar184._8_4_ =
                       (fVar359 + fVar136 + fVar359 * fVar359 * fVar236) * auVar262._8_4_ + fVar136;
                  auVar184._12_4_ =
                       (fVar360 + fVar137 + fVar360 * fVar360 * fVar237) * auVar262._12_4_ + fVar137
                  ;
                  auVar184._16_4_ =
                       (fVar361 + fVar243 + fVar361 * fVar361 * fVar238) * auVar188._0_4_ + fVar243;
                  auVar184._20_4_ =
                       (fVar362 + fVar138 + fVar362 * fVar362 * fVar239) * auVar188._4_4_ + fVar138;
                  auVar184._24_4_ =
                       (fVar363 + fVar240 + fVar363 * fVar363 * fVar241) * auVar188._8_4_ + fVar240;
                  auVar184._28_4_ = auVar100._28_4_ + fVar242 + auVar178._28_4_ + fVar242;
                  auVar333 = vrcpps_avx(auVar184);
                  fVar92 = auVar333._0_4_;
                  fVar107 = auVar333._4_4_;
                  fVar136 = auVar333._8_4_;
                  fVar137 = auVar333._12_4_;
                  fVar243 = auVar333._16_4_;
                  fVar138 = auVar333._20_4_;
                  fVar240 = auVar333._24_4_;
                  auVar46._4_4_ = auVar184._4_4_ * (fVar107 + fVar107);
                  auVar46._0_4_ = auVar184._0_4_ * (fVar92 + fVar92);
                  auVar46._8_4_ = auVar184._8_4_ * (fVar136 + fVar136);
                  auVar46._12_4_ = auVar184._12_4_ * (fVar137 + fVar137);
                  auVar46._16_4_ = auVar184._16_4_ * (fVar243 + fVar243);
                  auVar46._20_4_ = auVar184._20_4_ * (fVar138 + fVar138);
                  auVar46._24_4_ = auVar184._24_4_ * (fVar240 + fVar240);
                  auVar46._28_4_ = auVar184._28_4_;
                  auVar133._8_4_ = 0x40000000;
                  auVar133._0_8_ = 0x4000000040000000;
                  auVar133._12_4_ = 0x40000000;
                  auVar133._16_4_ = 0x40000000;
                  auVar133._20_4_ = 0x40000000;
                  auVar133._24_4_ = 0x40000000;
                  auVar133._28_4_ = 0x40000000;
                  auVar258 = vsubps_avx(auVar133,auVar46);
                  auVar234._0_4_ = fVar92 + fVar92 + -1.0;
                  auVar234._4_4_ = fVar107 + fVar107 + -1.0;
                  auVar234._8_4_ = fVar136 + fVar136 + -1.0;
                  auVar234._12_4_ = fVar137 + fVar137 + -1.0;
                  auVar234._16_4_ = fVar243 + fVar243 + -1.0;
                  auVar234._20_4_ = fVar138 + fVar138 + -1.0;
                  auVar234._24_4_ = fVar240 + fVar240 + -1.0;
                  auVar234._28_4_ = auVar333._28_4_ + auVar333._28_4_ + -1.0;
                  auVar171._0_4_ = auVar234._0_4_ + fVar92 * auVar258._0_4_;
                  auVar171._4_4_ = auVar234._4_4_ + fVar107 * auVar258._4_4_;
                  auVar171._8_4_ = auVar234._8_4_ + fVar136 * auVar258._8_4_;
                  auVar171._12_4_ = auVar234._12_4_ + fVar137 * auVar258._12_4_;
                  auVar171._16_4_ = auVar234._16_4_ + fVar243 * auVar258._16_4_;
                  auVar171._20_4_ = auVar234._20_4_ + fVar138 * auVar258._20_4_;
                  auVar171._24_4_ = auVar234._24_4_ + fVar240 * auVar258._24_4_;
                  goto LAB_00289743;
                case 6:
                  fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                  fVar107 = (*(float **)(&this->field_0x118 + (long)p_Var64))[1];
                  auVar234._4_4_ = fVar107;
                  auVar234._0_4_ = fVar107;
                  auVar234._8_4_ = fVar107;
                  auVar234._12_4_ = fVar107;
                  auVar234._16_4_ = fVar107;
                  auVar234._20_4_ = fVar107;
                  auVar234._24_4_ = fVar107;
                  auVar234._28_4_ = fVar107;
                  auVar186._0_4_ = auVar338._0_4_ * fVar92 + fVar107;
                  auVar186._4_4_ = auVar338._4_4_ * fVar92 + fVar107;
                  auVar186._8_4_ = fVar261 * fVar92 + fVar107;
                  auVar186._12_4_ = fVar306 * fVar92 + fVar107;
                  auVar186._16_4_ = fVar307 * fVar92 + fVar107;
                  auVar186._20_4_ = fVar308 * fVar92 + fVar107;
                  auVar186._24_4_ = fVar309 * fVar92 + fVar107;
                  auVar186._28_4_ = fVar92 + fVar107;
                  auVar258 = vmaxps_avx(auVar186,auVar260._0_32_);
                  auVar333 = vminps_avx(auVar258,auVar333);
                  auVar171 = auVar333._0_28_;
LAB_00289743:
                  in_ZMM3 = ZEXT3264(auVar234);
                  auVar341._0_4_ = auVar338._0_4_ * auVar171._0_4_;
                  auVar341._4_4_ = auVar338._4_4_ * auVar171._4_4_;
                  auVar341._8_4_ = fVar261 * auVar171._8_4_;
                  auVar341._12_4_ = fVar306 * auVar171._12_4_;
                  auVar341._16_4_ = fVar307 * auVar171._16_4_;
                  auVar341._20_4_ = fVar308 * auVar171._20_4_;
                  auVar341._24_4_ = fVar309 * auVar171._24_4_;
                  auVar337 = auVar341._0_32_;
                }
                *(undefined1 (*) [32])pAVar76 = auVar337;
                pAVar76 = pAVar76 + 4;
                uVar82 = uVar82 + 1;
                iVar66 = iVar66 + 1;
              } while (uVar82 != local_1a8.w);
            }
            iVar74 = iVar74 + 1;
          } while (iVar74 != local_1a8.h);
        }
        local_278 = local_278 + 1;
      } while (local_278 != (long)local_1a8.c);
    }
    if (((uint)local_150 == 8) && (uVar59 == 1)) {
      local_148 = (ulong)local_1a8.c;
      if (0 < (long)local_148) {
        p_Var64 = pp_Var24[-3];
        iVar20 = *(int *)(&this->field_0xdc + (long)p_Var64);
        iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var64);
        iVar69 = *(int *)(&this->field_0xe4 + (long)p_Var64);
        iVar88 = *(int *)(&this->field_0xe8 + (long)p_Var64);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var64);
        lVar83 = *(long *)(&this->field_0x1a8 + (long)p_Var64);
        uVar55 = *(uint *)(&this->field_0xd4 + (long)p_Var64);
        uVar59 = *(uint *)(&this->field_0xd8 + (long)p_Var64);
        lVar86 = local_1a8.elemsize * local_1a8.cstep;
        iVar79 = bottom_blob->w;
        iVar81 = bottom_blob->h;
        uVar22 = bottom_blob->c;
        local_278 = 0;
        do {
          if (0 < iVar67) {
            sVar26 = (this->weight_data_tm).cstep;
            sVar27 = (this->weight_data_tm).elemsize;
            local_228 = (Allocator *)((long)(_func_int ***)pvVar91 + lVar86 * local_278);
            pvVar90 = (this->weight_data_tm).data;
            iVar80 = 0;
            do {
              if (0 < iVar70) {
                iVar66 = bottom_blob->w;
                pvVar78 = bottom_blob->data;
                sVar28 = bottom_blob->elemsize;
                sVar29 = bottom_blob->cstep;
                pfVar89 = *(float **)(&this->field_0x118 + (long)p_Var64);
                uVar65 = 0;
                iVar74 = (1 - uVar55) * iVar20;
                do {
                  if (lVar83 == 0) {
                    fVar92 = 0.0;
                  }
                  else {
                    fVar92 = *(float *)(lVar83 + local_278 * 4);
                  }
                  if ((int)uVar22 < 1) {
                    fVar107 = 0.0;
                    fVar136 = 0.0;
                    fVar137 = 0.0;
                    fVar243 = 0.0;
                    fVar138 = 0.0;
                    fVar240 = 0.0;
                    fVar242 = 0.0;
                    fVar187 = 0.0;
                  }
                  else {
                    fVar107 = 0.0;
                    fVar136 = 0.0;
                    fVar137 = 0.0;
                    fVar243 = 0.0;
                    fVar138 = 0.0;
                    fVar240 = 0.0;
                    fVar242 = 0.0;
                    fVar187 = 0.0;
                    uVar68 = 0;
                    pvVar77 = (void *)(sVar26 * local_278 * sVar27 + (long)pvVar90);
                    do {
                      if (0 < (int)uVar59) {
                        uVar87 = 0;
                        uVar71 = 0;
                        do {
                          iVar56 = (((int)uVar71 - uVar59) + 1) * iVar21 + iVar80;
                          if ((((-1 < iVar56) && (iVar57 = iVar56 / iVar88, iVar56 % iVar88 == 0))
                              && (0 < (int)uVar55)) && (iVar57 < iVar81)) {
                            uVar75 = (ulong)uVar55;
                            uVar84 = uVar87;
                            iVar56 = iVar74;
                            do {
                              if (((-1 < iVar56) && (iVar58 = iVar56 / iVar69, iVar56 % iVar69 == 0)
                                  ) && (iVar58 < iVar79)) {
                                pfVar72 = (float *)((long)pvVar77 + (uVar84 & 0xffffffff) * 4);
                                pfVar2 = (float *)((long)pvVar78 +
                                                  (long)(iVar58 << 3) * 4 +
                                                  (long)iVar57 * (long)iVar66 * sVar28 +
                                                  sVar29 * sVar28 * uVar68);
                                fVar107 = *pfVar72 * *pfVar2 + fVar107;
                                fVar136 = pfVar72[1] * pfVar2[1] + fVar136;
                                fVar137 = pfVar72[2] * pfVar2[2] + fVar137;
                                fVar243 = pfVar72[3] * pfVar2[3] + fVar243;
                                fVar138 = pfVar72[4] * pfVar2[4] + fVar138;
                                fVar240 = pfVar72[5] * pfVar2[5] + fVar240;
                                fVar242 = pfVar72[6] * pfVar2[6] + fVar242;
                                fVar187 = pfVar72[7] + fVar187;
                              }
                              uVar84 = uVar84 + 8;
                              iVar56 = iVar56 + iVar20;
                              uVar75 = uVar75 - 1;
                            } while (uVar75 != 0);
                          }
                          uVar71 = uVar71 + 1;
                          uVar87 = uVar87 + (ulong)uVar55 * 8;
                        } while (uVar71 != uVar59);
                      }
                      pvVar77 = (void *)((long)pvVar77 + (long)(int)(uVar55 * uVar59 * 8) * 4);
                      uVar68 = uVar68 + 1;
                    } while (uVar68 != uVar22);
                  }
                  auVar116._0_4_ = fVar138 + fVar107;
                  auVar116._4_4_ = fVar240 + fVar136;
                  auVar116._8_4_ = fVar242 + fVar137;
                  auVar116._12_4_ = fVar187 + fVar243;
                  auVar188 = vshufpd_avx(auVar116,auVar116,1);
                  auVar117._0_4_ = auVar188._0_4_ + auVar116._0_4_;
                  auVar117._4_4_ = auVar188._4_4_ + auVar116._4_4_;
                  auVar117._8_4_ = auVar188._8_4_ + auVar116._8_4_;
                  auVar117._12_4_ = auVar188._12_4_ + auVar116._12_4_;
                  auVar188 = vmovshdup_avx(auVar117);
                  fVar92 = auVar188._0_4_ + fVar92 + auVar117._0_4_;
                  auVar188 = ZEXT416((uint)fVar92);
                  fVar107 = fVar92;
                  switch(uVar23) {
                  case 1:
                    auVar188 = vmaxss_avx(ZEXT416((uint)fVar92),ZEXT416(0));
                    fVar107 = auVar188._0_4_;
                    break;
                  case 2:
                    auVar96._0_12_ = ZEXT812(0);
                    auVar96._12_4_ = 0;
                    auVar188 = vcmpss_avx(auVar96,auVar188,1);
                    auVar148._8_4_ = 0x3f800000;
                    auVar148._0_8_ = 0x3f8000003f800000;
                    auVar148._12_4_ = 0x3f800000;
                    auVar188 = vblendvps_avx(ZEXT416((uint)*pfVar89),auVar148,auVar188);
                    fVar107 = auVar188._0_4_;
LAB_00289bc2:
                    fVar107 = fVar107 * fVar92;
                    break;
                  case 3:
                    auVar188 = vmaxss_avx(auVar188,ZEXT416((uint)*pfVar89));
                    fVar107 = auVar188._0_4_;
                    if (pfVar89[1] < auVar188._0_4_) {
                      fVar107 = pfVar89[1];
                    }
                    break;
                  case 4:
                    auVar188 = vminss_avx(auVar188,ZEXT416(0x42b0c0a5));
                    auVar118._0_8_ = auVar188._0_8_ ^ 0x8000000080000000;
                    auVar118._8_4_ = auVar188._8_4_ ^ 0x80000000;
                    auVar118._12_4_ = auVar188._12_4_ ^ 0x80000000;
                    auVar188 = vcmpss_avx(auVar188,ZEXT416(0xc2b0c0a5),1);
                    auVar147._8_4_ = 0x42b0c0a5;
                    auVar147._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar147._12_4_ = 0x42b0c0a5;
                    auVar188 = vblendvps_avx(auVar118,auVar147,auVar188);
                    fVar92 = expf(auVar188._0_4_);
                    fVar107 = 1.0 / (fVar92 + 1.0);
                    break;
                  case 5:
                    fVar107 = expf(fVar92);
                    fVar107 = logf(fVar107 + 1.0);
                    fVar107 = tanhf(fVar107);
                    fVar107 = fVar107 * fVar92;
                    break;
                  case 6:
                    fVar136 = *pfVar89;
                    fVar137 = -pfVar89[1] / fVar136;
                    fVar107 = 0.0;
                    if ((fVar137 <= fVar92) && (fVar107 = fVar92, fVar92 <= fVar137 + 1.0 / fVar136)
                       ) {
                      fVar107 = fVar136 * fVar92 + pfVar89[1];
                      goto LAB_00289bc2;
                    }
                  }
                  *(float *)&local_228->_vptr_Allocator = fVar107;
                  local_228 = (Allocator *)((long)&local_228->_vptr_Allocator + 4);
                  uVar65 = uVar65 + 1;
                  iVar74 = iVar74 + 1;
                } while (uVar65 != iVar70);
              }
              iVar80 = iVar80 + 1;
            } while (iVar80 != iVar67);
          }
          local_278 = local_278 + 1;
        } while (local_278 != local_148);
      }
    }
    else {
      local_138._0_4_ = uVar59 ^ 4;
      if (((uint)local_150 == 4 && uVar59 == 4) && (0 < (long)local_1a8.c)) {
        p_Var64 = pp_Var24[-3];
        iVar20 = *(int *)(&this->field_0xdc + (long)p_Var64);
        iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var64);
        iVar69 = *(int *)(&this->field_0xe4 + (long)p_Var64);
        iVar88 = *(int *)(&this->field_0xe8 + (long)p_Var64);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var64);
        lVar83 = *(long *)(&this->field_0x1a8 + (long)p_Var64);
        uVar55 = *(uint *)(&this->field_0xd4 + (long)p_Var64);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var64);
        local_278 = 0;
        auVar256._8_4_ = 0x3f000000;
        auVar256._0_8_ = 0x3f0000003f000000;
        auVar256._12_4_ = 0x3f000000;
        auVar260 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (0 < local_1a8.h) {
            iVar79 = bottom_blob->w;
            iVar81 = bottom_blob->h;
            pAVar76 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_278 * local_1a8.elemsize);
            uVar65 = bottom_blob->c;
            iVar74 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar82 = 0;
                iVar66 = (1 - uVar55) * iVar20;
                do {
                  if (lVar83 == 0) {
                    auVar119 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar119 = *(undefined1 (*) [16])(lVar83 + local_278 * 0x10);
                  }
                  auVar325 = ZEXT1664(auVar119);
                  if (0 < (int)uVar65) {
                    pvVar91 = (void *)((this->weight_data_tm).cstep * local_278 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar90 = bottom_blob->data;
                    uVar68 = 0;
                    do {
                      if (0 < (int)uVar22) {
                        uVar71 = 0;
                        uVar87 = 0;
                        do {
                          iVar56 = (((int)uVar87 - uVar22) + 1) * iVar21 + iVar74;
                          if ((((-1 < iVar56) && (iVar57 = iVar56 / iVar88, iVar56 % iVar88 == 0))
                              && (0 < (int)uVar55)) && (iVar57 < iVar81)) {
                            lVar86 = (long)iVar57 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar68;
                            uVar75 = (ulong)uVar55;
                            uVar84 = uVar71;
                            iVar56 = iVar66;
                            do {
                              if (((-1 < iVar56) && (iVar57 = iVar56 / iVar69, iVar56 % iVar69 == 0)
                                  ) && (iVar57 < iVar79)) {
                                lVar62 = (long)(iVar57 << 2);
                                fVar92 = *(float *)((long)pvVar90 + lVar62 * 4 + lVar86);
                                fVar107 = *(float *)((long)pvVar90 + lVar62 * 4 + lVar86 + 4);
                                fVar136 = *(float *)((long)pvVar90 + lVar62 * 4 + lVar86 + 8);
                                fVar137 = *(float *)((long)pvVar90 + lVar62 * 4 + lVar86 + 0xc);
                                uVar63 = uVar84 & 0xffffffff;
                                pfVar89 = (float *)((long)pvVar91 + uVar63 * 4);
                                pfVar72 = (float *)((long)pvVar91 + uVar63 * 4 + 0x10);
                                pfVar2 = (float *)((long)pvVar91 + uVar63 * 4 + 0x20);
                                pfVar3 = (float *)((long)pvVar91 + uVar63 * 4 + 0x30);
                                auVar325 = ZEXT1664(CONCAT412(fVar92 * pfVar89[3] + auVar325._12_4_
                                                              + fVar107 * pfVar72[3] +
                                                                fVar136 * pfVar2[3] +
                                                              fVar137 * pfVar3[3],
                                                              CONCAT48(fVar92 * pfVar89[2] +
                                                                       auVar325._8_4_ +
                                                                       fVar107 * pfVar72[2] +
                                                                       fVar136 * pfVar2[2] +
                                                                       fVar137 * pfVar3[2],
                                                                       CONCAT44(fVar92 * pfVar89[1]
                                                                                + auVar325._4_4_ +
                                                                                fVar107 * pfVar72[1]
                                                                                + fVar136 * pfVar2[1
                                                  ] + fVar137 * pfVar3[1],
                                                  fVar92 * *pfVar89 + auVar325._0_4_ +
                                                  fVar107 * *pfVar72 + fVar136 * *pfVar2 +
                                                  fVar137 * *pfVar3))));
                              }
                              uVar84 = uVar84 + 0x10;
                              iVar56 = iVar56 + iVar20;
                              uVar75 = uVar75 - 1;
                            } while (uVar75 != 0);
                          }
                          uVar87 = uVar87 + 1;
                          uVar71 = uVar71 + (ulong)uVar55 * 0x10;
                        } while (uVar87 != uVar22);
                      }
                      auVar119 = auVar325._0_16_;
                      pvVar91 = (void *)((long)pvVar91 + (long)(int)(uVar55 * uVar22 * 0x10) * 4);
                      uVar68 = uVar68 + 1;
                    } while (uVar68 != uVar65);
                  }
                  auVar188 = auVar260._0_16_;
                  fVar92 = auVar260._0_4_;
                  fVar107 = auVar260._4_4_;
                  fVar136 = auVar260._8_4_;
                  fVar137 = auVar260._12_4_;
                  fVar243 = auVar119._4_4_;
                  fVar138 = auVar119._8_4_;
                  fVar240 = auVar119._12_4_;
                  switch(uVar23) {
                  case 1:
                    auVar119 = vmaxps_avx(auVar119,_DAT_00554060);
                    break;
                  case 2:
                    auVar188 = vmaxps_avx(auVar119,ZEXT816(0) << 0x40);
                    auVar262 = vminps_avx(auVar119,ZEXT816(0) << 0x40);
                    fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                    auVar119._0_4_ = fVar92 * auVar262._0_4_ + auVar188._0_4_;
                    auVar119._4_4_ = fVar92 * auVar262._4_4_ + auVar188._4_4_;
                    auVar119._8_4_ = fVar92 * auVar262._8_4_ + auVar188._8_4_;
                    auVar119._12_4_ = fVar92 * auVar262._12_4_ + auVar188._12_4_;
                    break;
                  case 3:
                    uVar8 = **(undefined4 **)(&this->field_0x118 + (long)p_Var64);
                    auVar279._4_4_ = uVar8;
                    auVar279._0_4_ = uVar8;
                    auVar279._8_4_ = uVar8;
                    auVar279._12_4_ = uVar8;
                    uVar8 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var64))[1];
                    auVar349._4_4_ = uVar8;
                    auVar349._0_4_ = uVar8;
                    auVar349._8_4_ = uVar8;
                    auVar349._12_4_ = uVar8;
                    auVar188 = vmaxps_avx(auVar119,auVar279);
                    auVar119 = vminps_avx(auVar349,auVar188);
                    break;
                  case 4:
                    auVar120._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
                    auVar120._8_4_ = -fVar138;
                    auVar120._12_4_ = -fVar240;
                    auVar154._8_4_ = 0x42b0c0a5;
                    auVar154._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar154._12_4_ = 0x42b0c0a5;
                    auVar262 = vminps_avx(auVar120,auVar154);
                    auVar155._8_4_ = 0xc2b0c0a5;
                    auVar155._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar155._12_4_ = 0xc2b0c0a5;
                    auVar310 = vmaxps_avx(auVar262,auVar155);
                    auVar280._0_4_ = auVar310._0_4_ * 1.442695 + 0.5;
                    auVar280._4_4_ = auVar310._4_4_ * 1.442695 + 0.5;
                    auVar280._8_4_ = auVar310._8_4_ * 1.442695 + 0.5;
                    auVar280._12_4_ = auVar310._12_4_ * 1.442695 + 0.5;
                    auVar350._0_4_ = (int)auVar280._0_4_;
                    auVar350._4_4_ = (int)auVar280._4_4_;
                    auVar350._8_4_ = (int)auVar280._8_4_;
                    auVar350._12_4_ = (int)auVar280._12_4_;
                    auVar329 = vcvtdq2ps_avx(auVar350);
                    auVar262 = vcmpps_avx(auVar280,auVar329,1);
                    auVar262 = vandps_avx(auVar262,auVar188);
                    auVar262 = vsubps_avx(auVar329,auVar262);
                    fVar243 = auVar262._0_4_ * -0.6931472 + auVar310._0_4_;
                    fVar138 = auVar262._4_4_ * -0.6931472 + auVar310._4_4_;
                    fVar240 = auVar262._8_4_ * -0.6931472 + auVar310._8_4_;
                    fVar242 = auVar262._12_4_ * -0.6931472 + auVar310._12_4_;
                    auVar281._0_4_ = (int)auVar262._0_4_;
                    auVar281._4_4_ = (int)auVar262._4_4_;
                    auVar281._8_4_ = (int)auVar262._8_4_;
                    auVar281._12_4_ = (int)auVar262._12_4_;
                    auVar262 = vpslld_avx(auVar281,0x17);
                    auVar262 = vpaddd_avx(auVar262,auVar188);
                    auVar121._0_4_ =
                         (fVar243 * fVar243 *
                          (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) *
                             fVar243 + 0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5) +
                         fVar243 + fVar92) * auVar262._0_4_ + fVar92;
                    auVar121._4_4_ =
                         (fVar138 * fVar138 *
                          (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                             fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) +
                         fVar138 + fVar107) * auVar262._4_4_ + fVar107;
                    auVar121._8_4_ =
                         (fVar240 * fVar240 *
                          (((((fVar240 * 0.00019875691 + 0.0013981999) * fVar240 + 0.008333452) *
                             fVar240 + 0.041665796) * fVar240 + 0.16666666) * fVar240 + 0.5) +
                         fVar240 + fVar136) * auVar262._8_4_ + fVar136;
                    auVar121._12_4_ =
                         (fVar242 * fVar242 *
                          (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) *
                             fVar242 + 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) +
                         fVar242 + fVar137) * auVar262._12_4_ + fVar137;
                    auVar262 = vrcpps_avx(auVar121);
                    fVar92 = auVar262._0_4_;
                    auVar122._0_4_ = auVar121._0_4_ * fVar92;
                    fVar107 = auVar262._4_4_;
                    auVar122._4_4_ = auVar121._4_4_ * fVar107;
                    fVar136 = auVar262._8_4_;
                    auVar122._8_4_ = auVar121._8_4_ * fVar136;
                    fVar137 = auVar262._12_4_;
                    auVar122._12_4_ = auVar121._12_4_ * fVar137;
                    auVar188 = vsubps_avx(auVar188,auVar122);
                    auVar119._0_4_ = fVar92 + fVar92 * auVar188._0_4_;
                    auVar119._4_4_ = fVar107 + fVar107 * auVar188._4_4_;
                    auVar119._8_4_ = fVar136 + fVar136 * auVar188._8_4_;
                    auVar119._12_4_ = fVar137 + fVar137 * auVar188._12_4_;
                    break;
                  case 5:
                    auVar247._8_4_ = 0x42b0c0a5;
                    auVar247._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar247._12_4_ = 0x42b0c0a5;
                    auVar262 = vminps_avx(auVar119,auVar247);
                    auVar313._8_4_ = 0xc2b0c0a5;
                    auVar313._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar313._12_4_ = 0xc2b0c0a5;
                    auVar310 = vmaxps_avx(auVar313,auVar262);
                    auVar330._0_4_ = auVar310._0_4_ * 1.442695 + 0.5;
                    auVar330._4_4_ = auVar310._4_4_ * 1.442695 + 0.5;
                    auVar330._8_4_ = auVar310._8_4_ * 1.442695 + 0.5;
                    auVar330._12_4_ = auVar310._12_4_ * 1.442695 + 0.5;
                    auVar347._0_4_ = (int)auVar330._0_4_;
                    auVar347._4_4_ = (int)auVar330._4_4_;
                    auVar347._8_4_ = (int)auVar330._8_4_;
                    auVar347._12_4_ = (int)auVar330._12_4_;
                    auVar329 = vcvtdq2ps_avx(auVar347);
                    auVar262 = vcmpps_avx(auVar330,auVar329,1);
                    auVar262 = vandps_avx(auVar262,auVar188);
                    auVar262 = vsubps_avx(auVar329,auVar262);
                    auVar348._0_4_ = auVar262._0_4_ * 0.6931472;
                    auVar348._4_4_ = auVar262._4_4_ * 0.6931472;
                    auVar348._8_4_ = auVar262._8_4_ * 0.6931472;
                    auVar348._12_4_ = auVar262._12_4_ * 0.6931472;
                    auVar329 = vsubps_avx(auVar310,auVar348);
                    fVar242 = auVar329._0_4_;
                    fVar187 = auVar329._4_4_;
                    fVar235 = auVar329._8_4_;
                    fVar236 = auVar329._12_4_;
                    auVar275._0_4_ = (int)auVar262._0_4_;
                    auVar275._4_4_ = (int)auVar262._4_4_;
                    auVar275._8_4_ = (int)auVar262._8_4_;
                    auVar275._12_4_ = (int)auVar262._12_4_;
                    auVar262 = vpslld_avx(auVar275,0x17);
                    auVar262 = vpaddd_avx(auVar262,auVar188);
                    auVar276._0_4_ =
                         (fVar242 + fVar92 +
                         fVar242 * fVar242 *
                         (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) *
                            fVar242 + 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5)) *
                         auVar262._0_4_ + fVar92;
                    auVar276._4_4_ =
                         (fVar187 + fVar107 +
                         fVar187 * fVar187 *
                         (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                            fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + 0.5)) *
                         auVar262._4_4_ + fVar107;
                    auVar276._8_4_ =
                         (fVar235 + fVar136 +
                         fVar235 * fVar235 *
                         (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) *
                            fVar235 + 0.041665796) * fVar235 + 0.16666666) * fVar235 + 0.5)) *
                         auVar262._8_4_ + fVar136;
                    auVar276._12_4_ =
                         (fVar236 + fVar137 +
                         fVar236 * fVar236 *
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5)) *
                         auVar262._12_4_ + fVar137;
                    auVar149._8_4_ = 0x800000;
                    auVar149._0_8_ = 0x80000000800000;
                    auVar149._12_4_ = 0x800000;
                    auVar262 = vmaxps_avx(auVar276,auVar149);
                    auVar329 = vpsrld_avx(auVar262,0x17);
                    auVar202._8_4_ = 0xffffff82;
                    auVar202._0_8_ = 0xffffff82ffffff82;
                    auVar202._12_4_ = 0xffffff82;
                    auVar329 = vpaddd_avx(auVar329,auVar202);
                    auVar203._8_4_ = 0x807fffff;
                    auVar203._0_8_ = 0x807fffff807fffff;
                    auVar203._12_4_ = 0x807fffff;
                    auVar262 = vandps_avx(auVar262,auVar203);
                    auVar93 = vorps_avx(auVar262,auVar256);
                    auVar310 = vcvtdq2ps_avx(auVar329);
                    auVar204._8_4_ = 0x3f3504f3;
                    auVar204._0_8_ = 0x3f3504f33f3504f3;
                    auVar204._12_4_ = 0x3f3504f3;
                    auVar329 = vcmpps_avx(auVar93,auVar204,1);
                    auVar262 = vandps_avx(auVar329,auVar93);
                    fVar242 = auVar93._0_4_ + -1.0 + auVar262._0_4_;
                    fVar187 = auVar93._4_4_ + -1.0 + auVar262._4_4_;
                    fVar235 = auVar93._8_4_ + -1.0 + auVar262._8_4_;
                    fVar236 = auVar93._12_4_ + -1.0 + auVar262._12_4_;
                    auVar262 = vandps_avx(auVar329,auVar188);
                    auVar329 = vsubps_avx(auVar310,auVar262);
                    auVar262 = vcmpps_avx(auVar276,_DAT_00554060,2);
                    auVar150._0_4_ =
                         (fVar242 * fVar242 *
                          (((((((((fVar242 * 0.070376836 + -0.1151461) * fVar242 + 0.116769984) *
                                 fVar242 + -0.12420141) * fVar242 + 0.14249323) * fVar242 +
                              -0.16668057) * fVar242 + 0.20000714) * fVar242 + -0.24999994) *
                            fVar242 + 0.3333333) * fVar242 + -0.5) +
                         auVar329._0_4_ * 0.6931472 + fVar242) * -2.0;
                    auVar150._4_4_ =
                         (fVar187 * fVar187 *
                          (((((((((fVar187 * 0.070376836 + -0.1151461) * fVar187 + 0.116769984) *
                                 fVar187 + -0.12420141) * fVar187 + 0.14249323) * fVar187 +
                              -0.16668057) * fVar187 + 0.20000714) * fVar187 + -0.24999994) *
                            fVar187 + 0.3333333) * fVar187 + -0.5) +
                         auVar329._4_4_ * 0.6931472 + fVar187) * -2.0;
                    auVar150._8_4_ =
                         (fVar235 * fVar235 *
                          (((((((((fVar235 * 0.070376836 + -0.1151461) * fVar235 + 0.116769984) *
                                 fVar235 + -0.12420141) * fVar235 + 0.14249323) * fVar235 +
                              -0.16668057) * fVar235 + 0.20000714) * fVar235 + -0.24999994) *
                            fVar235 + 0.3333333) * fVar235 + -0.5) +
                         auVar329._8_4_ * 0.6931472 + fVar235) * -2.0;
                    auVar150._12_4_ =
                         (fVar236 * fVar236 *
                          (((((((((fVar236 * 0.070376836 + -0.1151461) * fVar236 + 0.116769984) *
                                 fVar236 + -0.12420141) * fVar236 + 0.14249323) * fVar236 +
                              -0.16668057) * fVar236 + 0.20000714) * fVar236 + -0.24999994) *
                            fVar236 + 0.3333333) * fVar236 + -0.5) +
                         auVar329._12_4_ * 0.6931472 + fVar236) * -2.0;
                    auVar205._8_4_ = 0x7fffffff;
                    auVar205._0_8_ = 0x7fffffff7fffffff;
                    auVar205._12_4_ = 0x7fffffff;
                    auVar262 = vblendvps_avx(auVar150,auVar205,auVar262);
                    auVar206._8_4_ = 0x42b0c0a5;
                    auVar206._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar206._12_4_ = 0x42b0c0a5;
                    auVar262 = vminps_avx(auVar262,auVar206);
                    auVar207._8_4_ = 0xc2b0c0a5;
                    auVar207._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar207._12_4_ = 0xc2b0c0a5;
                    auVar310 = vmaxps_avx(auVar262,auVar207);
                    auVar208._0_4_ = auVar310._0_4_ * 1.442695 + 0.5;
                    auVar208._4_4_ = auVar310._4_4_ * 1.442695 + 0.5;
                    auVar208._8_4_ = auVar310._8_4_ * 1.442695 + 0.5;
                    auVar208._12_4_ = auVar310._12_4_ * 1.442695 + 0.5;
                    auVar277._0_4_ = (int)auVar208._0_4_;
                    auVar277._4_4_ = (int)auVar208._4_4_;
                    auVar277._8_4_ = (int)auVar208._8_4_;
                    auVar277._12_4_ = (int)auVar208._12_4_;
                    auVar329 = vcvtdq2ps_avx(auVar277);
                    auVar262 = vcmpps_avx(auVar208,auVar329,1);
                    auVar262 = vandps_avx(auVar262,auVar188);
                    auVar262 = vsubps_avx(auVar329,auVar262);
                    auVar278._0_4_ = auVar262._0_4_ * 0.6931472;
                    auVar278._4_4_ = auVar262._4_4_ * 0.6931472;
                    auVar278._8_4_ = auVar262._8_4_ * 0.6931472;
                    auVar278._12_4_ = auVar262._12_4_ * 0.6931472;
                    auVar260 = ZEXT1664(auVar188);
                    auVar329 = vsubps_avx(auVar310,auVar278);
                    fVar242 = auVar329._0_4_;
                    fVar187 = auVar329._4_4_;
                    fVar235 = auVar329._8_4_;
                    fVar236 = auVar329._12_4_;
                    auVar209._0_4_ = (int)auVar262._0_4_;
                    auVar209._4_4_ = (int)auVar262._4_4_;
                    auVar209._8_4_ = (int)auVar262._8_4_;
                    auVar209._12_4_ = (int)auVar262._12_4_;
                    auVar262 = vpslld_avx(auVar209,0x17);
                    auVar188 = vpaddd_avx(auVar262,auVar188);
                    auVar151._0_4_ =
                         (fVar242 + fVar92 +
                         (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) *
                            fVar242 + 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) *
                         fVar242 * fVar242) * auVar188._0_4_ + fVar92;
                    auVar151._4_4_ =
                         (fVar187 + fVar107 +
                         (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                            fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + 0.5) *
                         fVar187 * fVar187) * auVar188._4_4_ + fVar107;
                    auVar151._8_4_ =
                         (fVar235 + fVar136 +
                         (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) *
                            fVar235 + 0.041665796) * fVar235 + 0.16666666) * fVar235 + 0.5) *
                         fVar235 * fVar235) * auVar188._8_4_ + fVar136;
                    auVar151._12_4_ =
                         (fVar236 + fVar137 +
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5) *
                         fVar236 * fVar236) * auVar188._12_4_ + fVar137;
                    auVar188 = vrcpps_avx(auVar151);
                    fVar92 = auVar188._0_4_;
                    fVar107 = auVar188._4_4_;
                    fVar136 = auVar188._8_4_;
                    fVar137 = auVar188._12_4_;
                    auVar152._0_4_ = auVar151._0_4_ * (fVar92 + fVar92);
                    auVar152._4_4_ = auVar151._4_4_ * (fVar107 + fVar107);
                    auVar152._8_4_ = auVar151._8_4_ * (fVar136 + fVar136);
                    auVar152._12_4_ = auVar151._12_4_ * (fVar137 + fVar137);
                    auVar248._8_4_ = 0x40000000;
                    auVar248._0_8_ = 0x4000000040000000;
                    auVar248._12_4_ = 0x40000000;
                    auVar188 = vsubps_avx(auVar248,auVar152);
                    auVar153._0_4_ = fVar92 + fVar92 + -1.0 + fVar92 * auVar188._0_4_;
                    auVar153._4_4_ = fVar107 + fVar107 + -1.0 + fVar107 * auVar188._4_4_;
                    auVar153._8_4_ = fVar136 + fVar136 + -1.0 + fVar136 * auVar188._8_4_;
                    auVar153._12_4_ = fVar137 + fVar137 + -1.0 + fVar137 * auVar188._12_4_;
                    goto LAB_0028a976;
                  case 6:
                    fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                    fVar107 = (*(float **)(&this->field_0x118 + (long)p_Var64))[1];
                    auVar156._0_4_ = fVar92 * auVar119._0_4_ + fVar107;
                    auVar156._4_4_ = fVar92 * fVar243 + fVar107;
                    auVar156._8_4_ = fVar92 * fVar138 + fVar107;
                    auVar156._12_4_ = fVar92 * fVar240 + fVar107;
                    auVar262 = vmaxps_avx(auVar156,_DAT_00554060);
                    auVar153 = vminps_avx(auVar262,auVar188);
LAB_0028a976:
                    auVar119._0_4_ = auVar153._0_4_ * auVar119._0_4_;
                    auVar119._4_4_ = auVar153._4_4_ * fVar243;
                    auVar119._8_4_ = auVar153._8_4_ * fVar138;
                    auVar119._12_4_ = auVar153._12_4_ * fVar240;
                  }
                  *(undefined1 (*) [16])pAVar76 = auVar119;
                  pAVar76 = pAVar76 + 2;
                  uVar82 = uVar82 + 1;
                  iVar66 = iVar66 + 1;
                } while (uVar82 != local_1a8.w);
              }
              iVar74 = iVar74 + 1;
            } while (iVar74 != local_1a8.h);
          }
          local_278 = local_278 + 1;
        } while (local_278 != (long)local_1a8.c);
      }
      local_138._0_4_ = (uint)local_138 | (uint)local_150 ^ 1;
      if (((uint)local_138 == 0) && (0 < (long)local_1a8.c)) {
        p_Var64 = pp_Var24[-3];
        iVar20 = *(int *)(&this->field_0xdc + (long)p_Var64);
        iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var64);
        iVar69 = *(int *)(&this->field_0xe4 + (long)p_Var64);
        iVar88 = *(int *)(&this->field_0xe8 + (long)p_Var64);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var64);
        lVar83 = *(long *)(&this->field_0x1a8 + (long)p_Var64);
        uVar55 = *(uint *)(&this->field_0xd4 + (long)p_Var64);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var64);
        local_278 = 0;
        auVar257._8_4_ = 0x3f000000;
        auVar257._0_8_ = 0x3f0000003f000000;
        auVar257._12_4_ = 0x3f000000;
        auVar260 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        do {
          if (0 < local_1a8.h) {
            iVar79 = bottom_blob->w;
            iVar81 = bottom_blob->h;
            pAVar76 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_278 * local_1a8.elemsize);
            uVar65 = bottom_blob->c;
            iVar74 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar82 = 0;
                iVar66 = (1 - uVar55) * iVar20;
                do {
                  if (lVar83 == 0) {
                    auVar123 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar123 = *(undefined1 (*) [16])(lVar83 + local_278 * 0x10);
                  }
                  auVar325 = ZEXT1664(auVar123);
                  if (0 < (int)uVar65) {
                    pvVar91 = (void *)((this->weight_data_tm).cstep * local_278 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    uVar68 = 0;
                    do {
                      if (0 < (int)uVar22) {
                        uVar87 = 0;
                        uVar71 = 0;
                        do {
                          iVar56 = (((int)uVar71 - uVar22) + 1) * iVar21 + iVar74;
                          if ((((-1 < iVar56) && (iVar57 = iVar56 / iVar88, iVar56 % iVar88 == 0))
                              && (iVar57 < iVar81)) && (0 < (int)uVar55)) {
                            uVar75 = uVar87;
                            uVar84 = (ulong)uVar55;
                            iVar56 = iVar66;
                            do {
                              if (((-1 < iVar56) && (iVar58 = iVar56 / iVar69, iVar56 % iVar69 == 0)
                                  ) && (iVar58 < iVar79)) {
                                fVar92 = *(float *)((long)bottom_blob->data +
                                                   (long)iVar58 * 4 +
                                                   (long)iVar57 *
                                                   (long)bottom_blob->w * bottom_blob->elemsize +
                                                   bottom_blob->cstep * bottom_blob->elemsize *
                                                   uVar68);
                                pfVar89 = (float *)((long)pvVar91 + (uVar75 & 0xffffffff) * 4);
                                auVar325 = ZEXT1664(CONCAT412(fVar92 * pfVar89[3] + auVar325._12_4_,
                                                              CONCAT48(fVar92 * pfVar89[2] +
                                                                       auVar325._8_4_,
                                                                       CONCAT44(fVar92 * pfVar89[1]
                                                                                + auVar325._4_4_,
                                                                                fVar92 * *pfVar89 +
                                                                                auVar325._0_4_))));
                              }
                              uVar75 = uVar75 + 4;
                              iVar56 = iVar56 + iVar20;
                              uVar84 = uVar84 - 1;
                            } while (uVar84 != 0);
                          }
                          uVar71 = uVar71 + 1;
                          uVar87 = uVar87 + (ulong)uVar55 * 4;
                        } while (uVar71 != uVar22);
                      }
                      auVar123 = auVar325._0_16_;
                      pvVar91 = (void *)((long)pvVar91 + (long)(int)(uVar55 * uVar22 * 4) * 4);
                      uVar68 = uVar68 + 1;
                    } while (uVar68 != uVar65);
                  }
                  auVar188 = auVar260._0_16_;
                  fVar92 = auVar260._0_4_;
                  fVar107 = auVar260._4_4_;
                  fVar136 = auVar260._8_4_;
                  fVar137 = auVar260._12_4_;
                  fVar243 = auVar123._4_4_;
                  fVar138 = auVar123._8_4_;
                  fVar240 = auVar123._12_4_;
                  switch(uVar23) {
                  case 1:
                    auVar123 = vmaxps_avx(auVar123,_DAT_00554060);
                    break;
                  case 2:
                    auVar188 = vmaxps_avx(auVar123,ZEXT816(0) << 0x40);
                    auVar262 = vminps_avx(auVar123,ZEXT816(0) << 0x40);
                    fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                    auVar123._0_4_ = fVar92 * auVar262._0_4_ + auVar188._0_4_;
                    auVar123._4_4_ = fVar92 * auVar262._4_4_ + auVar188._4_4_;
                    auVar123._8_4_ = fVar92 * auVar262._8_4_ + auVar188._8_4_;
                    auVar123._12_4_ = fVar92 * auVar262._12_4_ + auVar188._12_4_;
                    break;
                  case 3:
                    uVar8 = **(undefined4 **)(&this->field_0x118 + (long)p_Var64);
                    auVar286._4_4_ = uVar8;
                    auVar286._0_4_ = uVar8;
                    auVar286._8_4_ = uVar8;
                    auVar286._12_4_ = uVar8;
                    uVar8 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var64))[1];
                    auVar353._4_4_ = uVar8;
                    auVar353._0_4_ = uVar8;
                    auVar353._8_4_ = uVar8;
                    auVar353._12_4_ = uVar8;
                    auVar188 = vmaxps_avx(auVar123,auVar286);
                    auVar123 = vminps_avx(auVar353,auVar188);
                    break;
                  case 4:
                    auVar124._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
                    auVar124._8_4_ = -fVar138;
                    auVar124._12_4_ = -fVar240;
                    auVar162._8_4_ = 0x42b0c0a5;
                    auVar162._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar162._12_4_ = 0x42b0c0a5;
                    auVar262 = vminps_avx(auVar124,auVar162);
                    auVar163._8_4_ = 0xc2b0c0a5;
                    auVar163._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar163._12_4_ = 0xc2b0c0a5;
                    auVar310 = vmaxps_avx(auVar262,auVar163);
                    auVar287._0_4_ = auVar310._0_4_ * 1.442695 + 0.5;
                    auVar287._4_4_ = auVar310._4_4_ * 1.442695 + 0.5;
                    auVar287._8_4_ = auVar310._8_4_ * 1.442695 + 0.5;
                    auVar287._12_4_ = auVar310._12_4_ * 1.442695 + 0.5;
                    auVar354._0_4_ = (int)auVar287._0_4_;
                    auVar354._4_4_ = (int)auVar287._4_4_;
                    auVar354._8_4_ = (int)auVar287._8_4_;
                    auVar354._12_4_ = (int)auVar287._12_4_;
                    auVar329 = vcvtdq2ps_avx(auVar354);
                    auVar262 = vcmpps_avx(auVar287,auVar329,1);
                    auVar262 = vandps_avx(auVar262,auVar188);
                    auVar262 = vsubps_avx(auVar329,auVar262);
                    fVar243 = auVar262._0_4_ * -0.6931472 + auVar310._0_4_;
                    fVar138 = auVar262._4_4_ * -0.6931472 + auVar310._4_4_;
                    fVar240 = auVar262._8_4_ * -0.6931472 + auVar310._8_4_;
                    fVar242 = auVar262._12_4_ * -0.6931472 + auVar310._12_4_;
                    auVar288._0_4_ = (int)auVar262._0_4_;
                    auVar288._4_4_ = (int)auVar262._4_4_;
                    auVar288._8_4_ = (int)auVar262._8_4_;
                    auVar288._12_4_ = (int)auVar262._12_4_;
                    auVar262 = vpslld_avx(auVar288,0x17);
                    auVar262 = vpaddd_avx(auVar262,auVar188);
                    auVar125._0_4_ =
                         (fVar243 * fVar243 *
                          (((((fVar243 * 0.00019875691 + 0.0013981999) * fVar243 + 0.008333452) *
                             fVar243 + 0.041665796) * fVar243 + 0.16666666) * fVar243 + 0.5) +
                         fVar243 + fVar92) * auVar262._0_4_ + fVar92;
                    auVar125._4_4_ =
                         (fVar138 * fVar138 *
                          (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                             fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) +
                         fVar138 + fVar107) * auVar262._4_4_ + fVar107;
                    auVar125._8_4_ =
                         (fVar240 * fVar240 *
                          (((((fVar240 * 0.00019875691 + 0.0013981999) * fVar240 + 0.008333452) *
                             fVar240 + 0.041665796) * fVar240 + 0.16666666) * fVar240 + 0.5) +
                         fVar240 + fVar136) * auVar262._8_4_ + fVar136;
                    auVar125._12_4_ =
                         (fVar242 * fVar242 *
                          (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) *
                             fVar242 + 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) +
                         fVar242 + fVar137) * auVar262._12_4_ + fVar137;
                    auVar262 = vrcpps_avx(auVar125);
                    fVar92 = auVar262._0_4_;
                    auVar126._0_4_ = auVar125._0_4_ * fVar92;
                    fVar107 = auVar262._4_4_;
                    auVar126._4_4_ = auVar125._4_4_ * fVar107;
                    fVar136 = auVar262._8_4_;
                    auVar126._8_4_ = auVar125._8_4_ * fVar136;
                    fVar137 = auVar262._12_4_;
                    auVar126._12_4_ = auVar125._12_4_ * fVar137;
                    auVar188 = vsubps_avx(auVar188,auVar126);
                    auVar123._0_4_ = fVar92 + fVar92 * auVar188._0_4_;
                    auVar123._4_4_ = fVar107 + fVar107 * auVar188._4_4_;
                    auVar123._8_4_ = fVar136 + fVar136 * auVar188._8_4_;
                    auVar123._12_4_ = fVar137 + fVar137 * auVar188._12_4_;
                    break;
                  case 5:
                    auVar249._8_4_ = 0x42b0c0a5;
                    auVar249._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar249._12_4_ = 0x42b0c0a5;
                    auVar262 = vminps_avx(auVar123,auVar249);
                    auVar314._8_4_ = 0xc2b0c0a5;
                    auVar314._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar314._12_4_ = 0xc2b0c0a5;
                    auVar310 = vmaxps_avx(auVar314,auVar262);
                    auVar331._0_4_ = auVar310._0_4_ * 1.442695 + 0.5;
                    auVar331._4_4_ = auVar310._4_4_ * 1.442695 + 0.5;
                    auVar331._8_4_ = auVar310._8_4_ * 1.442695 + 0.5;
                    auVar331._12_4_ = auVar310._12_4_ * 1.442695 + 0.5;
                    auVar351._0_4_ = (int)auVar331._0_4_;
                    auVar351._4_4_ = (int)auVar331._4_4_;
                    auVar351._8_4_ = (int)auVar331._8_4_;
                    auVar351._12_4_ = (int)auVar331._12_4_;
                    auVar329 = vcvtdq2ps_avx(auVar351);
                    auVar262 = vcmpps_avx(auVar331,auVar329,1);
                    auVar262 = vandps_avx(auVar262,auVar188);
                    auVar262 = vsubps_avx(auVar329,auVar262);
                    auVar352._0_4_ = auVar262._0_4_ * 0.6931472;
                    auVar352._4_4_ = auVar262._4_4_ * 0.6931472;
                    auVar352._8_4_ = auVar262._8_4_ * 0.6931472;
                    auVar352._12_4_ = auVar262._12_4_ * 0.6931472;
                    auVar329 = vsubps_avx(auVar310,auVar352);
                    fVar242 = auVar329._0_4_;
                    fVar187 = auVar329._4_4_;
                    fVar235 = auVar329._8_4_;
                    fVar236 = auVar329._12_4_;
                    auVar282._0_4_ = (int)auVar262._0_4_;
                    auVar282._4_4_ = (int)auVar262._4_4_;
                    auVar282._8_4_ = (int)auVar262._8_4_;
                    auVar282._12_4_ = (int)auVar262._12_4_;
                    auVar262 = vpslld_avx(auVar282,0x17);
                    auVar262 = vpaddd_avx(auVar262,auVar188);
                    auVar283._0_4_ =
                         (fVar242 + fVar92 +
                         fVar242 * fVar242 *
                         (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) *
                            fVar242 + 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5)) *
                         auVar262._0_4_ + fVar92;
                    auVar283._4_4_ =
                         (fVar187 + fVar107 +
                         fVar187 * fVar187 *
                         (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                            fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + 0.5)) *
                         auVar262._4_4_ + fVar107;
                    auVar283._8_4_ =
                         (fVar235 + fVar136 +
                         fVar235 * fVar235 *
                         (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) *
                            fVar235 + 0.041665796) * fVar235 + 0.16666666) * fVar235 + 0.5)) *
                         auVar262._8_4_ + fVar136;
                    auVar283._12_4_ =
                         (fVar236 + fVar137 +
                         fVar236 * fVar236 *
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5)) *
                         auVar262._12_4_ + fVar137;
                    auVar157._8_4_ = 0x800000;
                    auVar157._0_8_ = 0x80000000800000;
                    auVar157._12_4_ = 0x800000;
                    auVar262 = vmaxps_avx(auVar283,auVar157);
                    auVar329 = vpsrld_avx(auVar262,0x17);
                    auVar210._8_4_ = 0xffffff82;
                    auVar210._0_8_ = 0xffffff82ffffff82;
                    auVar210._12_4_ = 0xffffff82;
                    auVar329 = vpaddd_avx(auVar329,auVar210);
                    auVar211._8_4_ = 0x807fffff;
                    auVar211._0_8_ = 0x807fffff807fffff;
                    auVar211._12_4_ = 0x807fffff;
                    auVar262 = vandps_avx(auVar262,auVar211);
                    auVar93 = vorps_avx(auVar262,auVar257);
                    auVar310 = vcvtdq2ps_avx(auVar329);
                    auVar212._8_4_ = 0x3f3504f3;
                    auVar212._0_8_ = 0x3f3504f33f3504f3;
                    auVar212._12_4_ = 0x3f3504f3;
                    auVar329 = vcmpps_avx(auVar93,auVar212,1);
                    auVar262 = vandps_avx(auVar329,auVar93);
                    fVar242 = auVar93._0_4_ + -1.0 + auVar262._0_4_;
                    fVar187 = auVar93._4_4_ + -1.0 + auVar262._4_4_;
                    fVar235 = auVar93._8_4_ + -1.0 + auVar262._8_4_;
                    fVar236 = auVar93._12_4_ + -1.0 + auVar262._12_4_;
                    auVar262 = vandps_avx(auVar329,auVar188);
                    auVar329 = vsubps_avx(auVar310,auVar262);
                    auVar262 = vcmpps_avx(auVar283,_DAT_00554060,2);
                    auVar158._0_4_ =
                         (fVar242 * fVar242 *
                          (((((((((fVar242 * 0.070376836 + -0.1151461) * fVar242 + 0.116769984) *
                                 fVar242 + -0.12420141) * fVar242 + 0.14249323) * fVar242 +
                              -0.16668057) * fVar242 + 0.20000714) * fVar242 + -0.24999994) *
                            fVar242 + 0.3333333) * fVar242 + -0.5) +
                         auVar329._0_4_ * 0.6931472 + fVar242) * -2.0;
                    auVar158._4_4_ =
                         (fVar187 * fVar187 *
                          (((((((((fVar187 * 0.070376836 + -0.1151461) * fVar187 + 0.116769984) *
                                 fVar187 + -0.12420141) * fVar187 + 0.14249323) * fVar187 +
                              -0.16668057) * fVar187 + 0.20000714) * fVar187 + -0.24999994) *
                            fVar187 + 0.3333333) * fVar187 + -0.5) +
                         auVar329._4_4_ * 0.6931472 + fVar187) * -2.0;
                    auVar158._8_4_ =
                         (fVar235 * fVar235 *
                          (((((((((fVar235 * 0.070376836 + -0.1151461) * fVar235 + 0.116769984) *
                                 fVar235 + -0.12420141) * fVar235 + 0.14249323) * fVar235 +
                              -0.16668057) * fVar235 + 0.20000714) * fVar235 + -0.24999994) *
                            fVar235 + 0.3333333) * fVar235 + -0.5) +
                         auVar329._8_4_ * 0.6931472 + fVar235) * -2.0;
                    auVar158._12_4_ =
                         (fVar236 * fVar236 *
                          (((((((((fVar236 * 0.070376836 + -0.1151461) * fVar236 + 0.116769984) *
                                 fVar236 + -0.12420141) * fVar236 + 0.14249323) * fVar236 +
                              -0.16668057) * fVar236 + 0.20000714) * fVar236 + -0.24999994) *
                            fVar236 + 0.3333333) * fVar236 + -0.5) +
                         auVar329._12_4_ * 0.6931472 + fVar236) * -2.0;
                    auVar213._8_4_ = 0x7fffffff;
                    auVar213._0_8_ = 0x7fffffff7fffffff;
                    auVar213._12_4_ = 0x7fffffff;
                    auVar262 = vblendvps_avx(auVar158,auVar213,auVar262);
                    auVar214._8_4_ = 0x42b0c0a5;
                    auVar214._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar214._12_4_ = 0x42b0c0a5;
                    auVar262 = vminps_avx(auVar262,auVar214);
                    auVar215._8_4_ = 0xc2b0c0a5;
                    auVar215._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar215._12_4_ = 0xc2b0c0a5;
                    auVar310 = vmaxps_avx(auVar262,auVar215);
                    auVar216._0_4_ = auVar310._0_4_ * 1.442695 + 0.5;
                    auVar216._4_4_ = auVar310._4_4_ * 1.442695 + 0.5;
                    auVar216._8_4_ = auVar310._8_4_ * 1.442695 + 0.5;
                    auVar216._12_4_ = auVar310._12_4_ * 1.442695 + 0.5;
                    auVar284._0_4_ = (int)auVar216._0_4_;
                    auVar284._4_4_ = (int)auVar216._4_4_;
                    auVar284._8_4_ = (int)auVar216._8_4_;
                    auVar284._12_4_ = (int)auVar216._12_4_;
                    auVar329 = vcvtdq2ps_avx(auVar284);
                    auVar262 = vcmpps_avx(auVar216,auVar329,1);
                    auVar262 = vandps_avx(auVar262,auVar188);
                    auVar262 = vsubps_avx(auVar329,auVar262);
                    auVar285._0_4_ = auVar262._0_4_ * 0.6931472;
                    auVar285._4_4_ = auVar262._4_4_ * 0.6931472;
                    auVar285._8_4_ = auVar262._8_4_ * 0.6931472;
                    auVar285._12_4_ = auVar262._12_4_ * 0.6931472;
                    auVar260 = ZEXT1664(auVar188);
                    auVar329 = vsubps_avx(auVar310,auVar285);
                    fVar242 = auVar329._0_4_;
                    fVar187 = auVar329._4_4_;
                    fVar235 = auVar329._8_4_;
                    fVar236 = auVar329._12_4_;
                    auVar217._0_4_ = (int)auVar262._0_4_;
                    auVar217._4_4_ = (int)auVar262._4_4_;
                    auVar217._8_4_ = (int)auVar262._8_4_;
                    auVar217._12_4_ = (int)auVar262._12_4_;
                    auVar262 = vpslld_avx(auVar217,0x17);
                    auVar188 = vpaddd_avx(auVar262,auVar188);
                    auVar159._0_4_ =
                         (fVar242 + fVar92 +
                         (((((fVar242 * 0.00019875691 + 0.0013981999) * fVar242 + 0.008333452) *
                            fVar242 + 0.041665796) * fVar242 + 0.16666666) * fVar242 + 0.5) *
                         fVar242 * fVar242) * auVar188._0_4_ + fVar92;
                    auVar159._4_4_ =
                         (fVar187 + fVar107 +
                         (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                            fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + 0.5) *
                         fVar187 * fVar187) * auVar188._4_4_ + fVar107;
                    auVar159._8_4_ =
                         (fVar235 + fVar136 +
                         (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) *
                            fVar235 + 0.041665796) * fVar235 + 0.16666666) * fVar235 + 0.5) *
                         fVar235 * fVar235) * auVar188._8_4_ + fVar136;
                    auVar159._12_4_ =
                         (fVar236 + fVar137 +
                         (((((fVar236 * 0.00019875691 + 0.0013981999) * fVar236 + 0.008333452) *
                            fVar236 + 0.041665796) * fVar236 + 0.16666666) * fVar236 + 0.5) *
                         fVar236 * fVar236) * auVar188._12_4_ + fVar137;
                    auVar188 = vrcpps_avx(auVar159);
                    fVar92 = auVar188._0_4_;
                    fVar107 = auVar188._4_4_;
                    fVar136 = auVar188._8_4_;
                    fVar137 = auVar188._12_4_;
                    auVar160._0_4_ = auVar159._0_4_ * (fVar92 + fVar92);
                    auVar160._4_4_ = auVar159._4_4_ * (fVar107 + fVar107);
                    auVar160._8_4_ = auVar159._8_4_ * (fVar136 + fVar136);
                    auVar160._12_4_ = auVar159._12_4_ * (fVar137 + fVar137);
                    auVar250._8_4_ = 0x40000000;
                    auVar250._0_8_ = 0x4000000040000000;
                    auVar250._12_4_ = 0x40000000;
                    auVar188 = vsubps_avx(auVar250,auVar160);
                    auVar161._0_4_ = fVar92 + fVar92 + -1.0 + fVar92 * auVar188._0_4_;
                    auVar161._4_4_ = fVar107 + fVar107 + -1.0 + fVar107 * auVar188._4_4_;
                    auVar161._8_4_ = fVar136 + fVar136 + -1.0 + fVar136 * auVar188._8_4_;
                    auVar161._12_4_ = fVar137 + fVar137 + -1.0 + fVar137 * auVar188._12_4_;
                    goto LAB_0028b10e;
                  case 6:
                    fVar92 = **(float **)(&this->field_0x118 + (long)p_Var64);
                    fVar107 = (*(float **)(&this->field_0x118 + (long)p_Var64))[1];
                    auVar164._0_4_ = fVar92 * auVar123._0_4_ + fVar107;
                    auVar164._4_4_ = fVar92 * fVar243 + fVar107;
                    auVar164._8_4_ = fVar92 * fVar138 + fVar107;
                    auVar164._12_4_ = fVar92 * fVar240 + fVar107;
                    auVar262 = vmaxps_avx(auVar164,_DAT_00554060);
                    auVar161 = vminps_avx(auVar262,auVar188);
LAB_0028b10e:
                    auVar123._0_4_ = auVar161._0_4_ * auVar123._0_4_;
                    auVar123._4_4_ = auVar161._4_4_ * fVar243;
                    auVar123._8_4_ = auVar161._8_4_ * fVar138;
                    auVar123._12_4_ = auVar161._12_4_ * fVar240;
                  }
                  *(undefined1 (*) [16])pAVar76 = auVar123;
                  pAVar76 = pAVar76 + 2;
                  uVar82 = uVar82 + 1;
                  iVar66 = iVar66 + 1;
                } while (uVar82 != local_1a8.w);
              }
              iVar74 = iVar74 + 1;
            } while (iVar74 != local_1a8.h);
          }
          local_278 = local_278 + 1;
        } while (local_278 != (long)local_1a8.c);
      }
      if (((uint)local_150 == 4 && uVar59 == 1) && (local_138 = (long)local_1a8.c, 0 < local_138)) {
        p_Var64 = pp_Var24[-3];
        iVar20 = *(int *)(&this->field_0xdc + (long)p_Var64);
        iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var64);
        iVar69 = *(int *)(&this->field_0xe4 + (long)p_Var64);
        iVar88 = *(int *)(&this->field_0xe8 + (long)p_Var64);
        uVar23 = *(undefined4 *)(&this->field_0x114 + (long)p_Var64);
        lVar83 = *(long *)(&this->field_0x1a8 + (long)p_Var64);
        uVar55 = *(uint *)(&this->field_0xd4 + (long)p_Var64);
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var64);
        local_158 = (_func_int **)(local_1a8.elemsize * local_1a8.cstep);
        local_120 = (Allocator *)local_1a8.data;
        iVar79 = bottom_blob->w;
        iVar81 = bottom_blob->h;
        uVar65 = bottom_blob->c;
        local_278 = 0;
        do {
          if (0 < iVar67) {
            sVar26 = (this->weight_data_tm).cstep;
            sVar27 = (this->weight_data_tm).elemsize;
            local_228 = (Allocator *)
                        ((long)&local_120->_vptr_Allocator + (long)local_158 * local_278);
            pvVar91 = (this->weight_data_tm).data;
            iVar74 = 0;
            do {
              if (0 < iVar70) {
                iVar56 = bottom_blob->w;
                pvVar90 = bottom_blob->data;
                sVar28 = bottom_blob->elemsize;
                sVar29 = bottom_blob->cstep;
                pfVar89 = *(float **)(&this->field_0x118 + (long)p_Var64);
                uVar82 = 0;
                iVar66 = (1 - uVar55) * iVar20;
                do {
                  if (lVar83 == 0) {
                    fVar92 = 0.0;
                  }
                  else {
                    fVar92 = *(float *)(lVar83 + local_278 * 4);
                  }
                  if ((int)uVar65 < 1) {
                    auVar188 = SUB6416(ZEXT864(0),0);
                  }
                  else {
                    auVar260 = ZEXT864(0);
                    uVar68 = 0;
                    pvVar78 = (void *)(sVar26 * local_278 * sVar27 + (long)pvVar91);
                    do {
                      if (0 < (int)uVar22) {
                        uVar87 = 0;
                        uVar71 = 0;
                        do {
                          iVar57 = (((int)uVar71 - uVar22) + 1) * iVar21 + iVar74;
                          if ((((-1 < iVar57) && (iVar58 = iVar57 / iVar88, iVar57 % iVar88 == 0))
                              && (0 < (int)uVar55)) && (iVar58 < iVar81)) {
                            uVar75 = (ulong)uVar55;
                            uVar84 = uVar87;
                            iVar57 = iVar66;
                            do {
                              if (((-1 < iVar57) && (iVar60 = iVar57 / iVar69, iVar57 % iVar69 == 0)
                                  ) && (iVar60 < iVar79)) {
                                pfVar72 = (float *)((long)pvVar78 + (uVar84 & 0xffffffff) * 4);
                                pfVar2 = (float *)((long)pvVar90 +
                                                  (long)(iVar60 << 2) * 4 +
                                                  (long)iVar58 * (long)iVar56 * sVar28 +
                                                  sVar29 * sVar28 * uVar68);
                                auVar260 = ZEXT1664(CONCAT412(pfVar72[3] * pfVar2[3] +
                                                              auVar260._12_4_,
                                                              CONCAT48(pfVar72[2] * pfVar2[2] +
                                                                       auVar260._8_4_,
                                                                       CONCAT44(pfVar72[1] *
                                                                                pfVar2[1] +
                                                                                auVar260._4_4_,
                                                                                *pfVar72 * *pfVar2 +
                                                                                auVar260._0_4_))));
                              }
                              uVar84 = uVar84 + 4;
                              iVar57 = iVar57 + iVar20;
                              uVar75 = uVar75 - 1;
                            } while (uVar75 != 0);
                          }
                          uVar71 = uVar71 + 1;
                          uVar87 = uVar87 + (ulong)uVar55 * 4;
                        } while (uVar71 != uVar22);
                      }
                      auVar188 = auVar260._0_16_;
                      pvVar78 = (void *)((long)pvVar78 + (long)(int)(uVar55 * uVar22 * 4) * 4);
                      uVar68 = uVar68 + 1;
                    } while (uVar68 != uVar65);
                  }
                  auVar262 = vshufpd_avx(auVar188,auVar188,1);
                  auVar127._0_4_ = auVar262._0_4_ + auVar188._0_4_;
                  auVar127._4_4_ = auVar262._4_4_ + auVar188._4_4_;
                  auVar127._8_4_ = auVar262._8_4_ + auVar188._8_4_;
                  auVar127._12_4_ = auVar262._12_4_ + auVar188._12_4_;
                  auVar188 = vmovshdup_avx(auVar127);
                  fVar92 = auVar188._0_4_ + fVar92 + auVar127._0_4_;
                  auVar188 = ZEXT416((uint)fVar92);
                  fVar107 = fVar92;
                  switch(uVar23) {
                  case 1:
                    auVar188 = vmaxss_avx(ZEXT416((uint)fVar92),ZEXT416(0));
                    fVar107 = auVar188._0_4_;
                    break;
                  case 2:
                    auVar99._0_12_ = ZEXT812(0);
                    auVar99._12_4_ = 0;
                    auVar188 = vcmpss_avx(auVar99,auVar188,1);
                    auVar166._8_4_ = 0x3f800000;
                    auVar166._0_8_ = 0x3f8000003f800000;
                    auVar166._12_4_ = 0x3f800000;
                    auVar188 = vblendvps_avx(ZEXT416((uint)*pfVar89),auVar166,auVar188);
                    fVar107 = auVar188._0_4_;
LAB_0028b582:
                    fVar107 = fVar107 * fVar92;
                    break;
                  case 3:
                    auVar188 = vmaxss_avx(auVar188,ZEXT416((uint)*pfVar89));
                    fVar107 = auVar188._0_4_;
                    if (pfVar89[1] < auVar188._0_4_) {
                      fVar107 = pfVar89[1];
                    }
                    break;
                  case 4:
                    auVar188 = vminss_avx(auVar188,ZEXT416(0x42b0c0a5));
                    auVar128._0_8_ = auVar188._0_8_ ^ 0x8000000080000000;
                    auVar128._8_4_ = auVar188._8_4_ ^ 0x80000000;
                    auVar128._12_4_ = auVar188._12_4_ ^ 0x80000000;
                    auVar188 = vcmpss_avx(auVar188,ZEXT416(0xc2b0c0a5),1);
                    auVar165._8_4_ = 0x42b0c0a5;
                    auVar165._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar165._12_4_ = 0x42b0c0a5;
                    auVar188 = vblendvps_avx(auVar128,auVar165,auVar188);
                    fVar92 = expf(auVar188._0_4_);
                    fVar107 = 1.0 / (fVar92 + 1.0);
                    break;
                  case 5:
                    fVar107 = expf(fVar92);
                    fVar107 = logf(fVar107 + 1.0);
                    fVar107 = tanhf(fVar107);
                    fVar107 = fVar107 * fVar92;
                    break;
                  case 6:
                    fVar136 = *pfVar89;
                    fVar137 = -pfVar89[1] / fVar136;
                    fVar107 = 0.0;
                    if ((fVar137 <= fVar92) && (fVar107 = fVar92, fVar92 <= fVar137 + 1.0 / fVar136)
                       ) {
                      fVar107 = fVar136 * fVar92 + pfVar89[1];
                      goto LAB_0028b582;
                    }
                  }
                  *(float *)&local_228->_vptr_Allocator = fVar107;
                  local_228 = (Allocator *)((long)&local_228->_vptr_Allocator + 4);
                  uVar82 = uVar82 + 1;
                  iVar66 = iVar66 + 1;
                } while (uVar82 != iVar70);
              }
              iVar74 = iVar74 + 1;
            } while (iVar74 != iVar67);
          }
          local_278 = local_278 + 1;
        } while (local_278 != local_138);
      }
      iVar21 = local_1a8.h;
      iVar20 = local_1a8.w;
      pvVar91 = local_1a8.data;
      if (uVar59 == 1 && (int)local_150 == 1) {
        pp_Var24 = this->_vptr_Deconvolution_x86_avx;
        p_Var64 = pp_Var24[-3];
        if (0 < *(int *)(&this->field_0xd0 + (long)p_Var64)) {
          lVar83 = local_1a8.cstep * local_1a8.elemsize;
          iVar70 = bottom_blob->w;
          iVar67 = bottom_blob->h;
          uVar55 = bottom_blob->c;
          uVar68 = (ulong)(uint)local_1a8.w;
          lVar62 = (long)local_124;
          lVar86 = (long)local_1a8.w;
          local_148 = CONCAT44(local_148._4_4_,-(int)local_148);
          local_230 = 0;
          do {
            if (0 < iVar21) {
              local_270 = (Allocator *)((long)(_func_int ***)pvVar91 + lVar83 * local_230);
              pp_Var31 = this->_vptr_Deconvolution_x86_avx;
              sVar26 = (this->weight_data_tm).cstep;
              sVar27 = (this->weight_data_tm).elemsize;
              pvVar90 = (this->weight_data_tm).data;
              iVar69 = 0;
              do {
                if (0 < iVar20) {
                  iVar88 = bottom_blob->w;
                  pvVar78 = bottom_blob->data;
                  sVar28 = bottom_blob->elemsize;
                  sVar29 = bottom_blob->cstep;
                  pp_Var32 = this->_vptr_Deconvolution_x86_avx;
                  local_220 = local_148 & 0xffffffff;
                  uVar71 = 0;
                  do {
                    p_Var64 = pp_Var31[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var64) == 0) {
                      auVar260 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    else {
                      auVar260 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var64) +
                                                  local_230 * 4));
                    }
                    auVar188 = auVar260._0_16_;
                    if (0 < (int)uVar55) {
                      p_Var33 = pp_Var32[-3];
                      uVar87 = 0;
                      local_258 = (void *)(sVar26 * sVar27 * local_230 + (long)pvVar90);
                      do {
                        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var33)) {
                          iVar79 = 0;
                          do {
                            iVar81 = *(int *)(&this->field_0xe0 + (long)p_Var33) * iVar79 +
                                     (iVar69 - iVar80);
                            if (((-1 < iVar81) &&
                                (iVar74 = iVar81 / *(int *)(&this->field_0xe8 + (long)p_Var33),
                                iVar81 % *(int *)(&this->field_0xe8 + (long)p_Var33) == 0)) &&
                               (iVar74 < iVar67)) {
                              iVar81 = *(int *)(&this->field_0xd4 + (long)p_Var33);
                              if (0 < (long)iVar81) {
                                lVar85 = 0;
                                iVar66 = (int)local_220;
                                do {
                                  if (((-1 < iVar66) &&
                                      (iVar56 = iVar66 / *(int *)(&this->field_0xe4 + (long)p_Var33)
                                      , iVar66 % *(int *)(&this->field_0xe4 + (long)p_Var33) == 0))
                                     && (iVar56 < iVar70)) {
                                    auVar260 = ZEXT464((uint)(*(float *)((long)local_258 +
                                                                        lVar85 * 4 +
                                                                        (ulong)(uint)(iVar81 * 
                                                  iVar79) * 4) *
                                                  *(float *)((long)pvVar78 +
                                                            (long)iVar56 * 4 +
                                                            (long)iVar74 * (long)iVar88 * sVar28 +
                                                            sVar29 * sVar28 * uVar87) +
                                                  auVar260._0_4_));
                                  }
                                  lVar85 = lVar85 + 1;
                                  iVar66 = iVar66 + *(int *)(&this->field_0xdc + (long)p_Var33);
                                } while (iVar81 != lVar85);
                              }
                            }
                            iVar79 = iVar79 + 1;
                          } while (iVar79 != *(int *)(&this->field_0xd8 + (long)p_Var33));
                        }
                        auVar188 = auVar260._0_16_;
                        uVar87 = uVar87 + 1;
                        local_258 = (void *)((long)local_258 + lVar62 * 4);
                      } while (uVar87 != uVar55);
                    }
                    fVar107 = auVar188._0_4_;
                    fVar92 = fVar107;
                    switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var64)) {
                    case 1:
                      auVar188 = vmaxss_avx(auVar188,ZEXT416(0));
                      fVar92 = auVar188._0_4_;
                      break;
                    case 2:
                      auVar188 = vcmpss_avx(ZEXT816(0) << 0x40,auVar188,1);
                      auVar168._8_4_ = 0x3f800000;
                      auVar168._0_8_ = 0x3f8000003f800000;
                      auVar168._12_4_ = 0x3f800000;
                      auVar188 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 +
                                                                  (long)p_Var64)),auVar168,auVar188)
                      ;
                      fVar137 = auVar188._0_4_;
LAB_0028ba1c:
                      fVar92 = fVar137 * fVar107;
                      break;
                    case 3:
                      fVar107 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var64))[1];
                      auVar188 = vmaxss_avx(auVar188,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                        (long)p_Var64)));
                      fVar92 = auVar188._0_4_;
                      if (fVar107 < auVar188._0_4_) {
                        fVar92 = fVar107;
                      }
                      break;
                    case 4:
                      auVar188 = vminss_avx(auVar188,ZEXT416(0x42b0c0a5));
                      auVar129._0_8_ = auVar188._0_8_ ^ 0x8000000080000000;
                      auVar129._8_4_ = auVar188._8_4_ ^ 0x80000000;
                      auVar129._12_4_ = auVar188._12_4_ ^ 0x80000000;
                      auVar188 = vcmpss_avx(auVar188,ZEXT416(0xc2b0c0a5),1);
                      auVar167._8_4_ = 0x42b0c0a5;
                      auVar167._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar167._12_4_ = 0x42b0c0a5;
                      auVar188 = vblendvps_avx(auVar129,auVar167,auVar188);
                      fVar92 = expf(auVar188._0_4_);
                      fVar92 = 1.0 / (fVar92 + 1.0);
                      break;
                    case 5:
                      fVar92 = expf(fVar107);
                      fVar92 = logf(fVar92 + 1.0);
                      fVar92 = tanhf(fVar92);
                      fVar92 = fVar92 * fVar107;
                      break;
                    case 6:
                      fVar136 = **(float **)(&this->field_0x118 + (long)p_Var64);
                      fVar137 = (*(float **)(&this->field_0x118 + (long)p_Var64))[1];
                      fVar243 = -fVar137 / fVar136;
                      fVar92 = 0.0;
                      if ((fVar243 <= fVar107) &&
                         (fVar92 = fVar107, fVar107 <= fVar243 + 1.0 / fVar136)) {
                        fVar137 = fVar136 * fVar107 + fVar137;
                        goto LAB_0028ba1c;
                      }
                    }
                    *(float *)((long)&local_270->_vptr_Allocator + uVar71 * 4) = fVar92;
                    uVar71 = uVar71 + 1;
                    local_220 = (ulong)((int)local_220 + 1);
                  } while (uVar71 != uVar68);
                }
                local_270 = (Allocator *)((long)&local_270->_vptr_Allocator + lVar86 * 4);
                iVar69 = iVar69 + 1;
              } while (iVar69 != iVar21);
              p_Var64 = pp_Var24[-3];
            }
            local_230 = local_230 + 1;
          } while (local_230 < *(int *)(&this->field_0xd0 + (long)p_Var64));
        }
      }
    }
  }
LAB_0028bb57:
  pMVar54 = local_130;
  Deconvolution::cut_padding
            ((Deconvolution *)
             ((long)&this->_vptr_Deconvolution_x86_avx + (long)this->_vptr_Deconvolution_x86_avx[-3]
             ),&local_1a8,local_130,local_140);
  if ((pMVar54->data == (void *)0x0) || (iVar88 = 0, (long)pMVar54->c * pMVar54->cstep == 0)) {
    iVar88 = -100;
  }
LAB_0028bba1:
  piVar25 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  if (piVar25 != (int *)0x0) {
    LOCK();
    *piVar25 = *piVar25 + -1;
    UNLOCK();
    if (*piVar25 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar88;
}

Assistant:

int Deconvolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}